

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O3

void __thiscall Tagliatelle<TTA>::PerformLabeling(Tagliatelle<TTA> *this)

{
  char *pcVar1;
  undefined8 uVar2;
  char cVar3;
  uint uVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  char cVar10;
  uint uVar11;
  undefined4 uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint *puVar19;
  uint *puVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  undefined4 *puVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  uint *puVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  uint *puVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  bool bVar59;
  int local_168;
  ulong local_148;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar18 = *(uint *)&pMVar5->field_0x8;
  uVar4 = *(uint *)&pMVar5->field_0xc;
  uVar45 = (ulong)(int)uVar4;
  cv::Mat::Mat(local_90,**(int **)&pMVar5->field_0x40,(*(int **)&pMVar5->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  uVar11 = uVar18 & 0xfffffffe;
  cv::Mat::~Mat(local_90);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  puVar19 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar20 = TTA::tail_;
  puVar55 = TTA::next_;
  TTA::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar47 = *(long *)&pMVar5->field_0x10;
  if (uVar18 != 1) {
    lVar50 = **(long **)&pMVar5->field_0x48;
    lVar53 = lVar47 + lVar50;
    lVar31 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar32 = uVar45 - 2;
    local_168 = (int)uVar32;
    if ((int)uVar4 < 3) {
      uVar34 = 0;
      lVar50 = 1;
    }
    else {
      uVar33 = 0xfffffffe;
      uVar26 = 0;
      do {
        iVar39 = (int)uVar26;
        uVar27 = (ulong)iVar39;
        iVar35 = (int)uVar33;
        if ((*(char *)(lVar47 + uVar27) != '\0') || (*(char *)(lVar53 + uVar27) != '\0')) {
          cVar10 = *(char *)(lVar47 + 3 + (long)iVar35);
          uVar33 = (ulong)TTA::length_;
          puVar19[uVar33] = TTA::length_;
          puVar55[uVar33] = 0xffffffff;
          puVar20[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar31 + uVar27 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          if (cVar10 != '\0') goto LAB_002f55f8;
          goto LAB_002f56b4;
        }
        if ((*(char *)((long)iVar35 + 3 + lVar47) != '\0') ||
           (*(char *)(lVar53 + 3 + (long)iVar35) != '\0')) {
          uVar33 = (ulong)TTA::length_;
          puVar19[uVar33] = TTA::length_;
          puVar55[uVar33] = 0xffffffff;
          puVar20[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
LAB_002f55f4:
          *(uint *)(lVar31 + uVar27 * 4) = uVar34;
LAB_002f55f8:
          puVar8 = TTA::tail_;
          puVar7 = TTA::next_;
          iVar35 = iVar39 + 2;
          if (iVar35 < local_168) {
            lVar36 = (long)iVar39;
            lVar40 = lVar36 + 2;
            lVar16 = lVar31 + lVar36 * 4;
            lVar54 = lVar47 + 3 + lVar36;
            lVar36 = lVar36 + lVar50 + 3 + lVar47;
            lVar30 = 0;
            do {
              if ((*(char *)(lVar54 + -1 + lVar30) == '\0') &&
                 (*(char *)(lVar36 + -1 + lVar30) == '\0')) {
                if ((*(char *)(lVar54 + lVar30) == '\0') && (*(char *)(lVar36 + lVar30) == '\0')) {
                  uVar27 = lVar40 + lVar30;
                  uVar26 = uVar27 & 0xffffffff;
                  goto LAB_002f58cf;
                }
                uVar33 = (ulong)TTA::length_;
                puVar19[uVar33] = TTA::length_;
                puVar7[uVar33] = 0xffffffff;
                puVar8[TTA::length_] = TTA::length_;
                uVar34 = TTA::length_;
                TTA::length_ = TTA::length_ + 1;
              }
              else {
                if (*(char *)(lVar54 + lVar30) == '\0') goto LAB_002f56a3;
                uVar34 = *(uint *)(lVar16 + lVar30 * 4);
              }
              *(uint *)(lVar16 + 8 + lVar30 * 4) = uVar34;
              lVar38 = lVar30 + lVar40;
              lVar30 = lVar30 + 2;
              if ((long)(uVar32 & 0xffffffff) <= lVar38 + 2) {
                iVar35 = (int)lVar30 + iVar39 + 2;
                iVar39 = iVar39 + (int)lVar30;
                break;
              }
            } while( true );
          }
          lVar40 = (long)iVar35;
          if (iVar35 <= local_168) {
            if ((*(char *)(lVar47 + lVar40) != '\0') || (*(char *)(lVar53 + lVar40) != '\0'))
            goto LAB_002f5af0;
            goto LAB_002f5bef;
          }
          if ((*(char *)(lVar47 + lVar40) == '\0') && (*(char *)(lVar53 + lVar40) == '\0'))
          goto LAB_002f5c29;
LAB_002f5af0:
          uVar34 = *(uint *)(lVar31 + (long)iVar39 * 4);
          goto LAB_002f5c2b;
        }
LAB_002f58cf:
        *(undefined4 *)(lVar31 + uVar27 * 4) = 0;
        iVar39 = (int)uVar26;
        uVar34 = iVar39 + 2;
        uVar33 = uVar26;
        uVar26 = (ulong)uVar34;
      } while ((int)uVar34 < local_168);
      lVar50 = (long)(iVar39 + 3);
    }
    lVar40 = (long)(int)uVar34;
    if (local_168 < (int)uVar34) {
      if ((*(char *)(lVar47 + lVar40) == '\0') && (*(char *)(lVar53 + lVar40) == '\0'))
      goto LAB_002f5c29;
LAB_002f5a4b:
      uVar33 = (ulong)TTA::length_;
      puVar19[uVar33] = TTA::length_;
      TTA::next_[uVar33] = 0xffffffff;
LAB_002f5a6f:
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_;
      TTA::length_ = TTA::length_ + 1;
    }
    else {
      if ((((*(char *)(lVar47 + lVar40) != '\0') || (*(char *)(lVar53 + lVar40) != '\0')) ||
          (*(char *)(lVar47 + lVar50) != '\0')) || (*(char *)(lVar53 + lVar50) != '\0'))
      goto LAB_002f5a4b;
LAB_002f5c29:
      uVar34 = 0;
    }
LAB_002f5c2b:
    *(uint *)(lVar31 + lVar40 * 4) = uVar34;
    if (2 < (int)uVar11) {
      uVar33 = 2;
      lVar50 = 1;
      lVar47 = 3;
      lVar53 = 0;
      do {
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar40 = *(long *)&pMVar5->field_0x10;
        lVar16 = **(long **)&pMVar5->field_0x48;
        lVar38 = lVar16 * uVar33;
        lVar31 = lVar40 + lVar38;
        pcVar22 = (char *)(lVar31 - lVar16);
        pcVar1 = (char *)(lVar16 + lVar31);
        lVar54 = *(long *)&pMVar6->field_0x10;
        lVar30 = **(long **)&pMVar6->field_0x48;
        lVar36 = lVar30 * uVar33;
        puVar19 = (uint *)(lVar36 + lVar54);
        puVar55 = (uint *)((long)puVar19 + lVar30 * -2);
        cVar10 = *(char *)(lVar40 + lVar38);
        if (2 < (int)uVar4) {
          if (cVar10 == '\0') {
            if (*pcVar1 == '\0') {
              if (*(char *)(lVar31 + 1) == '\0') {
                if (pcVar1[1] == '\0') {
                  iVar39 = 0;
                  puVar20 = puVar19;
                  goto LAB_002f738e;
                }
                uVar26 = (ulong)TTA::length_;
                TTA::rtable_[uVar26] = TTA::length_;
                TTA::next_[uVar26] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar34 = TTA::length_ + 1;
                *puVar19 = TTA::length_;
                TTA::length_ = uVar34;
                local_148 = 0;
                goto LAB_002f76f0;
              }
            }
            else if (*(char *)(lVar31 + 1) == '\0') {
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              *puVar19 = TTA::length_;
              TTA::length_ = uVar34;
              local_148 = 0;
              goto LAB_002fb93e;
            }
            if (pcVar22[1] != '\0') {
              *puVar19 = *puVar55;
              local_148 = 0;
              goto LAB_002faf4f;
            }
            if (pcVar22[2] == '\0') {
              if (*pcVar22 != '\0') {
                *puVar19 = *puVar55;
                local_148 = 0;
                goto LAB_002fa96c;
              }
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              *puVar19 = TTA::length_;
              TTA::length_ = uVar34;
              local_148 = 0;
              goto LAB_002f8d2f;
            }
            if (*pcVar22 == '\0') {
              *puVar19 = puVar55[2];
LAB_002f64ca:
              local_148 = 0;
              goto LAB_002f94cb;
            }
            uVar34 = *puVar55;
            if (pcVar22[1 - lVar16] == '\0') goto LAB_002f6316;
            *puVar19 = uVar34;
          }
          else {
            if (pcVar22[1] != '\0') {
              *puVar19 = *puVar55;
              local_148 = 0;
              goto LAB_002f5d6c;
            }
            if (*(char *)(lVar31 + 1) == '\0') {
              if (*pcVar22 != '\0') {
                *puVar19 = *puVar55;
                local_148 = 0;
                goto LAB_002fe276;
              }
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              *puVar19 = TTA::length_;
              TTA::length_ = uVar34;
              local_148 = 0;
              goto LAB_002fdb0d;
            }
            if (pcVar22[2] == '\0') {
              if (*pcVar22 != '\0') {
                *puVar19 = *puVar55;
                local_148 = 0;
                goto LAB_002fa96c;
              }
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              *puVar19 = TTA::length_;
              TTA::length_ = uVar34;
              local_148 = 0;
              goto LAB_002f8d2f;
            }
            if (*pcVar22 == '\0') {
              *puVar19 = puVar55[2];
              local_148 = 0;
              goto LAB_002f94cb;
            }
            uVar34 = *puVar55;
            if (pcVar22[1 - lVar16] != '\0') {
              *puVar19 = uVar34;
              goto LAB_002f64ca;
            }
LAB_002f6316:
            uVar34 = TTA::Merge(uVar34,puVar55[2]);
            *puVar19 = uVar34;
          }
          local_148 = 0;
LAB_002f94cb:
          iVar39 = (int)local_148;
          uVar34 = iVar39 + 2;
          if ((int)uVar34 < local_168) {
            lVar25 = (long)iVar39;
            lVar44 = lVar25 << 0x20;
            lVar41 = lVar36 + lVar25 * 4;
            lVar52 = lVar54 + lVar41 + 8;
            lVar46 = lVar16 * lVar47 + lVar25;
            lVar17 = lVar16 * lVar53 + lVar25 + lVar40 + 3;
            lVar37 = lVar40 + lVar16 * lVar50 + lVar25;
            lVar23 = lVar40 + lVar38 + lVar25;
            lVar21 = lVar23 + 3;
            lVar24 = lVar54 + lVar30 * lVar53 + lVar25 * 4;
            lVar28 = lVar24 + 8;
            lVar43 = 0;
            lVar58 = 0;
            do {
              iVar35 = (int)(lVar25 + 2);
              iVar14 = (int)lVar58;
              lVar48 = lVar44 >> 0x1e;
              if (*(char *)(lVar23 + 2 + lVar58) == '\0') {
                cVar10 = *(char *)(lVar21 + lVar58);
                if (*(char *)(lVar46 + lVar40 + 2 + lVar58) != '\0') {
                  if (cVar10 == '\0') {
                    uVar34 = iVar35 + iVar14;
                    uVar12 = *(undefined4 *)((long)puVar19 + lVar48);
                    goto LAB_002fb2a6;
                  }
                  if (*(char *)(lVar37 + 3 + lVar58) != '\0') goto LAB_002f9971;
                  goto LAB_002f960b;
                }
                if (cVar10 == '\0') {
                  local_148 = lVar25 + 2 + lVar58;
                  if (*(char *)(lVar58 + 3 + lVar46 + lVar40) != '\0') {
                    uVar26 = (ulong)TTA::length_;
                    TTA::rtable_[uVar26] = TTA::length_;
                    TTA::next_[uVar26] = 0xffffffff;
                    TTA::tail_[TTA::length_] = TTA::length_;
                    uVar34 = TTA::length_ + 1;
                    *(uint *)(lVar41 + lVar54 + 8 + lVar58 * 4) = TTA::length_;
                    TTA::length_ = uVar34;
LAB_002f9108:
                    local_148 = local_148 & 0xffffffff;
                    goto LAB_002f76f0;
                  }
                  lVar43 = lVar43 + lVar41 + lVar54;
LAB_002fb63a:
                  local_148 = local_148 & 0xffffffff;
                  puVar20 = (uint *)(lVar43 + 8);
                  goto LAB_002fb63f;
                }
                if (*(char *)(lVar37 + 3 + lVar58) != '\0') {
LAB_002f9971:
                  *(undefined4 *)(lVar52 + lVar58 * 4) = *(undefined4 *)(lVar28 + lVar58 * 4);
                  local_148 = (ulong)(uint)(iVar35 + iVar14);
                  goto LAB_002faf4f;
                }
                if (*(char *)(lVar37 + 4 + lVar58) == '\0') goto LAB_002f9c52;
                uVar34 = *(uint *)(lVar28 + lVar58 * 4);
                if (*(char *)(lVar17 + lVar58) == '\0') {
                  uVar13 = *(uint *)(lVar24 + 0x10 + lVar58 * 4);
                  goto LAB_002f9632;
                }
              }
              else {
                if (*(char *)(lVar37 + 3 + lVar58) != '\0') {
                  uVar34 = iVar35 + iVar14;
                  *(undefined4 *)(lVar52 + lVar58 * 4) = *(undefined4 *)(lVar28 + lVar58 * 4);
LAB_002fe8f5:
                  local_148 = (ulong)uVar34;
                  goto LAB_002f5d6c;
                }
                if (*(char *)(lVar21 + lVar58) == '\0') {
                  uVar26 = (ulong)(uint)(iVar35 + iVar14);
                  uVar13 = *(uint *)((long)puVar19 + lVar48);
                  local_148 = lVar58 + lVar25 + 2;
                  goto LAB_002f97f6;
                }
LAB_002f960b:
                if (*(char *)(lVar37 + 4 + lVar58) == '\0') {
                  uVar26 = (ulong)(uint)(iVar35 + iVar14);
                  uVar34 = *(uint *)((long)puVar19 + lVar48);
                  local_148 = lVar58 + lVar25 + 2;
                  goto LAB_002fb57a;
                }
                if (*(char *)(lVar17 + lVar58) == '\0') {
                  uVar34 = *(uint *)(lVar24 + 0x10 + lVar58 * 4);
                  uVar13 = *(uint *)(lVar54 + lVar41 + lVar58 * 4);
LAB_002f9632:
                  uVar34 = TTA::Merge(uVar34,uVar13);
                }
                else {
                  uVar34 = *(uint *)(lVar28 + lVar58 * 4);
                }
              }
              *(uint *)(lVar52 + lVar58 * 4) = uVar34;
              lVar44 = lVar44 + 0x200000000;
              lVar43 = lVar43 + 8;
              lVar48 = lVar58 + lVar25;
              lVar58 = lVar58 + 2;
              if ((long)uVar32 <= lVar48 + 4) {
                iVar39 = iVar39 + (int)lVar58;
                uVar34 = iVar35 + (int)lVar58;
                break;
              }
            } while( true );
          }
          if (local_168 < (int)uVar34) {
LAB_002fb1a7:
            uVar26 = (ulong)uVar34;
            if ((*(char *)(lVar31 + uVar26) == '\0') && (pcVar1[uVar26] == '\0')) {
              puVar19[uVar26] = 0;
            }
            else {
              puVar19[uVar26] = puVar19[(long)(int)uVar34 + -2];
            }
          }
          else {
            uVar26 = (ulong)uVar34;
            if (*(char *)(lVar31 + uVar26) == '\0') {
              uVar27 = (ulong)(iVar39 + 3);
              if (pcVar1[uVar26] == '\0') {
                if (*(char *)(lVar31 + uVar27) != '\0') goto LAB_002f9715;
                if (pcVar1[uVar27] == '\0') {
                  puVar19[uVar26] = 0;
                }
                else {
                  uVar27 = (ulong)TTA::length_;
                  TTA::rtable_[uVar27] = TTA::length_;
                  TTA::next_[uVar27] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar34 = TTA::length_ + 1;
                  puVar19[uVar26] = TTA::length_;
                  TTA::length_ = uVar34;
                }
              }
              else {
                if ((*(char *)(lVar31 + uVar27) == '\0') || (pcVar22[uVar27] == '\0')) {
                  uVar34 = puVar19[iVar39];
                }
                else {
                  uVar34 = puVar55[uVar26];
                }
                puVar19[uVar26] = uVar34;
              }
            }
            else {
              if (pcVar22[(long)iVar39 + 3] == '\0') {
                uVar34 = puVar19[iVar39];
              }
              else {
LAB_002f9715:
                uVar34 = puVar55[uVar26];
              }
              puVar19[uVar26] = uVar34;
            }
          }
          goto LAB_002ff3e2;
        }
        if (uVar4 == 2) {
          if (cVar10 == '\0') {
            if (*pcVar1 == '\0') {
              if (*(char *)(lVar31 + 1) != '\0') {
                cVar10 = pcVar22[1];
                goto joined_r0x002f5ce9;
              }
              if (pcVar1[1] == '\0') goto LAB_002f64b3;
            }
            else if (*(char *)(lVar31 + 1) != '\0') {
              if (pcVar22[1] == '\0') {
                if (*pcVar22 == '\0') {
                  uVar26 = (ulong)TTA::length_;
                  TTA::rtable_[uVar26] = TTA::length_;
                  TTA::next_[uVar26] = 0xffffffff;
                  TTA::tail_[TTA::length_] = TTA::length_;
                  uVar34 = TTA::length_ + 1;
                  *puVar19 = TTA::length_;
                  TTA::length_ = uVar34;
                }
                else {
                  *puVar19 = *puVar55;
                }
                goto LAB_002ff3e2;
              }
              goto LAB_002f61d7;
            }
LAB_002f609c:
            uVar26 = (ulong)TTA::length_;
            TTA::rtable_[uVar26] = TTA::length_;
            TTA::next_[uVar26] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            *puVar19 = TTA::length_;
            TTA::length_ = uVar34;
          }
          else {
            cVar10 = pcVar22[1];
joined_r0x002f5ce9:
            if (cVar10 == '\0') {
              cVar10 = *pcVar22;
              goto LAB_002f61d2;
            }
            *puVar19 = *puVar55;
          }
        }
        else if (cVar10 == '\0') {
          if (*pcVar1 != '\0') goto LAB_002f609c;
LAB_002f64b3:
          *puVar19 = 0;
        }
        else {
          cVar10 = *pcVar22;
LAB_002f61d2:
          if (cVar10 == '\0') {
            uVar26 = (ulong)TTA::length_;
            TTA::rtable_[uVar26] = TTA::length_;
            TTA::next_[uVar26] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            *puVar19 = TTA::length_;
            TTA::length_ = uVar34;
          }
          else {
LAB_002f61d7:
            *puVar19 = *puVar55;
          }
        }
LAB_002ff3e2:
        uVar33 = uVar33 + 2;
        lVar53 = lVar53 + 2;
        lVar50 = lVar50 + 2;
        lVar47 = lVar47 + 2;
      } while (uVar33 < uVar11);
    }
    if ((uVar18 & 0x80000001) != 1) goto LAB_00301bfe;
    uVar33 = (ulong)(uVar18 - 1);
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar50 = *(long *)&pMVar5->field_0x10;
    lVar31 = **(long **)&pMVar5->field_0x48;
    lVar47 = lVar50 + lVar31 * uVar33;
    lVar30 = lVar47 - lVar31;
    lVar40 = *(long *)&pMVar6->field_0x10;
    lVar16 = **(long **)&pMVar6->field_0x48;
    lVar53 = lVar40 + lVar16 * uVar33;
    lVar54 = lVar53 + lVar16 * -2;
    if ((int)uVar4 < 3) {
      uVar34 = 0;
      iVar39 = -2;
    }
    else {
      lVar23 = lVar30 - lVar31;
      lVar36 = lVar30 + 1;
      lVar41 = lVar23 + 1;
      uVar32 = uVar32 & 0xffffffff;
      lVar43 = lVar31 * (uVar33 - 2) + lVar50 + 3;
      lVar46 = (uVar33 - 1) * lVar31;
      lVar38 = lVar46 + lVar50 + 2;
      lVar31 = lVar31 * uVar33 + 3 + lVar50;
      lVar37 = lVar40 + lVar16 * uVar33 + 8;
      lVar40 = lVar16 * (uVar33 - 2) + lVar40 + 8;
      lVar50 = lVar50 + lVar46 + 4;
      iVar39 = -2;
      uVar33 = 0;
      do {
        iVar35 = (int)uVar33;
        uVar26 = (ulong)iVar35;
        lVar16 = (long)iVar39;
        if (*(char *)(lVar47 + uVar26) == '\0') {
          if (*(char *)(lVar47 + 3 + lVar16) == '\0') goto LAB_002fff15;
          if (*(char *)(lVar30 + 3 + lVar16) != '\0') goto LAB_00300a30;
LAB_002ffe03:
          if (*(char *)(lVar16 + 4 + lVar30) == '\0') {
            if (*(char *)(lVar30 + uVar26) != '\0') goto LAB_00300860;
            uVar33 = (ulong)TTA::length_;
            TTA::rtable_[uVar33] = TTA::length_;
            TTA::next_[uVar33] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar13 = TTA::length_ + 1;
            uVar34 = TTA::length_;
            goto LAB_00300330;
          }
          if (*(char *)(lVar30 + uVar26) == '\0') {
            *(undefined4 *)(lVar53 + uVar26 * 4) = *(undefined4 *)(lVar54 + 0x10 + lVar16 * 4);
          }
          else {
            uVar34 = *(uint *)(lVar54 + uVar26 * 4);
            if (*(char *)(lVar23 + 3 + lVar16) == '\0') {
              uVar34 = TTA::Merge(uVar34,*(uint *)(lVar54 + 0x10 + lVar16 * 4));
              *(uint *)(lVar53 + uVar26 * 4) = uVar34;
            }
            else {
              *(uint *)(lVar53 + uVar26 * 4) = uVar34;
            }
          }
LAB_003005e6:
          iVar14 = (int)uVar33;
          uVar34 = iVar14 + 2;
          if ((int)uVar34 < local_168) {
            lVar24 = (long)iVar14;
            iVar39 = iVar14 + 2;
            lVar28 = lVar24 << 0x20;
            lVar16 = lVar37 + lVar24 * 4;
            lVar46 = lVar31 + lVar24;
            lVar17 = lVar50 + lVar24;
            lVar21 = lVar40 + lVar24 * 4;
            lVar25 = 0;
            do {
              iVar35 = (int)lVar25;
              if (*(char *)(lVar46 + -1 + lVar25) == '\0') {
                if (*(char *)(lVar46 + lVar25) == '\0') {
                  iVar35 = iVar39 + iVar35;
                  uVar26 = lVar24 + lVar25 + 2;
                  goto LAB_002fff15;
                }
                if (*(char *)(lVar17 + -1 + lVar25) != '\0') {
                  iVar35 = iVar39 + iVar35;
                  uVar26 = lVar24 + lVar25 + 2;
                  goto LAB_00300a30;
                }
                if (*(char *)(lVar17 + lVar25) == '\0') {
                  uVar33 = (ulong)(uint)(iVar39 + iVar35);
                  uVar26 = lVar24 + lVar25 + 2;
                  goto LAB_00300860;
                }
                uVar34 = *(uint *)(lVar21 + lVar25 * 4);
                if (*(char *)(lVar43 + lVar24 + lVar25) == '\0') {
                  uVar13 = *(uint *)(lVar21 + 8 + lVar25 * 4);
LAB_003006c4:
                  uVar34 = TTA::Merge(uVar34,uVar13);
                }
              }
              else {
                if (*(char *)(lVar17 + -1 + lVar25) != '\0') {
                  uVar33 = (ulong)(uint)(iVar39 + iVar35);
                  uVar34 = *(uint *)(lVar21 + lVar25 * 4);
                  uVar26 = lVar24 + lVar25 + 2;
                  goto LAB_00300c3d;
                }
                if (*(char *)(lVar46 + lVar25) == '\0') {
                  iVar39 = iVar39 + iVar35;
                  uVar34 = *(uint *)(lVar53 + (lVar28 >> 0x1e));
                  uVar26 = lVar24 + lVar25 + 2;
                  goto LAB_0030149d;
                }
                if (*(char *)(lVar17 + lVar25) == '\0') goto LAB_00300786;
                if (*(char *)(lVar43 + lVar24 + lVar25) == '\0') {
                  uVar34 = *(uint *)(lVar21 + 8 + lVar25 * 4);
                  uVar13 = *(uint *)(lVar16 + -8 + lVar25 * 4);
                  goto LAB_003006c4;
                }
                uVar34 = *(uint *)(lVar21 + lVar25 * 4);
              }
              *(uint *)(lVar16 + lVar25 * 4) = uVar34;
              lVar28 = lVar28 + 0x200000000;
              lVar44 = lVar24 + lVar25;
              lVar25 = lVar25 + 2;
              if ((long)uVar32 <= lVar44 + 4) {
                uVar34 = iVar14 + (int)lVar25 + 2;
                iVar14 = iVar14 + (int)lVar25;
                break;
              }
            } while( true );
          }
          uVar26 = (ulong)uVar34;
          if (local_168 < (int)uVar34) {
LAB_0030194d:
            lVar50 = (long)(int)uVar26;
            if (*(char *)(lVar47 + lVar50) == '\0') {
              *(undefined4 *)(lVar53 + lVar50 * 4) = 0;
            }
            else {
              *(undefined4 *)(lVar53 + lVar50 * 4) = *(undefined4 *)(lVar53 + -8 + lVar50 * 4);
            }
            goto LAB_00301bfe;
          }
          lVar50 = (long)(int)uVar34;
          lVar31 = (long)iVar14;
          if (*(char *)(lVar47 + lVar50) == '\0') {
            if (*(char *)(lVar47 + 3 + lVar31) == '\0') goto LAB_00301ab1;
            goto LAB_00301731;
          }
          if (*(char *)(lVar30 + 3 + lVar31) != '\0') goto LAB_00301731;
          uVar12 = *(undefined4 *)(lVar53 + lVar31 * 4);
          goto LAB_00301735;
        }
        if (*(char *)(lVar30 + 3 + lVar16) != '\0') {
          uVar34 = *(uint *)(lVar54 + uVar26 * 4);
          goto LAB_00300c3d;
        }
        if (*(char *)(lVar47 + 3 + lVar16) != '\0') goto LAB_002ffe03;
        iVar39 = iVar35;
        if (*(char *)(lVar30 + uVar26) == '\0') {
          uVar33 = (ulong)TTA::length_;
          TTA::rtable_[uVar33] = TTA::length_;
          TTA::next_[uVar33] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
        }
        else {
          uVar34 = *(uint *)(lVar54 + uVar26 * 4);
        }
LAB_0030149d:
        *(uint *)(lVar53 + uVar26 * 4) = uVar34;
        uVar34 = iVar39 + 2;
        uVar33 = (ulong)uVar34;
      } while ((int)uVar34 < local_168);
    }
    lVar50 = (long)(int)uVar34;
    if (local_168 < (int)uVar34) {
      if (*(char *)(lVar47 + lVar50) == '\0') {
LAB_00301ab1:
        *(undefined4 *)(lVar53 + lVar50 * 4) = 0;
        goto LAB_00301bfe;
      }
LAB_00301726:
      if (*(char *)(lVar30 + lVar50) == '\0') {
        uVar32 = (ulong)TTA::length_;
        TTA::rtable_[uVar32] = TTA::length_;
        TTA::next_[uVar32] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar53 + lVar50 * 4) = TTA::length_;
        TTA::length_ = uVar34;
        goto LAB_00301bfe;
      }
    }
    else {
      if ((*(char *)(lVar47 + lVar50) == '\0') && (*(char *)((long)iVar39 + 3 + lVar47) == '\0'))
      goto LAB_00301ab1;
      if (*(char *)(lVar30 + 3 + (long)iVar39) == '\0') goto LAB_00301726;
    }
LAB_00301731:
    uVar12 = *(undefined4 *)(lVar54 + lVar50 * 4);
LAB_00301735:
    *(undefined4 *)(lVar53 + lVar50 * 4) = uVar12;
    goto LAB_00301bfe;
  }
  lVar53 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar34 = uVar4 - 2;
  if (2 < (int)uVar4) {
    iVar35 = -2;
    iVar39 = 0;
LAB_002f53c3:
    lVar50 = (long)iVar39;
    cVar10 = *(char *)(lVar47 + 3 + (long)iVar35);
    if (*(char *)(lVar47 + lVar50) == '\0') {
      if (cVar10 != '\0') {
        uVar32 = (ulong)TTA::length_;
        puVar19[uVar32] = TTA::length_;
        puVar55[uVar32] = 0xffffffff;
        puVar20[TTA::length_] = TTA::length_;
        uVar13 = TTA::length_ + 1;
        *(uint *)(lVar53 + lVar50 * 4) = TTA::length_;
        TTA::length_ = uVar13;
        goto LAB_002f543e;
      }
LAB_002f54c0:
      uVar12 = 0;
      goto LAB_002f54c2;
    }
    uVar32 = (ulong)TTA::length_;
    puVar19[uVar32] = TTA::length_;
    puVar55[uVar32] = 0xffffffff;
    puVar20[TTA::length_] = TTA::length_;
    uVar13 = TTA::length_ + 1;
    *(uint *)(lVar53 + lVar50 * 4) = TTA::length_;
    TTA::length_ = uVar13;
    iVar35 = iVar39;
    if (cVar10 == '\0') goto LAB_002f54c6;
LAB_002f543e:
    puVar8 = TTA::tail_;
    puVar7 = TTA::next_;
    iVar35 = iVar39 + 2;
    if (iVar35 < (int)uVar34) {
      lVar50 = (long)iVar35;
      do {
        iVar35 = iVar39;
        lVar31 = (long)iVar35;
        cVar10 = *(char *)(lVar47 + 3 + lVar31);
        if (*(char *)(lVar47 + lVar50) == '\0') {
          if (cVar10 == '\0') {
            iVar39 = iVar35 + 2;
            goto LAB_002f54c0;
          }
          uVar32 = (ulong)TTA::length_;
          puVar19[uVar32] = TTA::length_;
          puVar7[uVar32] = 0xffffffff;
          puVar8[TTA::length_] = TTA::length_;
          uVar13 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
        }
        else {
          if (cVar10 == '\0') goto LAB_002f54b2;
          uVar13 = *(uint *)(lVar53 + lVar31 * 4);
        }
        *(uint *)(lVar53 + lVar50 * 4) = uVar13;
        lVar50 = lVar50 + 2;
        iVar39 = iVar35 + 2;
        if ((long)(ulong)uVar34 <= lVar50) {
          iVar35 = iVar35 + 4;
          break;
        }
      } while( true );
    }
    lVar50 = (long)iVar35;
    if ((int)uVar34 < iVar35) {
      if (*(char *)(lVar47 + lVar50) == '\0') {
        *(undefined4 *)(lVar53 + lVar50 * 4) = 0;
      }
      else {
        *(undefined4 *)(lVar53 + lVar50 * 4) = *(undefined4 *)(lVar53 + (long)iVar39 * 4);
      }
    }
    else if (*(char *)(lVar47 + lVar50) == '\0') {
      if (*(char *)(lVar47 + 3 + (long)iVar39) == '\0') {
        *(undefined4 *)(lVar53 + lVar50 * 4) = 0;
      }
      else {
        uVar32 = (ulong)TTA::length_;
        puVar19[uVar32] = TTA::length_;
        TTA::next_[uVar32] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar53 + lVar50 * 4) = TTA::length_;
        TTA::length_ = uVar34;
      }
    }
    else {
      *(undefined4 *)(lVar53 + lVar50 * 4) = *(undefined4 *)(lVar53 + (long)iVar39 * 4);
    }
    goto LAB_00301bfe;
  }
  iVar39 = 0;
  lVar50 = -2;
  goto LAB_002f5902;
LAB_002f56a3:
  iVar39 = (int)lVar40 + (int)lVar30;
  *(undefined4 *)(lVar16 + 8 + lVar30 * 4) = *(undefined4 *)(lVar16 + lVar30 * 4);
LAB_002f56b4:
  puVar8 = TTA::tail_;
  puVar7 = TTA::next_;
  iVar35 = iVar39 + 2;
  if (iVar35 < local_168) {
    lVar38 = (long)iVar39;
    lVar54 = lVar38 + 2;
    lVar36 = (lVar38 << 0x20) + 0x300000000;
    lVar40 = lVar31 + lVar38 * 4;
    lVar16 = lVar50 + 1 + lVar47 + lVar38;
    lVar38 = lVar38 + lVar47 + 2;
    lVar30 = 0;
LAB_002f5713:
    if (*(char *)(lVar38 + lVar30) == '\0') {
      if (*(char *)(lVar16 + 1 + lVar30) == '\0') {
        uVar27 = lVar54 + lVar30;
        if (*(char *)(lVar47 + (lVar36 >> 0x20)) != '\0') {
LAB_002f584b:
          uVar33 = (ulong)TTA::length_;
          puVar19[uVar33] = TTA::length_;
          puVar55[uVar33] = 0xffffffff;
          puVar20[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
          goto LAB_002f58a4;
        }
        if (*(char *)(lVar53 + (lVar36 >> 0x20)) != '\0') {
          uVar33 = (ulong)TTA::length_;
          puVar19[uVar33] = TTA::length_;
          puVar55[uVar33] = 0xffffffff;
          puVar20[TTA::length_] = TTA::length_;
          iVar39 = (int)uVar27;
          uVar34 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
          goto LAB_002f55f4;
        }
        uVar26 = uVar27 & 0xffffffff;
        goto LAB_002f58cf;
      }
      if (*(char *)(lVar38 + 1 + lVar30) != '\0') {
        if (*(char *)(lVar30 + lVar16) == '\0') {
          uVar33 = (ulong)TTA::length_;
          puVar19[uVar33] = TTA::length_;
          puVar55[uVar33] = 0xffffffff;
          puVar20[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
        }
        else {
          uVar34 = *(uint *)(lVar40 + lVar30 * 4);
        }
        goto LAB_002f58a4;
      }
      if (*(char *)(lVar16 + lVar30) == '\0') {
        uVar33 = (ulong)TTA::length_;
        puVar19[uVar33] = TTA::length_;
        puVar7[uVar33] = 0xffffffff;
        goto LAB_002f578c;
      }
LAB_002f574f:
      uVar34 = *(uint *)(lVar40 + lVar30 * 4);
    }
    else {
      cVar10 = *(char *)(lVar38 + 1 + lVar30);
      if (*(char *)(lVar16 + lVar30) != '\0') {
        if (cVar10 == '\0') goto LAB_002f574f;
        uVar34 = *(uint *)(lVar40 + lVar30 * 4);
LAB_002f58a4:
        uVar27 = lVar54 + lVar30;
        iVar39 = (int)uVar27;
        goto LAB_002f55f4;
      }
      if (cVar10 != '\0') goto LAB_002f584b;
      uVar33 = (ulong)TTA::length_;
      puVar19[uVar33] = TTA::length_;
      puVar7[uVar33] = 0xffffffff;
LAB_002f578c:
      puVar8[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_;
      TTA::length_ = TTA::length_ + 1;
    }
    *(uint *)(lVar40 + 8 + lVar30 * 4) = uVar34;
    lVar36 = lVar36 + 0x200000000;
    lVar37 = lVar30 + lVar54;
    lVar30 = lVar30 + 2;
    if ((long)(uVar32 & 0xffffffff) <= lVar37 + 2) {
      iVar35 = (int)lVar30 + iVar39 + 2;
      iVar39 = iVar39 + (int)lVar30;
      goto LAB_002f5aac;
    }
    goto LAB_002f5713;
  }
LAB_002f5aac:
  lVar40 = (long)iVar35;
  if (local_168 < iVar35) {
    if ((*(char *)(lVar47 + lVar40) == '\0') && (*(char *)(lVar53 + lVar40) == '\0'))
    goto LAB_002f5c29;
  }
  else if (*(char *)(lVar47 + lVar40) == '\0') {
    if (*(char *)(lVar53 + lVar40) == '\0') {
LAB_002f5bef:
      if ((*(char *)((long)iVar39 + 3 + lVar47) == '\0') &&
         (*(char *)(lVar53 + 3 + (long)iVar39) == '\0')) goto LAB_002f5c29;
    }
    else if (*(char *)(lVar53 + 1 + (long)iVar39) != '\0') {
      uVar34 = *(uint *)(lVar31 + (long)iVar39 * 4);
      goto LAB_002f5c2b;
    }
    goto LAB_002f5c00;
  }
  if (*(char *)(lVar53 + 1 + (long)iVar39) != '\0') {
    uVar34 = *(uint *)(lVar31 + (long)iVar39 * 4);
    goto LAB_002f5c2b;
  }
LAB_002f5c00:
  uVar33 = (ulong)TTA::length_;
  puVar19[uVar33] = TTA::length_;
  TTA::next_[uVar33] = 0xffffffff;
  goto LAB_002f5a6f;
LAB_002f9c52:
  *(undefined4 *)(lVar52 + lVar58 * 4) = *(undefined4 *)(lVar28 + lVar58 * 4);
  local_148 = (ulong)(uint)(iVar35 + iVar14);
LAB_002fa96c:
  iVar39 = (int)local_148;
  lVar37 = (long)iVar39;
  local_148 = lVar37 + 2;
  uVar34 = (uint)local_148;
  if ((int)uVar34 < local_168) {
    if (*(char *)(lVar31 + local_148) == '\0') {
      cVar10 = *(char *)(lVar37 + 3 + lVar31);
      if (pcVar1[lVar37 + 2] == '\0') {
        if (cVar10 == '\0') {
          if (pcVar1[lVar37 + 3] == '\0') {
LAB_002fadb0:
            puVar20 = puVar19 + local_148;
            goto LAB_002fb63f;
          }
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          puVar19[lVar37 + 2] = TTA::length_;
          TTA::length_ = uVar34;
LAB_002fb45f:
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f76f0;
        }
        if (pcVar22[lVar37 + 3] != '\0') {
          puVar19[lVar37 + 2] = puVar55[lVar37 + 2];
          goto LAB_002faf4f;
        }
        if (pcVar22[lVar37 + 4] == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          puVar19[lVar37 + 2] = TTA::length_;
          TTA::length_ = uVar34;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f8d2f;
        }
        puVar19[lVar37 + 2] = puVar55[lVar37 + 4];
        goto LAB_002f94cb;
      }
      if (cVar10 == '\0') {
        puVar19[lVar37 + 2] = puVar19[lVar37];
        goto LAB_002fb93e;
      }
      if (pcVar22[lVar37 + 3] != '\0') {
        if (pcVar22[local_148 - lVar16] == '\0') {
          uVar34 = puVar55[lVar37 + 2];
          uVar13 = puVar19[lVar37];
        }
        else {
          uVar34 = puVar55[lVar37];
          if (pcVar22[lVar37 + (1 - lVar16)] != '\0') {
            puVar19[lVar37 + 2] = uVar34;
            goto LAB_002faf4f;
          }
          uVar13 = puVar55[lVar37 + 2];
        }
        uVar34 = TTA::Merge(uVar34,uVar13);
        puVar19[lVar37 + 2] = uVar34;
        goto LAB_002faf4f;
      }
      if (pcVar22[lVar37 + 4] != '\0') {
        if (pcVar22[lVar37 + (3 - lVar16)] == '\0') {
          uVar34 = TTA::Merge(puVar55[lVar37 + 4],puVar19[lVar37]);
          puVar19[lVar37 + 2] = uVar34;
          goto LAB_002f94cb;
        }
        if (pcVar22[local_148 - lVar16] == '\0') {
          uVar34 = puVar55[lVar37 + 2];
          uVar13 = puVar19[lVar37];
        }
        else {
          uVar34 = puVar55[lVar37];
          if (pcVar22[lVar37 + (1 - lVar16)] != '\0') {
            puVar19[lVar37 + 2] = uVar34;
            goto LAB_002f94cb;
          }
          uVar13 = puVar55[lVar37 + 2];
        }
        uVar34 = TTA::Merge(uVar34,uVar13);
        puVar19[lVar37 + 2] = uVar34;
        goto LAB_002f94cb;
      }
    }
    else {
      if (pcVar22[lVar37 + 3] != '\0') {
        if (pcVar22[local_148 - lVar16] == '\0') {
          uVar34 = puVar55[lVar37 + 2];
          uVar13 = puVar19[lVar37];
        }
        else {
          uVar34 = puVar55[lVar37];
          if (pcVar22[lVar37 + (1 - lVar16)] != '\0') {
            puVar19[lVar37 + 2] = uVar34;
            goto LAB_002f5d6c;
          }
          uVar13 = puVar55[lVar37 + 2];
        }
        uVar34 = TTA::Merge(uVar34,uVar13);
        puVar19[lVar37 + 2] = uVar34;
        goto LAB_002f5d6c;
      }
      if (*(char *)(lVar31 + 3 + lVar37) == '\0') {
        uVar13 = puVar19[lVar37];
        goto LAB_002f97fb;
      }
      if (pcVar22[lVar37 + 4] != '\0') {
        if (pcVar22[lVar37 + (3 - lVar16)] == '\0') {
          uVar34 = TTA::Merge(puVar55[lVar37 + 4],puVar19[lVar37]);
          puVar19[lVar37 + 2] = uVar34;
          goto LAB_002f94cb;
        }
        if (pcVar22[local_148 - lVar16] == '\0') {
          uVar34 = puVar55[lVar37 + 2];
          uVar13 = puVar19[lVar37];
        }
        else {
          uVar34 = puVar55[lVar37];
          if (pcVar22[lVar37 + (1 - lVar16)] != '\0') {
            puVar19[lVar37 + 2] = uVar34;
            goto LAB_002f94cb;
          }
          uVar13 = puVar55[lVar37 + 2];
        }
        uVar34 = TTA::Merge(uVar34,uVar13);
        puVar19[lVar37 + 2] = uVar34;
        goto LAB_002f94cb;
      }
    }
    uVar34 = puVar19[lVar37];
    uVar26 = local_148 & 0xffffffff;
LAB_002fc706:
    puVar19[local_148] = uVar34;
    iVar39 = (int)uVar26;
    uVar34 = iVar39 + 2;
    if ((int)uVar34 < local_168) {
      lVar21 = (long)iVar39;
      lVar37 = lVar21 + 2;
      lVar17 = lVar21 << 0x20;
      lVar23 = lVar36 + lVar21 * 4;
      lVar46 = lVar54 + 8 + lVar23;
      lVar41 = lVar40 + lVar38 + lVar21;
      lVar28 = lVar41 + 3;
      lVar43 = lVar40 + lVar16 * lVar50 + lVar21;
      lVar24 = 0;
      lVar25 = 0;
      do {
        lVar44 = lVar17 >> 0x1e;
        lVar52 = lVar17 >> 0x20;
        iVar35 = (int)lVar37;
        if (*(char *)(lVar41 + 2 + lVar25) == '\0') {
          if (*(char *)(lVar40 + lVar16 * lVar47 + lVar21 + 2 + lVar25) == '\0') {
            local_148 = lVar37 + lVar25;
            lVar37 = lVar17 + 0x300000000 >> 0x20;
            if (*(char *)(lVar31 + lVar37) == '\0') {
              if (pcVar1[lVar37] != '\0') {
                uVar26 = (ulong)TTA::length_;
                TTA::rtable_[uVar26] = TTA::length_;
                TTA::next_[uVar26] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar34 = TTA::length_ + 1;
                *(uint *)(lVar23 + lVar54 + 8 + lVar25 * 4) = TTA::length_;
                TTA::length_ = uVar34;
                local_148 = local_148 & 0xffffffff;
                goto LAB_002f76f0;
              }
              iVar39 = (int)local_148;
              puVar20 = (uint *)(lVar23 + lVar54 + lVar24 + 8);
              goto LAB_002f738e;
            }
            if (pcVar22[lVar37] != '\0') {
              *(undefined4 *)(lVar46 + lVar25 * 4) =
                   *(undefined4 *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4);
              local_148 = local_148 & 0xffffffff;
              goto LAB_002faf4f;
            }
            lVar37 = lVar17 + 0x400000000 >> 0x20;
            if (pcVar22[lVar37] == '\0') {
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              *(uint *)(lVar23 + lVar54 + 8 + lVar25 * 4) = TTA::length_;
              TTA::length_ = uVar34;
              local_148 = local_148 & 0xffffffff;
              goto LAB_002f8d2f;
            }
            *(uint *)(lVar23 + lVar54 + 8 + lVar25 * 4) = puVar55[lVar37];
            local_148 = local_148 & 0xffffffff;
            goto LAB_002f94cb;
          }
          if (*(char *)(lVar28 + lVar25) == '\0') {
            local_148 = (ulong)(uint)(iVar35 + (int)lVar25);
            *(undefined4 *)(lVar23 + lVar54 + 8 + lVar25 * 4) =
                 *(undefined4 *)((long)puVar19 + lVar44);
            goto LAB_002fb93e;
          }
          if (*(char *)(lVar43 + 3 + lVar25) != '\0') goto LAB_002fcb70;
          if (*(char *)(lVar43 + 4 + lVar25) != '\0') {
            lVar41 = lVar16 * lVar53 + lVar21 + lVar40;
            if (*(char *)(lVar25 + 3 + lVar41) == '\0') goto LAB_002fcc5b;
            if (*(char *)(lVar25 + 2 + lVar41) == '\0') {
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4),
                                  *(uint *)((long)puVar19 + lVar44));
              *(uint *)(lVar46 + lVar25 * 4) = uVar34;
            }
            else {
              if (pcVar22[lVar52] != '\0') {
                uVar34 = puVar55[lVar52];
                if (pcVar22[lVar52 + (1 - lVar16)] == '\0') {
                  uVar34 = TTA::Merge(uVar34,*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 +
                                                      lVar25 * 4));
                  *(uint *)(lVar46 + lVar25 * 4) = uVar34;
                  goto LAB_002fda20;
                }
                goto LAB_002fcc49;
              }
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4),
                                  puVar19[lVar52]);
              *(uint *)(lVar46 + lVar25 * 4) = uVar34;
            }
            goto LAB_002fd1cb;
          }
        }
        else {
          if (*(char *)(lVar43 + 3 + lVar25) != '\0') {
            local_148 = lVar37 + lVar25;
            if (*(char *)(lVar25 + 2 + lVar16 * lVar53 + lVar21 + lVar40) == '\0') {
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4),
                                  *(uint *)((long)puVar19 + lVar44));
              *(uint *)(lVar46 + lVar25 * 4) = uVar34;
              local_148 = local_148 & 0xffffffff;
              goto LAB_002f5d6c;
            }
            if (pcVar22[lVar52] == '\0') {
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4),
                                  puVar19[lVar52]);
              *(uint *)(lVar46 + lVar25 * 4) = uVar34;
              local_148 = local_148 & 0xffffffff;
              goto LAB_002f5d6c;
            }
            if (pcVar22[lVar52 + (1 - lVar16)] != '\0') {
              *(uint *)(lVar23 + lVar54 + 8 + lVar25 * 4) = puVar55[lVar52];
              local_148 = local_148 & 0xffffffff;
              goto LAB_002f5d6c;
            }
            uVar34 = TTA::Merge(puVar55[lVar52],
                                *(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4));
            *(uint *)(lVar46 + lVar25 * 4) = uVar34;
            local_148 = local_148 & 0xffffffff;
            goto LAB_002f5d6c;
          }
          if (*(char *)(lVar28 + lVar25) == '\0') {
            local_148 = lVar37 + lVar25;
            uVar13 = *(uint *)((long)puVar19 + lVar44);
            uVar26 = local_148;
            goto LAB_002f97f6;
          }
          if (*(char *)(lVar43 + 4 + lVar25) != '\0') {
            lVar41 = lVar16 * lVar53 + lVar21 + lVar40;
            if (*(char *)(lVar25 + 3 + lVar41) == '\0') {
LAB_002fcc5b:
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 0x10 +
                                           lVar25 * 4),*(uint *)((long)puVar19 + lVar44));
              *(uint *)(lVar46 + lVar25 * 4) = uVar34;
            }
            else if (*(char *)(lVar25 + 2 + lVar41) == '\0') {
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4),
                                  *(uint *)((long)puVar19 + lVar44));
              *(uint *)(lVar46 + lVar25 * 4) = uVar34;
            }
            else {
              if (pcVar22[lVar52] != '\0') {
                uVar34 = puVar55[lVar52];
                if (pcVar22[lVar52 + (1 - lVar16)] == '\0') {
                  uVar34 = TTA::Merge(uVar34,*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 +
                                                      lVar25 * 4));
                  *(uint *)(lVar46 + lVar25 * 4) = uVar34;
LAB_002fda20:
                  local_148 = (ulong)(uint)(iVar35 + (int)lVar25);
                }
                else {
LAB_002fcc49:
                  *(uint *)(lVar23 + lVar54 + 8 + lVar25 * 4) = uVar34;
                  local_148 = lVar37 + lVar25 & 0xffffffff;
                }
                goto LAB_002f94cb;
              }
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4),
                                  puVar19[lVar52]);
              *(uint *)(lVar46 + lVar25 * 4) = uVar34;
            }
LAB_002fd1cb:
            local_148 = lVar37 + lVar25 & 0xffffffff;
            goto LAB_002f94cb;
          }
        }
        *(undefined4 *)(lVar46 + lVar25 * 4) = *(undefined4 *)(lVar46 + -8 + lVar25 * 4);
        lVar17 = lVar17 + 0x200000000;
        lVar24 = lVar24 + 8;
        lVar44 = lVar25 + lVar37;
        lVar25 = lVar25 + 2;
        if ((long)uVar32 <= lVar44 + 2) {
          iVar39 = iVar39 + (int)lVar25;
          uVar34 = iVar35 + (int)lVar25;
          break;
        }
      } while( true );
    }
    if (local_168 < (int)uVar34) goto LAB_002fb1a7;
    uVar26 = (ulong)uVar34;
    if (*(char *)(lVar31 + uVar26) != '\0') {
      if (pcVar22[(long)iVar39 + 3] == '\0') {
LAB_002fce18:
        puVar19[uVar26] = puVar19[iVar39];
      }
      else if (pcVar22[uVar26 - lVar16] == '\0') {
        uVar34 = puVar55[uVar26];
LAB_002fcae4:
        uVar34 = TTA::Merge(uVar34,puVar19[iVar39]);
        puVar19[uVar26] = uVar34;
      }
      else {
LAB_002fc88d:
        if (pcVar22[iVar39] == '\0') {
          uVar34 = TTA::Merge(puVar55[uVar26],puVar19[iVar39]);
          puVar19[uVar26] = uVar34;
        }
        else if (pcVar22[(long)iVar39 + (1 - lVar16)] == '\0') {
          uVar34 = TTA::Merge(puVar55[iVar39],puVar55[uVar26]);
          puVar19[uVar26] = uVar34;
        }
        else {
          puVar19[uVar26] = puVar55[iVar39];
        }
      }
      goto LAB_002ff3e2;
    }
    uVar27 = (ulong)(iVar39 + 3);
    if (pcVar1[uVar26] == '\0') {
      if (*(char *)(lVar31 + uVar27) == '\0') {
        if (pcVar1[uVar27] == '\0') {
          puVar19[uVar26] = 0;
        }
        else {
          uVar27 = (ulong)TTA::length_;
          TTA::rtable_[uVar27] = TTA::length_;
          TTA::next_[uVar27] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          puVar19[uVar26] = TTA::length_;
          TTA::length_ = uVar34;
        }
        goto LAB_002ff3e2;
      }
      if (pcVar22[uVar27] == '\0') {
        uVar27 = (ulong)TTA::length_;
        TTA::rtable_[uVar27] = TTA::length_;
        TTA::next_[uVar27] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        puVar19[uVar26] = TTA::length_;
        TTA::length_ = uVar34;
        goto LAB_002ff3e2;
      }
      uVar34 = puVar55[uVar26];
    }
    else {
      if (*(char *)(lVar31 + uVar27) == '\0') goto LAB_002fce18;
      if (pcVar22[uVar27] != '\0') {
        if (pcVar22[uVar26 - lVar16] == '\0') {
          uVar34 = puVar55[uVar26];
          goto LAB_002fcae4;
        }
        goto LAB_002fc88d;
      }
      uVar34 = puVar19[iVar39];
    }
    puVar19[uVar26] = uVar34;
    goto LAB_002ff3e2;
  }
  if (local_168 < (int)uVar34) goto LAB_002fb1a7;
  uVar26 = local_148 & 0xffffffff;
  if (*(char *)(lVar31 + uVar26) == '\0') {
    uVar27 = (ulong)(iVar39 + 3);
    if (pcVar1[uVar26] == '\0') {
      if (*(char *)(lVar31 + uVar27) == '\0') {
        if (pcVar1[uVar27] == '\0') {
LAB_002fad9e:
          puVar19[uVar26] = 0;
        }
        else {
LAB_002fad6e:
          uVar27 = (ulong)TTA::length_;
          TTA::rtable_[uVar27] = TTA::length_;
          TTA::next_[uVar27] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          puVar19[uVar26] = TTA::length_;
          TTA::length_ = uVar34;
        }
      }
      else if (pcVar22[uVar27] == '\0') {
LAB_002fae10:
        uVar27 = (ulong)TTA::length_;
        TTA::rtable_[uVar27] = TTA::length_;
        TTA::next_[uVar27] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        puVar19[uVar26] = TTA::length_;
        TTA::length_ = uVar34;
      }
      else {
        uVar34 = puVar55[uVar26];
LAB_002fabf8:
        puVar19[uVar26] = uVar34;
      }
      goto LAB_002ff3e2;
    }
    if (*(char *)(lVar31 + uVar27) == '\0') goto LAB_002fab37;
    if (pcVar22[uVar27] == '\0') {
      puVar19[uVar26] = puVar19[lVar37];
      goto LAB_002ff3e2;
    }
  }
  else if (pcVar22[lVar37 + 3] == '\0') {
LAB_002fab37:
    puVar19[uVar26] = puVar19[lVar37];
    goto LAB_002ff3e2;
  }
  if (pcVar22[uVar26 - lVar16] == '\0') {
    uVar34 = puVar55[uVar26];
    uVar13 = puVar19[lVar37];
  }
  else {
    uVar34 = puVar55[lVar37];
    if (pcVar22[lVar37 + (1 - lVar16)] != '\0') {
      puVar19[uVar26] = uVar34;
      goto LAB_002ff3e2;
    }
    uVar13 = puVar55[uVar26];
  }
  uVar34 = TTA::Merge(uVar34,uVar13);
  puVar19[uVar26] = uVar34;
  goto LAB_002ff3e2;
LAB_002fcb70:
  local_148 = lVar37 + lVar25;
  if (*(char *)(lVar25 + 2 + lVar16 * lVar53 + lVar21 + lVar40) == '\0') {
    uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4),
                        *(uint *)((long)puVar19 + lVar44));
    *(uint *)(lVar46 + lVar25 * 4) = uVar34;
    local_148 = local_148 & 0xffffffff;
  }
  else if (pcVar22[lVar52] == '\0') {
    uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4),
                        puVar19[lVar52]);
    *(uint *)(lVar46 + lVar25 * 4) = uVar34;
    local_148 = local_148 & 0xffffffff;
  }
  else {
    if (pcVar22[lVar52 + (1 - lVar16)] == '\0') {
      uVar34 = TTA::Merge(puVar55[lVar52],
                          *(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar25 * 4));
      *(uint *)(lVar46 + lVar25 * 4) = uVar34;
    }
    else {
      *(uint *)(lVar23 + lVar54 + 8 + lVar25 * 4) = puVar55[lVar52];
    }
    local_148 = local_148 & 0xffffffff;
  }
LAB_002faf4f:
  iVar39 = (int)local_148;
  uVar34 = iVar39 + 2;
  if ((int)uVar34 < local_168) {
    lVar43 = (long)iVar39;
    lVar37 = lVar43 + 2;
    lVar52 = lVar43 << 0x20;
    lVar23 = lVar30 * lVar53 + lVar43 * 4;
    lVar46 = lVar54 + lVar23;
    lVar48 = lVar46 + 8;
    lVar41 = lVar36 + lVar43 * 4;
    lVar44 = lVar54 + lVar41 + 8;
    lVar28 = lVar16 * lVar47 + lVar43;
    lVar25 = lVar16 * lVar53 + lVar43;
    lVar24 = lVar16 * lVar50 + lVar43;
    lVar17 = lVar40 + lVar24;
    lVar21 = lVar40 + lVar43 + lVar38;
    lVar43 = 0;
    lVar58 = 0;
LAB_002fb022:
    lVar51 = lVar52 >> 0x1e;
    if (*(char *)(lVar21 + 2 + lVar58) != '\0') {
      local_148 = lVar37 + lVar58;
      lVar23 = lVar52 + 0x300000000 >> 0x20;
      if (pcVar22[lVar23] != '\0') {
        if (*(char *)(lVar58 + 2 + lVar24 + lVar40) != '\0') {
          *(undefined4 *)(lVar44 + lVar58 * 4) = *(undefined4 *)(lVar48 + lVar58 * 4);
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f5d6c;
        }
        if (*(char *)(lVar58 + 2 + lVar25 + lVar40) == '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar48 + lVar58 * 4),*(uint *)((long)puVar19 + lVar51));
          *(uint *)(lVar44 + lVar58 * 4) = uVar34;
          goto LAB_002f5d6c;
        }
        *(undefined4 *)(lVar41 + lVar54 + 8 + lVar58 * 4) = *(undefined4 *)((long)puVar55 + lVar51);
        local_148 = local_148 & 0xffffffff;
        goto LAB_002f5d6c;
      }
      if (*(char *)(lVar31 + lVar23) == '\0') {
        uVar13 = *(uint *)((long)puVar19 + lVar51);
        uVar26 = local_148;
        goto LAB_002f97f6;
      }
      lVar43 = lVar52 + 0x400000000 >> 0x20;
      if (pcVar22[lVar43] == '\0') {
        uVar34 = *(uint *)((long)puVar19 + lVar51);
        uVar26 = local_148 & 0xffffffff;
        goto LAB_002fc706;
      }
      if (pcVar22[lVar23 - lVar16] == '\0') {
        uVar34 = TTA::Merge(puVar55[lVar43],*(uint *)((long)puVar19 + lVar51));
        *(uint *)(lVar41 + lVar54 + 8 + lVar58 * 4) = uVar34;
LAB_002fb80f:
        local_148 = lVar37 + lVar58 & 0xffffffff;
      }
      else if (*(char *)(lVar58 + 2 + lVar24 + lVar40) == '\0') {
        if (*(char *)(lVar58 + 2 + lVar25 + lVar40) == '\0') {
LAB_002fb8e3:
          local_148 = lVar37 + lVar58;
          uVar34 = TTA::Merge(*(uint *)(lVar48 + lVar58 * 4),*(uint *)((long)puVar19 + lVar51));
          *(uint *)(lVar44 + lVar58 * 4) = uVar34;
        }
        else {
LAB_002fb335:
          *(undefined4 *)(lVar41 + lVar54 + 8 + lVar58 * 4) =
               *(undefined4 *)((long)puVar55 + lVar51);
LAB_002fb75d:
          local_148 = lVar37 + lVar58 & 0xffffffff;
        }
      }
      else {
LAB_002fb3c9:
        local_148 = lVar37 + lVar58;
        *(undefined4 *)(lVar44 + lVar58 * 4) = *(undefined4 *)(lVar48 + lVar58 * 4);
LAB_002fb3d4:
        local_148 = local_148 & 0xffffffff;
      }
      goto LAB_002f94cb;
    }
    cVar10 = *(char *)(lVar21 + 3 + lVar58);
    if (*(char *)(lVar40 + lVar28 + 2 + lVar58) == '\0') {
      if (cVar10 == '\0') {
        local_148 = lVar37 + lVar58;
        if (*(char *)(lVar58 + 3 + lVar28 + lVar40) != '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar41 + lVar54 + 8 + lVar58 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          goto LAB_002fb45f;
        }
        lVar43 = lVar43 + lVar41 + lVar54;
        goto LAB_002fb63a;
      }
      if (*(char *)(lVar17 + 3 + lVar58) != '\0') goto LAB_002fb07d;
      local_148 = lVar37 + lVar58;
      lVar43 = lVar52 + 0x400000000 >> 0x20;
      cVar10 = *(char *)(lVar58 + 2 + lVar24 + lVar40);
      if (pcVar22[lVar43] == '\0') {
        if (cVar10 == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar41 + lVar54 + 8 + lVar58 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f8d2f;
        }
        *(undefined4 *)(lVar44 + lVar58 * 4) = *(undefined4 *)(lVar48 + lVar58 * 4);
        local_148 = local_148 & 0xffffffff;
        goto LAB_002fa96c;
      }
      if (cVar10 == '\0') {
        *(uint *)(lVar41 + lVar54 + 8 + lVar58 * 4) = puVar55[lVar43];
        goto LAB_002fb75d;
      }
      uVar34 = *(uint *)(lVar23 + lVar54 + 8 + lVar58 * 4);
      if (*(char *)(lVar58 + 3 + lVar25 + lVar40) == '\0') {
        uVar34 = TTA::Merge(uVar34,puVar55[lVar43]);
        *(uint *)(lVar41 + lVar54 + 8 + lVar58 * 4) = uVar34;
      }
      else {
        *(uint *)(lVar41 + lVar54 + 8 + lVar58 * 4) = uVar34;
      }
      local_148 = local_148 & 0xffffffff;
      goto LAB_002f94cb;
    }
    if (cVar10 == '\0') goto LAB_002fb28e;
    if (*(char *)(lVar17 + 3 + lVar58) != '\0') {
      if (*(char *)(lVar17 + 2 + lVar58) == '\0') {
        if (*(char *)(lVar25 + lVar40 + 2 + lVar58) == '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar48 + lVar58 * 4),*(uint *)(lVar54 + lVar41 + lVar58 * 4)
                             );
        }
        else {
          uVar34 = *(uint *)(lVar46 + lVar58 * 4);
        }
      }
      else {
LAB_002fb07d:
        uVar34 = *(uint *)(lVar48 + lVar58 * 4);
      }
      *(uint *)(lVar44 + lVar58 * 4) = uVar34;
      lVar52 = lVar52 + 0x200000000;
      lVar43 = lVar43 + 8;
      lVar51 = lVar37 + lVar58;
      lVar58 = lVar58 + 2;
      if ((long)uVar32 <= lVar51 + 2) {
        iVar39 = iVar39 + (int)lVar58;
        uVar34 = (int)lVar37 + (int)lVar58;
        goto LAB_002fb19d;
      }
      goto LAB_002fb022;
    }
    local_148 = lVar37 + lVar58;
    lVar23 = lVar52 + 0x400000000 >> 0x20;
    if (pcVar22[lVar23] != '\0') {
      if (*(char *)(lVar58 + 3 + lVar25 + lVar40) == '\0') {
        uVar34 = TTA::Merge(puVar55[lVar23],*(uint *)((long)puVar19 + lVar51));
        *(uint *)(lVar41 + lVar54 + 8 + lVar58 * 4) = uVar34;
        goto LAB_002fb80f;
      }
      if (*(char *)(lVar58 + 2 + lVar24 + lVar40) != '\0') goto LAB_002fb3c9;
      if (*(char *)(lVar58 + 2 + lVar25 + lVar40) == '\0') goto LAB_002fb8e3;
      goto LAB_002fb335;
    }
    uVar34 = *(uint *)((long)puVar19 + lVar51);
    uVar26 = local_148;
LAB_002fb57a:
    uVar26 = uVar26 & 0xffffffff;
    goto LAB_002fc706;
  }
LAB_002fb19d:
  if (local_168 < (int)uVar34) goto LAB_002fb1a7;
  local_148 = (ulong)uVar34;
  if (*(char *)(lVar31 + local_148) != '\0') {
    lVar40 = (long)iVar39;
    if (pcVar22[lVar40 + 3] == '\0') {
LAB_002fbd38:
      uVar34 = puVar19[lVar40];
LAB_002fbd3b:
      puVar19[local_148] = uVar34;
    }
    else if (pcVar22[local_148] == '\0') {
      if (pcVar22[local_148 - lVar16] == '\0') {
        uVar34 = puVar55[local_148];
        uVar13 = puVar19[lVar40];
LAB_002fe036:
        uVar34 = TTA::Merge(uVar34,uVar13);
LAB_002fe04c:
        puVar19[local_148] = uVar34;
      }
      else {
        puVar19[local_148] = puVar55[lVar40];
      }
    }
    else {
LAB_002fc655:
      uVar34 = puVar55[local_148];
LAB_002ff3db:
      puVar19[local_148] = uVar34;
    }
    goto LAB_002ff3e2;
  }
  uVar26 = (ulong)(iVar39 + 3);
  if (pcVar1[local_148] == '\0') {
    if (*(char *)(lVar31 + uVar26) == '\0') {
      cVar10 = pcVar1[uVar26];
      uVar34 = TTA::length_;
joined_r0x002fb692:
      TTA::length_ = uVar34;
      if (cVar10 == '\0') {
        puVar19[local_148] = 0;
      }
      else {
        TTA::rtable_[uVar34] = uVar34;
        TTA::next_[uVar34] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        puVar19[local_148] = TTA::length_;
        TTA::length_ = uVar34;
      }
      goto LAB_002ff3e2;
    }
    if (pcVar22[uVar26] == '\0') {
      cVar10 = pcVar22[local_148];
joined_r0x002f6ddd:
      if (cVar10 != '\0') {
LAB_002fb775:
        uVar34 = puVar55[local_148];
        goto LAB_002fb779;
      }
LAB_002fb782:
      uVar26 = (ulong)TTA::length_;
      TTA::rtable_[uVar26] = TTA::length_;
      TTA::next_[uVar26] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      puVar19[local_148] = TTA::length_;
      TTA::length_ = uVar34;
      goto LAB_002ff3e2;
    }
    uVar34 = puVar55[local_148];
  }
  else {
    if (*(char *)(lVar31 + uVar26) != '\0') {
      if (pcVar22[uVar26] == '\0') {
        lVar31 = (long)iVar39;
LAB_002fb680:
        uVar34 = puVar19[lVar31];
      }
      else {
        cVar10 = pcVar22[local_148];
joined_r0x002f65b7:
        if (cVar10 != '\0') goto LAB_002fb775;
        if (pcVar22[local_148 - lVar16] == '\0') {
          uVar34 = puVar55[local_148];
LAB_002f7900:
          uVar13 = puVar19[iVar39];
          goto LAB_002fe036;
        }
        uVar34 = puVar55[iVar39];
      }
LAB_002fb779:
      puVar19[local_148] = uVar34;
      goto LAB_002ff3e2;
    }
    lVar31 = (long)iVar39;
LAB_002fb597:
    uVar34 = puVar19[lVar31];
  }
  puVar19[local_148] = uVar34;
  goto LAB_002ff3e2;
LAB_002fb28e:
  uVar34 = (int)lVar37 + (int)lVar58;
  uVar12 = *(undefined4 *)((long)puVar19 + lVar51);
LAB_002fb2a6:
  *(undefined4 *)(lVar41 + lVar54 + 8 + lVar58 * 4) = uVar12;
  local_148 = (ulong)uVar34;
LAB_002fb93e:
  puVar8 = TTA::tail_;
  puVar7 = TTA::next_;
  puVar20 = TTA::rtable_;
  iVar39 = (int)local_148;
  uVar34 = iVar39 + 2;
  if ((int)uVar34 < local_168) {
    lVar46 = (long)iVar39;
    lVar37 = lVar46 + 2;
    lVar28 = lVar46 << 0x20;
    lVar43 = lVar40 + 3 + lVar38 + lVar46;
    lVar23 = lVar36 + lVar46 * 4;
    lVar24 = lVar54 + lVar23 + 8;
    lVar41 = lVar40 + lVar16 * lVar47 + lVar46;
    lVar17 = 0;
    lVar21 = 0;
LAB_002fb9d6:
    lVar25 = lVar28 >> 0x20;
    if (*(char *)(lVar43 + -1 + lVar21) != '\0') goto LAB_002fbb2c;
    if (*(char *)(lVar41 + 2 + lVar21) == '\0') {
      local_148 = lVar37 + lVar21;
      lVar41 = lVar28 + 0x300000000 >> 0x20;
      if (*(char *)(lVar31 + lVar41) == '\0') {
        if (pcVar1[lVar41] == '\0') {
          puVar20 = (uint *)(lVar17 + lVar23 + lVar54 + 8);
          iVar39 = (int)local_148;
          goto LAB_002f738e;
        }
        uVar26 = (ulong)TTA::length_;
        TTA::rtable_[uVar26] = TTA::length_;
        TTA::next_[uVar26] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = TTA::length_;
        TTA::length_ = uVar34;
        goto LAB_002f76f0;
      }
      if (pcVar22[lVar41] != '\0') {
        *(undefined4 *)(lVar24 + lVar21 * 4) =
             *(undefined4 *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
        local_148 = local_148 & 0xffffffff;
        goto LAB_002faf4f;
      }
      lVar43 = lVar28 + 0x400000000 >> 0x20;
      cVar10 = *(char *)(lVar21 + 2 + lVar16 * lVar50 + lVar46 + lVar40);
      if (pcVar22[lVar43] == '\0') {
        if (cVar10 != '\0') {
LAB_002fc553:
          local_148 = lVar37 + lVar21;
          *(undefined4 *)(lVar24 + lVar21 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
          goto LAB_002fa96c;
        }
LAB_002fce53:
        local_148 = lVar37 + lVar21;
        uVar26 = (ulong)TTA::length_;
        TTA::rtable_[uVar26] = TTA::length_;
        TTA::next_[uVar26] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = TTA::length_;
        TTA::length_ = uVar34;
        goto LAB_002f8d2f;
      }
      if (cVar10 == '\0') {
LAB_002fc58f:
        local_148 = lVar37 + lVar21;
        uVar34 = puVar55[lVar43];
LAB_002fc59b:
        *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
      }
      else {
        uVar34 = *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
        if (pcVar22[lVar41 - lVar16] == '\0') {
          uVar34 = TTA::Merge(uVar34,puVar55[lVar43]);
          *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
LAB_002fc140:
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f94cb;
        }
LAB_002fc3e5:
        local_148 = lVar37 + lVar21;
LAB_002fc3f0:
        *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
      }
LAB_002fc5a4:
      local_148 = local_148 & 0xffffffff;
    }
    else {
      if (*(char *)(lVar43 + lVar21) == '\0') {
        if (*(char *)(lVar41 + 1 + lVar21) == '\0') {
          uVar26 = (ulong)TTA::length_;
          puVar20[uVar26] = TTA::length_;
          puVar7[uVar26] = 0xffffffff;
          puVar8[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
        }
        else {
          uVar34 = *(uint *)(lVar54 + lVar23 + lVar21 * 4);
        }
        *(uint *)(lVar24 + lVar21 * 4) = uVar34;
        lVar28 = lVar28 + 0x200000000;
        lVar17 = lVar17 + 8;
        lVar25 = lVar37 + lVar21;
        lVar21 = lVar21 + 2;
        if ((long)uVar32 <= lVar25 + 2) {
          iVar39 = iVar39 + (int)lVar21;
          uVar34 = (int)lVar37 + (int)lVar21;
          goto LAB_002fba8e;
        }
        goto LAB_002fb9d6;
      }
      local_148 = lVar37 + lVar21;
      lVar41 = lVar16 * lVar50 + lVar46 + lVar40;
      cVar10 = *(char *)(lVar21 + 3 + lVar41);
      if (pcVar1[lVar25 + 1] != '\0') {
        if (cVar10 != '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4),
                              puVar19[lVar25]);
          *(uint *)(lVar24 + lVar21 * 4) = uVar34;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002faf4f;
        }
        lVar43 = lVar28 + 0x400000000 >> 0x20;
        if (pcVar22[lVar43] == '\0') {
          if (*(char *)(lVar21 + 2 + lVar41) != '\0') {
            uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4),
                                puVar19[lVar25]);
            *(uint *)(lVar24 + lVar21 * 4) = uVar34;
            goto LAB_002fa96c;
          }
          *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = puVar19[lVar25];
          goto LAB_002f8d2f;
        }
        if (*(char *)(lVar21 + 3 + lVar16 * lVar53 + lVar46 + lVar40) != '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4),
                              puVar19[lVar25]);
          *(uint *)(lVar24 + lVar21 * 4) = uVar34;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f94cb;
        }
        if (*(char *)(lVar21 + 2 + lVar41) == '\0') {
          uVar34 = puVar55[lVar43];
          goto LAB_002fd5c7;
        }
        uVar34 = *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
        uVar13 = puVar55[lVar43];
        goto LAB_002fcdee;
      }
      if (cVar10 != '\0') {
        *(undefined4 *)(lVar24 + lVar21 * 4) =
             *(undefined4 *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
LAB_002fbf8d:
        local_148 = local_148 & 0xffffffff;
        goto LAB_002faf4f;
      }
      lVar43 = lVar28 + 0x400000000 >> 0x20;
      cVar10 = *(char *)(lVar21 + 2 + lVar41);
      if (pcVar22[lVar43] == '\0') {
        if (cVar10 == '\0') goto LAB_002fce53;
        goto LAB_002fc553;
      }
      if (cVar10 == '\0') goto LAB_002fc58f;
      uVar34 = *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
      if (*(char *)(lVar21 + 3 + lVar16 * lVar53 + lVar46 + lVar40) != '\0') goto LAB_002fc3e5;
      uVar34 = TTA::Merge(uVar34,puVar55[lVar43]);
LAB_002fd5b4:
      *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
LAB_002fd5b8:
      local_148 = local_148 & 0xffffffff;
    }
    goto LAB_002f94cb;
  }
LAB_002fba8e:
  local_148 = (ulong)uVar34;
  if (local_168 < (int)uVar34) {
    if (*(char *)(lVar31 + local_148) == '\0') {
      if (pcVar1[local_148] == '\0') {
LAB_002fbd85:
        puVar19[local_148] = 0;
      }
      else {
        lVar40 = (long)iVar39;
        if (pcVar1[lVar40 + 1] != '\0') goto LAB_002fbd38;
LAB_002fbd43:
        uVar26 = (ulong)TTA::length_;
        TTA::rtable_[uVar26] = TTA::length_;
        TTA::next_[uVar26] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        puVar19[local_148] = TTA::length_;
        TTA::length_ = uVar34;
      }
      goto LAB_002ff3e2;
    }
    uVar34 = iVar39 + 1;
    if (pcVar1[uVar34] != '\0') {
      if (pcVar22[uVar34] == '\0') {
        if (pcVar22[local_148] == '\0') {
LAB_002fc418:
          uVar34 = puVar19[iVar39];
          goto LAB_002ff3db;
        }
        uVar34 = puVar55[local_148];
        lVar40 = (long)iVar39;
      }
      else {
        lVar40 = (long)iVar39;
        uVar34 = puVar55[lVar40];
      }
LAB_002fbfaf:
      uVar13 = puVar19[lVar40];
      goto LAB_002fe036;
    }
    if (pcVar22[local_148] != '\0') goto LAB_002fc655;
    if (pcVar22[uVar34] != '\0') {
      lVar40 = (long)iVar39;
LAB_002fbe16:
      uVar34 = puVar55[lVar40];
      goto LAB_002ff3db;
    }
  }
  else {
    if (*(char *)(lVar31 + local_148) != '\0') {
      uVar34 = iVar39 + 1;
      lVar31 = (long)iVar39;
      if (pcVar1[uVar34] == '\0') {
        if (pcVar22[lVar31 + 3] == '\0') {
          if (pcVar22[local_148] != '\0') goto LAB_002fc230;
          if (pcVar22[uVar34] == '\0') {
            uVar26 = (ulong)TTA::length_;
            TTA::rtable_[uVar26] = TTA::length_;
            TTA::next_[uVar26] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            puVar19[local_148] = TTA::length_;
            TTA::length_ = uVar34;
          }
          else {
            uVar34 = puVar55[lVar31];
LAB_002fc234:
            puVar19[local_148] = uVar34;
          }
          goto LAB_002ff3e2;
        }
        if ((pcVar22[local_148] != '\0') || (pcVar22[uVar34] == '\0')) {
LAB_002fc230:
          uVar34 = puVar55[local_148];
          goto LAB_002fc234;
        }
        uVar34 = puVar55[lVar31];
        if (pcVar22[local_148 - lVar16] != '\0') {
          puVar19[local_148] = uVar34;
          goto LAB_002ff3e2;
        }
        uVar13 = puVar55[local_148];
      }
      else {
        if (pcVar22[lVar31 + 3] == '\0') {
          if (pcVar22[uVar34] == '\0') {
            if (pcVar22[local_148] == '\0') {
              uVar34 = puVar19[lVar31];
              goto LAB_002fc234;
            }
            goto LAB_002fbb23;
          }
          uVar34 = puVar55[lVar31];
        }
        else {
          if ((pcVar22[local_148] == '\0') && (pcVar22[uVar34] != '\0')) {
            uVar34 = puVar55[lVar31];
            if (pcVar22[local_148 - lVar16] == '\0') {
              uVar34 = TTA::Merge(uVar34,puVar55[local_148]);
              uVar13 = puVar19[lVar31];
            }
            else {
              uVar13 = puVar19[lVar31];
            }
            uVar34 = TTA::Merge(uVar34,uVar13);
            puVar19[local_148] = uVar34;
            goto LAB_002ff3e2;
          }
LAB_002fbb23:
          uVar34 = puVar55[local_148];
        }
LAB_002fbfcf:
        uVar13 = puVar19[lVar31];
      }
      uVar34 = TTA::Merge(uVar34,uVar13);
      puVar19[local_148] = uVar34;
      goto LAB_002ff3e2;
    }
    uVar26 = (ulong)(iVar39 + 3);
    if (pcVar1[local_148] != '\0') {
      if (*(char *)(lVar31 + uVar26) == '\0') {
        if (pcVar1[(long)iVar39 + 1] == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          puVar19[local_148] = TTA::length_;
          TTA::length_ = uVar34;
          goto LAB_002ff3e2;
        }
LAB_002fc21b:
        uVar34 = puVar19[iVar39];
      }
      else {
        if (pcVar1[(long)iVar39 + 1] != '\0') {
          if (pcVar22[uVar26] == '\0') {
            if (pcVar22[local_148] == '\0') goto LAB_002fc21b;
            uVar34 = puVar55[local_148];
            uVar13 = puVar19[iVar39];
          }
          else {
            uVar34 = puVar55[local_148];
            uVar13 = puVar19[iVar39];
          }
LAB_002fefa7:
          uVar34 = TTA::Merge(uVar34,uVar13);
          puVar19[local_148] = uVar34;
          goto LAB_002ff3e2;
        }
        if (pcVar22[uVar26] == '\0') {
          cVar10 = pcVar22[local_148];
          goto joined_r0x002fcebd;
        }
        uVar34 = puVar55[local_148];
      }
      puVar19[local_148] = uVar34;
      goto LAB_002ff3e2;
    }
    if (*(char *)(lVar31 + uVar26) == '\0') {
      cVar10 = pcVar1[uVar26];
      uVar34 = TTA::length_;
joined_r0x002fc43e:
      TTA::length_ = uVar34;
      if (cVar10 == '\0') {
        puVar19[local_148] = 0;
      }
      else {
        TTA::rtable_[uVar34] = uVar34;
        TTA::next_[uVar34] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        puVar19[local_148] = TTA::length_;
        TTA::length_ = uVar34;
      }
      goto LAB_002ff3e2;
    }
    if (pcVar22[uVar26] != '\0') {
      uVar34 = puVar55[local_148];
      goto LAB_002fbd3b;
    }
    cVar10 = pcVar22[local_148];
joined_r0x002fcebd:
    if (cVar10 != '\0') goto LAB_002fc655;
  }
LAB_002fcec3:
  uVar26 = (ulong)TTA::length_;
  TTA::rtable_[uVar26] = TTA::length_;
  TTA::next_[uVar26] = 0xffffffff;
  TTA::tail_[TTA::length_] = TTA::length_;
  uVar34 = TTA::length_ + 1;
  puVar19[local_148] = TTA::length_;
  TTA::length_ = uVar34;
  goto LAB_002ff3e2;
LAB_002fbb2c:
  local_148 = lVar37 + lVar21;
  lVar41 = lVar28 + 0x100000000 >> 0x20;
  lVar43 = lVar28 + 0x300000000 >> 0x20;
  lVar17 = lVar28 >> 0x1e;
  if (pcVar1[lVar41] == '\0') {
    if (pcVar22[lVar43] != '\0') {
      if ((*(char *)(lVar21 + 2 + lVar16 * lVar50 + lVar46 + lVar40) == '\0') &&
         (pcVar22[lVar41] != '\0')) {
        if (*(char *)(lVar21 + 2 + lVar16 * lVar53 + lVar46 + lVar40) == '\0') {
          uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar17),
                              *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4));
          *(uint *)(lVar24 + lVar21 * 4) = uVar34;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f5d6c;
        }
        *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = *(uint *)((long)puVar55 + lVar17);
      }
      else {
        *(undefined4 *)(lVar24 + lVar21 * 4) =
             *(undefined4 *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
      }
      local_148 = local_148 & 0xffffffff;
      goto LAB_002f5d6c;
    }
    if (*(char *)(lVar31 + lVar43) == '\0') {
      if (*(char *)(lVar21 + 2 + lVar16 * lVar50 + lVar46 + lVar40) != '\0') {
        *(undefined4 *)(lVar24 + lVar21 * 4) =
             *(undefined4 *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
        goto LAB_002fcdb4;
      }
      if (pcVar22[lVar41] == '\0') {
        uVar26 = (ulong)TTA::length_;
        TTA::rtable_[uVar26] = TTA::length_;
        TTA::next_[uVar26] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = TTA::length_;
        TTA::length_ = uVar34;
        goto LAB_002fd9e8;
      }
      *(undefined4 *)(lVar23 + lVar54 + 8 + lVar21 * 4) = *(undefined4 *)((long)puVar55 + lVar17);
      goto LAB_002fd9e8;
    }
    lVar37 = lVar28 + 0x400000000 >> 0x20;
    cVar10 = *(char *)(lVar21 + 2 + lVar16 * lVar50 + lVar46 + lVar40);
    if (pcVar22[lVar37] != '\0') {
      if (cVar10 == '\0') {
        if (pcVar22[lVar41] == '\0') {
          *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = puVar55[lVar37];
LAB_002f8a8b:
          local_148 = local_148 & 0xffffffff;
        }
        else {
          if (pcVar22[lVar43 - lVar16] == '\0') {
            uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar17),puVar55[lVar37]);
            *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
          }
          else if (*(char *)(lVar21 + 2 + lVar16 * lVar53 + lVar46 + lVar40) == '\0') {
            uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar17),
                                *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4));
            *(uint *)(lVar24 + lVar21 * 4) = uVar34;
          }
          else {
            *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = *(uint *)((long)puVar55 + lVar17);
          }
LAB_002fdafe:
          local_148 = local_148 & 0xffffffff;
        }
      }
      else {
        uVar34 = *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
        if (pcVar22[lVar43 - lVar16] == '\0') {
          uVar34 = TTA::Merge(uVar34,puVar55[lVar37]);
          *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
        }
        else {
          *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
        }
        local_148 = local_148 & 0xffffffff;
      }
      goto LAB_002f94cb;
    }
    if (cVar10 != '\0') {
      *(undefined4 *)(lVar24 + lVar21 * 4) =
           *(undefined4 *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
      goto LAB_002fa96c;
    }
    if (pcVar22[lVar41] == '\0') {
      uVar26 = (ulong)TTA::length_;
      TTA::rtable_[uVar26] = TTA::length_;
      TTA::next_[uVar26] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = TTA::length_;
      TTA::length_ = uVar34;
    }
    else {
      *(undefined4 *)(lVar23 + lVar54 + 8 + lVar21 * 4) = *(undefined4 *)((long)puVar55 + lVar17);
    }
  }
  else {
    if (pcVar22[lVar43] != '\0') {
      if (*(char *)(lVar21 + 2 + lVar16 * lVar50 + lVar46 + lVar40) == '\0') {
        if (pcVar22[lVar41] != '\0') {
          if (*(char *)(lVar21 + 2 + lVar16 * lVar53 + lVar46 + lVar40) == '\0') {
            uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar17),
                                *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4));
            uVar34 = TTA::Merge(uVar34,puVar19[lVar25]);
            *(uint *)(lVar24 + lVar21 * 4) = uVar34;
          }
          else {
            uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar17),puVar19[lVar25]);
            *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
          }
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f5d6c;
        }
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4),
                            *(uint *)((long)puVar19 + lVar17));
      }
      else {
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4),
                            *(uint *)((long)puVar19 + lVar17));
      }
      *(uint *)(lVar24 + lVar21 * 4) = uVar34;
      local_148 = local_148 & 0xffffffff;
      goto LAB_002f5d6c;
    }
    if (*(char *)(lVar31 + lVar43) == '\0') {
      if (pcVar22[lVar41] != '\0') {
        uVar13 = TTA::Merge(*(uint *)((long)puVar55 + lVar17),*(uint *)((long)puVar19 + lVar17));
        goto LAB_002fc539;
      }
      if (*(char *)(lVar21 + 2 + lVar16 * lVar50 + lVar46 + lVar40) == '\0') {
        *(undefined4 *)(lVar23 + lVar54 + 8 + lVar21 * 4) = *(undefined4 *)((long)puVar19 + lVar17);
        local_148 = local_148 & 0xffffffff;
        goto LAB_002fdb0d;
      }
      uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4),
                          *(uint *)((long)puVar19 + lVar17));
      *(uint *)(lVar24 + lVar21 * 4) = uVar34;
      local_148 = local_148 & 0xffffffff;
      goto LAB_002fe276;
    }
    lVar28 = lVar28 + 0x400000000 >> 0x20;
    if (pcVar22[lVar28] != '\0') {
      if (*(char *)(lVar21 + 2 + lVar16 * lVar50 + lVar46 + lVar40) != '\0') {
        uVar34 = *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
        if (pcVar22[lVar43 - lVar16] == '\0') {
          uVar34 = TTA::Merge(uVar34,puVar55[lVar28]);
          uVar13 = *(uint *)((long)puVar19 + lVar17);
        }
        else {
          uVar13 = *(uint *)((long)puVar19 + lVar17);
        }
        uVar34 = TTA::Merge(uVar34,uVar13);
        *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
LAB_002fd33b:
        local_148 = local_148 & 0xffffffff;
        goto LAB_002f94cb;
      }
      if (pcVar22[lVar41] == '\0') {
        uVar34 = puVar55[lVar28];
        uVar13 = *(uint *)((long)puVar19 + lVar17);
      }
      else {
        if (pcVar22[lVar43 - lVar16] != '\0') {
          uVar34 = *(uint *)((long)puVar55 + lVar17);
          if (*(char *)(lVar21 + 2 + lVar16 * lVar53 + lVar46 + lVar40) == '\0') {
            uVar13 = *(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4);
LAB_002fcdee:
            uVar34 = TTA::Merge(uVar34,uVar13);
            uVar34 = TTA::Merge(uVar34,puVar19[lVar25]);
            *(uint *)(lVar24 + lVar21 * 4) = uVar34;
          }
          else {
LAB_002fd5c7:
            uVar34 = TTA::Merge(uVar34,puVar19[lVar25]);
            *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
          }
          local_148 = lVar37 + lVar21;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f94cb;
        }
        uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar17),puVar55[lVar28]);
        uVar13 = *(uint *)((long)puVar19 + lVar17);
      }
      uVar34 = TTA::Merge(uVar34,uVar13);
      *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
      local_148 = local_148 & 0xffffffff;
      goto LAB_002f94cb;
    }
    if (pcVar22[lVar41] != '\0') {
      uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar17),*(uint *)((long)puVar19 + lVar17));
      uVar26 = local_148;
      goto LAB_002fc706;
    }
    if (*(char *)(lVar21 + 2 + lVar16 * lVar50 + lVar46 + lVar40) != '\0') {
      uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar21 * 4),
                          *(uint *)((long)puVar19 + lVar17));
      *(uint *)(lVar24 + lVar21 * 4) = uVar34;
      goto LAB_002fa96c;
    }
    *(undefined4 *)(lVar23 + lVar54 + 8 + lVar21 * 4) = *(undefined4 *)((long)puVar19 + lVar17);
  }
LAB_002f8d2f:
  puVar8 = TTA::tail_;
  puVar7 = TTA::next_;
  puVar20 = TTA::rtable_;
  iVar39 = (int)local_148;
  uVar34 = iVar39 + 2;
  if (local_168 <= (int)uVar34) {
LAB_002f8ee4:
    if (local_168 < (int)uVar34) goto LAB_002fb1a7;
    local_148 = (ulong)uVar34;
    if (*(char *)(lVar31 + local_148) != '\0') {
      lVar40 = (long)iVar39;
      if (pcVar22[lVar40 + 3] == '\0') goto LAB_002fbd38;
      uVar34 = puVar55[local_148];
      goto LAB_002fbfaf;
    }
    uVar26 = (ulong)(iVar39 + 3);
    if (pcVar1[local_148] != '\0') {
      if (*(char *)(lVar31 + uVar26) == '\0') {
        lVar40 = (long)iVar39;
        goto LAB_002fbd38;
      }
      if (pcVar22[uVar26] == '\0') goto LAB_002fc418;
      uVar34 = puVar55[local_148];
      lVar40 = (long)iVar39;
      goto LAB_002fbfaf;
    }
    if (*(char *)(lVar31 + uVar26) == '\0') {
      cVar10 = pcVar1[uVar26];
      uVar34 = TTA::length_;
      goto joined_r0x002fc43e;
    }
    if (pcVar22[uVar26] == '\0') {
LAB_002f939b:
      uVar26 = (ulong)TTA::length_;
      TTA::rtable_[uVar26] = TTA::length_;
      TTA::next_[uVar26] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      puVar19[local_148] = TTA::length_;
      TTA::length_ = uVar34;
      goto LAB_002ff3e2;
    }
LAB_002f91dc:
    uVar34 = puVar55[local_148];
    goto LAB_002ff3db;
  }
  lVar46 = (long)iVar39;
  lVar37 = lVar46 + 2;
  lVar17 = lVar46 << 0x20;
  lVar28 = lVar16 * lVar47 + lVar46;
  lVar23 = lVar40 + lVar38 + lVar46;
  lVar41 = lVar40 + lVar16 * lVar50 + lVar46;
  lVar43 = lVar36 + lVar46 * 4;
  lVar21 = lVar43 + lVar54 + 8;
  lVar25 = 0;
  lVar24 = 0;
  while (lVar44 = lVar17 >> 0x1e, *(char *)(lVar23 + 2 + lVar24) == '\0') {
    if (*(char *)(lVar40 + lVar28 + 2 + lVar24) != '\0') {
      local_148 = lVar37 + lVar24;
      lVar37 = lVar17 + 0x300000000 >> 0x20;
      if (*(char *)(lVar31 + lVar37) == '\0') {
        *(undefined4 *)(lVar43 + lVar54 + 8 + lVar24 * 4) = *(undefined4 *)((long)puVar19 + lVar44);
        goto LAB_002fb93e;
      }
      if (pcVar22[lVar37] != '\0') {
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar24 * 4),
                            *(uint *)((long)puVar19 + lVar44));
        *(uint *)(lVar21 + lVar24 * 4) = uVar34;
        goto LAB_002faf4f;
      }
      lVar23 = lVar17 + 0x400000000 >> 0x20;
      if (pcVar22[lVar23] == '\0') {
        uVar34 = *(uint *)((long)puVar19 + lVar44);
        uVar26 = local_148 & 0xffffffff;
        goto LAB_002fc706;
      }
      if (pcVar22[lVar37 - lVar16] == '\0') {
        uVar34 = TTA::Merge(puVar55[lVar23],*(uint *)((long)puVar19 + lVar44));
        *(uint *)(lVar21 + lVar24 * 4) = uVar34;
      }
      else {
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar24 * 4),
                            *(uint *)((long)puVar19 + lVar44));
        *(uint *)(lVar21 + lVar24 * 4) = uVar34;
      }
      goto LAB_002f94cb;
    }
    if (*(char *)(lVar23 + 3 + lVar24) == '\0') {
      local_148 = lVar37 + lVar24;
      iVar39 = (int)local_148;
      if (*(char *)(lVar24 + 3 + lVar28 + lVar40) == '\0') {
        puVar20 = (uint *)(lVar25 + lVar43 + lVar54 + 8);
        goto LAB_002f738e;
      }
      uVar26 = (ulong)TTA::length_;
      TTA::rtable_[uVar26] = TTA::length_;
      TTA::next_[uVar26] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      *(uint *)(lVar43 + lVar54 + 8 + lVar24 * 4) = TTA::length_;
      TTA::length_ = uVar34;
      goto LAB_002f9108;
    }
    iVar35 = (int)lVar37;
    if (*(char *)(lVar41 + 3 + lVar24) != '\0') {
      local_148 = (ulong)(uint)(iVar35 + (int)lVar24);
      *(undefined4 *)(lVar21 + lVar24 * 4) =
           *(undefined4 *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar24 * 4);
      goto LAB_002faf4f;
    }
    if (*(char *)(lVar41 + 4 + lVar24) != '\0') {
      local_148 = (ulong)(uint)(iVar35 + (int)lVar24);
      *(undefined4 *)(lVar21 + lVar24 * 4) =
           *(undefined4 *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 0x10 + lVar24 * 4);
      goto LAB_002f94cb;
    }
    uVar26 = (ulong)TTA::length_;
    puVar20[uVar26] = TTA::length_;
    puVar7[uVar26] = 0xffffffff;
    puVar8[TTA::length_] = TTA::length_;
    uVar34 = TTA::length_ + 1;
    *(uint *)(lVar21 + lVar24 * 4) = TTA::length_;
    TTA::length_ = uVar34;
    lVar17 = lVar17 + 0x200000000;
    lVar25 = lVar25 + 8;
    lVar44 = lVar37 + lVar24;
    lVar24 = lVar24 + 2;
    if ((long)uVar32 <= lVar44 + 2) {
      iVar39 = iVar39 + (int)lVar24;
      uVar34 = iVar35 + (int)lVar24;
      goto LAB_002f8ee4;
    }
  }
  local_148 = lVar37 + lVar24;
  lVar37 = lVar17 + 0x300000000 >> 0x20;
  if (pcVar22[lVar37] != '\0') {
    uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar24 * 4),
                        *(uint *)((long)puVar19 + lVar44));
    *(uint *)(lVar21 + lVar24 * 4) = uVar34;
    goto LAB_002f5d6c;
  }
  if (*(char *)(lVar31 + lVar37) != '\0') {
    lVar23 = lVar17 + 0x400000000 >> 0x20;
    if (pcVar22[lVar23] == '\0') {
      uVar34 = *(uint *)((long)puVar19 + lVar44);
      uVar26 = local_148 & 0xffffffff;
      goto LAB_002fc706;
    }
    if (pcVar22[lVar37 - lVar16] == '\0') {
      uVar34 = TTA::Merge(puVar55[lVar23],*(uint *)((long)puVar19 + lVar44));
      *(uint *)(lVar21 + lVar24 * 4) = uVar34;
    }
    else {
      uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar46 * 4 + lVar54 + 8 + lVar24 * 4),
                          *(uint *)((long)puVar19 + lVar44));
      *(uint *)(lVar21 + lVar24 * 4) = uVar34;
    }
    goto LAB_002f94cb;
  }
  uVar13 = *(uint *)((long)puVar19 + lVar44);
  uVar26 = local_148 & 0xffffffff;
LAB_002f97f6:
  uVar34 = (uint)uVar26;
LAB_002f97fb:
  while( true ) {
    puVar19[local_148] = uVar13;
    lVar37 = (long)(int)uVar34;
    local_148 = lVar37 + 2;
    if (local_168 <= (int)local_148) break;
    if (*(char *)(lVar31 + local_148) == '\0') {
      cVar10 = *(char *)(lVar37 + 3 + lVar31);
      if (pcVar1[lVar37 + 2] == '\0') {
        if (cVar10 == '\0') {
          if (pcVar1[lVar37 + 3] == '\0') goto LAB_002fadb0;
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          puVar19[lVar37 + 2] = TTA::length_;
          TTA::length_ = uVar34;
          goto LAB_002fb45f;
        }
        if (pcVar22[lVar37 + 3] != '\0') {
LAB_002f9e6b:
          puVar19[lVar37 + 2] = puVar55[lVar37 + 2];
          goto LAB_002faf4f;
        }
        cVar10 = pcVar22[lVar37 + 2];
        if (pcVar22[lVar37 + 4] != '\0') {
          if (cVar10 == '\0') {
LAB_002fa4ee:
            uVar34 = puVar55[lVar37 + 4];
            goto LAB_002fa4fd;
          }
          uVar34 = puVar55[lVar37 + 2];
          if (pcVar22[lVar37 + (3 - lVar16)] != '\0') goto LAB_002f9d96;
LAB_002fa8ac:
          uVar34 = TTA::Merge(uVar34,puVar55[lVar37 + 4]);
          goto LAB_002fa8c7;
        }
      }
      else {
        if (cVar10 == '\0') {
          if (pcVar1[lVar37 + 1] == '\0') {
            uVar26 = (ulong)TTA::length_;
            TTA::rtable_[uVar26] = TTA::length_;
            TTA::next_[uVar26] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            puVar19[lVar37 + 2] = TTA::length_;
            TTA::length_ = uVar34;
          }
          else {
            puVar19[lVar37 + 2] = puVar19[lVar37];
          }
          goto LAB_002fb93e;
        }
        if (pcVar1[lVar37 + 1] != '\0') {
          if (pcVar22[lVar37 + 3] != '\0') {
            if (pcVar22[lVar37] == '\0') {
              uVar34 = TTA::Merge(puVar55[lVar37 + 2],puVar19[lVar37]);
              puVar19[lVar37 + 2] = uVar34;
            }
            else if (pcVar22[lVar37 + (1 - lVar16)] == '\0') {
              uVar34 = TTA::Merge(puVar55[lVar37],puVar55[lVar37 + 2]);
              puVar19[lVar37 + 2] = uVar34;
            }
            else if (pcVar22[local_148] == '\0') {
              if (pcVar22[local_148 - lVar16] == '\0') {
                uVar34 = TTA::Merge(puVar55[lVar37],puVar55[lVar37 + 2]);
                puVar19[lVar37 + 2] = uVar34;
              }
              else {
                puVar19[lVar37 + 2] = puVar55[lVar37];
              }
            }
            else {
              puVar19[lVar37 + 2] = puVar55[lVar37];
            }
            goto LAB_002faf4f;
          }
          if (pcVar22[lVar37 + 4] != '\0') goto LAB_002fa002;
          if (pcVar22[lVar37 + 2] == '\0') goto LAB_002fa4dd;
          if (pcVar22[lVar37] == '\0') {
            uVar34 = puVar55[lVar37 + 2];
            uVar13 = puVar19[lVar37];
          }
          else {
            uVar34 = puVar55[lVar37];
            if (pcVar22[lVar37 + (1 - lVar16)] != '\0') {
              puVar19[lVar37 + 2] = uVar34;
              local_148 = local_148 & 0xffffffff;
              goto LAB_002fa96c;
            }
            uVar13 = puVar55[lVar37 + 2];
          }
          uVar34 = TTA::Merge(uVar34,uVar13);
          puVar19[lVar37 + 2] = uVar34;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002fa96c;
        }
        if (pcVar22[lVar37 + 3] != '\0') goto LAB_002f9e6b;
        cVar10 = pcVar22[lVar37 + 2];
        if (pcVar22[lVar37 + 4] != '\0') {
          if (cVar10 == '\0') goto LAB_002fa4ee;
          uVar34 = puVar55[lVar37 + 2];
          if (pcVar22[lVar37 + (3 - lVar16)] == '\0') goto LAB_002fa8ac;
          puVar19[lVar37 + 2] = uVar34;
          goto LAB_002f94cb;
        }
      }
LAB_002fa24a:
      if (cVar10 != '\0') {
        puVar19[lVar37 + 2] = puVar55[lVar37 + 2];
        local_148 = local_148 & 0xffffffff;
        goto LAB_002fa96c;
      }
      uVar26 = (ulong)TTA::length_;
      TTA::rtable_[uVar26] = TTA::length_;
      TTA::next_[uVar26] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      puVar19[lVar37 + 2] = TTA::length_;
      TTA::length_ = uVar34;
LAB_002fa4e6:
      local_148 = local_148 & 0xffffffff;
      goto LAB_002f8d2f;
    }
    if (pcVar1[lVar37 + 1] == '\0') {
      if (pcVar22[lVar37 + 3] != '\0') {
        puVar19[lVar37 + 2] = puVar55[lVar37 + 2];
        goto LAB_002f5d6c;
      }
      if (*(char *)(lVar31 + 3 + lVar37) != '\0') {
        cVar10 = pcVar22[lVar37 + 2];
        if (pcVar22[lVar37 + 4] == '\0') goto LAB_002fa24a;
        if (cVar10 == '\0') {
          uVar34 = puVar55[lVar37 + 4];
LAB_002fa4fd:
          puVar19[lVar37 + 2] = uVar34;
        }
        else {
          uVar34 = puVar55[lVar37 + 2];
          if (pcVar22[lVar37 + (3 - lVar16)] == '\0') {
            uVar34 = TTA::Merge(uVar34,puVar55[lVar37 + 4]);
LAB_002fa8c7:
            puVar19[lVar37 + 2] = uVar34;
          }
          else {
LAB_002f9d96:
            puVar19[lVar37 + 2] = uVar34;
          }
        }
        goto LAB_002f94cb;
      }
      if (pcVar22[local_148] != '\0') {
        puVar19[lVar37 + 2] = puVar55[lVar37 + 2];
        goto LAB_002fe276;
      }
      uVar26 = (ulong)TTA::length_;
      TTA::rtable_[uVar26] = TTA::length_;
      TTA::next_[uVar26] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      puVar19[lVar37 + 2] = TTA::length_;
      TTA::length_ = uVar34;
    }
    else {
      if (pcVar22[lVar37 + 3] != '\0') {
        if (pcVar22[lVar37] == '\0') {
          uVar34 = TTA::Merge(puVar55[lVar37 + 2],puVar19[lVar37]);
          puVar19[lVar37 + 2] = uVar34;
          goto LAB_002f5d6c;
        }
        if (pcVar22[lVar37 + (1 - lVar16)] == '\0') {
          uVar34 = TTA::Merge(puVar55[lVar37],puVar55[lVar37 + 2]);
          puVar19[lVar37 + 2] = uVar34;
          goto LAB_002f5d6c;
        }
        if (pcVar22[local_148] != '\0') {
          puVar19[lVar37 + 2] = puVar55[lVar37];
          goto LAB_002f5d6c;
        }
        if (pcVar22[local_148 - lVar16] != '\0') {
          puVar19[lVar37 + 2] = puVar55[lVar37];
          goto LAB_002f5d6c;
        }
        uVar34 = TTA::Merge(puVar55[lVar37],puVar55[lVar37 + 2]);
        puVar19[lVar37 + 2] = uVar34;
        goto LAB_002f5d6c;
      }
      if (*(char *)(lVar31 + 3 + lVar37) != '\0') {
        if (pcVar22[lVar37 + 4] == '\0') {
          if (pcVar22[lVar37 + 2] == '\0') {
LAB_002fa4dd:
            puVar19[lVar37 + 2] = puVar19[lVar37];
            goto LAB_002fa4e6;
          }
          if (pcVar22[lVar37] == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar37 + 2],puVar19[lVar37]);
            puVar19[lVar37 + 2] = uVar34;
          }
          else if (pcVar22[lVar37 + (1 - lVar16)] == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar37],puVar55[lVar37 + 2]);
            puVar19[lVar37 + 2] = uVar34;
          }
          else {
            puVar19[lVar37 + 2] = puVar55[lVar37];
          }
          goto LAB_002fa96c;
        }
LAB_002fa002:
        if (pcVar22[lVar37 + (3 - lVar16)] == '\0') {
          if (pcVar22[local_148] == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar37 + 4],puVar19[lVar37]);
            puVar19[lVar37 + 2] = uVar34;
          }
          else if (pcVar22[lVar37] == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar37 + 2],puVar55[lVar37 + 4]);
            uVar34 = TTA::Merge(uVar34,puVar19[lVar37]);
            puVar19[lVar37 + 2] = uVar34;
          }
          else {
            uVar34 = puVar55[lVar37];
            if (pcVar22[lVar37 + (1 - lVar16)] == '\0') {
              uVar34 = TTA::Merge(uVar34,puVar55[lVar37 + 2]);
              uVar13 = puVar55[lVar37 + 4];
            }
            else {
              uVar13 = puVar55[lVar37 + 4];
            }
            uVar34 = TTA::Merge(uVar34,uVar13);
            puVar19[lVar37 + 2] = uVar34;
          }
          goto LAB_002f94cb;
        }
        if (pcVar22[lVar37] == '\0') {
          uVar34 = puVar55[lVar37 + 2];
          uVar13 = puVar19[lVar37];
        }
        else {
          if (pcVar22[lVar37 + (1 - lVar16)] != '\0') {
            if (pcVar22[local_148] == '\0') {
              if (pcVar22[local_148 - lVar16] == '\0') {
                uVar34 = TTA::Merge(puVar55[lVar37],puVar55[lVar37 + 2]);
                puVar19[lVar37 + 2] = uVar34;
              }
              else {
                puVar19[lVar37 + 2] = puVar55[lVar37];
              }
            }
            else {
              puVar19[lVar37 + 2] = puVar55[lVar37];
            }
            goto LAB_002f94cb;
          }
          uVar34 = puVar55[lVar37];
          uVar13 = puVar55[lVar37 + 2];
        }
        uVar34 = TTA::Merge(uVar34,uVar13);
        puVar19[lVar37 + 2] = uVar34;
        goto LAB_002f94cb;
      }
      if (pcVar22[lVar37 + 2] != '\0') {
        if (pcVar22[lVar37] == '\0') {
          uVar34 = TTA::Merge(puVar55[lVar37 + 2],puVar19[lVar37]);
          puVar19[lVar37 + 2] = uVar34;
          goto LAB_002fe276;
        }
        if (pcVar22[lVar37 + (1 - lVar16)] == '\0') {
          uVar34 = TTA::Merge(puVar55[lVar37],puVar55[lVar37 + 2]);
          puVar19[lVar37 + 2] = uVar34;
          goto LAB_002fe276;
        }
        puVar19[lVar37 + 2] = puVar55[lVar37];
        goto LAB_002fe276;
      }
      puVar19[lVar37 + 2] = puVar19[lVar37];
    }
LAB_002fdb0d:
    puVar8 = TTA::tail_;
    puVar7 = TTA::next_;
    puVar20 = TTA::rtable_;
    iVar39 = (int)local_148;
    uVar34 = iVar39 + 2;
    if (local_168 <= (int)uVar34) {
LAB_002fdcd2:
      local_148 = (ulong)uVar34;
      if (local_168 < (int)uVar34) {
        if (*(char *)(lVar31 + local_148) != '\0') {
          if (pcVar1[(long)iVar39 + 1] == '\0') {
            if (pcVar22[local_148] == '\0') {
LAB_002fec59:
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              puVar19[local_148] = TTA::length_;
              TTA::length_ = uVar34;
              goto LAB_002ff3e2;
            }
            uVar34 = puVar55[local_148];
          }
          else {
            if (pcVar22[local_148] != '\0') {
              uVar34 = puVar55[local_148];
              uVar13 = puVar19[iVar39];
              goto LAB_002fe036;
            }
            uVar34 = puVar19[iVar39];
          }
          puVar19[local_148] = uVar34;
          goto LAB_002ff3e2;
        }
LAB_002fe519:
        if (pcVar1[local_148] == '\0') {
          puVar19[local_148] = 0;
          goto LAB_002ff3e2;
        }
        lVar31 = (long)iVar39;
        if (pcVar1[lVar31 + 1] == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          puVar19[local_148] = TTA::length_;
          TTA::length_ = uVar34;
          goto LAB_002ff3e2;
        }
LAB_002fef74:
        uVar34 = puVar19[lVar31];
      }
      else {
        if (*(char *)(lVar31 + local_148) != '\0') {
          if (pcVar1[(long)iVar39 + 1] == '\0') {
            if (pcVar22[(long)iVar39 + 3] == '\0') {
              cVar10 = pcVar22[local_148];
joined_r0x002fe07c:
              if (cVar10 == '\0') {
                uVar26 = (ulong)TTA::length_;
                TTA::rtable_[uVar26] = TTA::length_;
                TTA::next_[uVar26] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar34 = TTA::length_ + 1;
                puVar19[local_148] = TTA::length_;
                TTA::length_ = uVar34;
              }
              else {
                puVar19[local_148] = puVar55[local_148];
              }
              goto LAB_002ff3e2;
            }
            uVar34 = puVar55[local_148];
          }
          else {
            if (pcVar22[(long)iVar39 + 3] != '\0') {
              uVar34 = puVar55[local_148];
              uVar13 = puVar19[iVar39];
              goto LAB_002fe036;
            }
            if (pcVar22[local_148] != '\0') {
              uVar34 = puVar55[local_148];
              uVar13 = puVar19[iVar39];
              goto LAB_002fe036;
            }
            uVar34 = puVar19[iVar39];
          }
LAB_002fec4a:
          puVar19[local_148] = uVar34;
          goto LAB_002ff3e2;
        }
        uVar26 = (ulong)(iVar39 + 3);
        if (pcVar1[local_148] != '\0') {
          if (*(char *)(lVar31 + uVar26) == '\0') {
            if (pcVar1[(long)iVar39 + 1] == '\0') {
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              puVar19[local_148] = TTA::length_;
              TTA::length_ = uVar34;
            }
            else {
              puVar19[local_148] = puVar19[iVar39];
            }
            goto LAB_002ff3e2;
          }
          if (pcVar1[(long)iVar39 + 1] == '\0') {
            if (pcVar22[uVar26] == '\0') {
              cVar10 = pcVar22[local_148];
              goto joined_r0x002fe07c;
            }
            uVar34 = puVar55[local_148];
          }
          else {
            if (pcVar22[uVar26] != '\0') {
              uVar34 = puVar55[local_148];
              uVar13 = puVar19[iVar39];
              goto LAB_002fefa7;
            }
            if (pcVar22[local_148] != '\0') {
              uVar34 = puVar55[local_148];
              uVar13 = puVar19[iVar39];
              goto LAB_002fefa7;
            }
            uVar34 = puVar19[iVar39];
          }
          puVar19[local_148] = uVar34;
          goto LAB_002ff3e2;
        }
        if (*(char *)(lVar31 + uVar26) == '\0') {
          cVar10 = pcVar1[uVar26];
joined_r0x002fec9f:
          if (cVar10 == '\0') {
            puVar19[local_148] = 0;
          }
          else {
LAB_002feca1:
            uVar26 = (ulong)TTA::length_;
            TTA::rtable_[uVar26] = TTA::length_;
            TTA::next_[uVar26] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            puVar19[local_148] = TTA::length_;
            TTA::length_ = uVar34;
          }
          goto LAB_002ff3e2;
        }
        if (pcVar22[uVar26] == '\0') {
          cVar10 = pcVar22[local_148];
          goto joined_r0x002fe07c;
        }
LAB_002fe6f8:
        uVar34 = puVar55[local_148];
      }
LAB_002fef77:
      puVar19[local_148] = uVar34;
      goto LAB_002ff3e2;
    }
    lVar21 = (long)iVar39;
    lVar37 = lVar21 + 2;
    lVar46 = lVar21 << 0x20;
    lVar23 = lVar36 + lVar21 * 4;
    lVar41 = lVar54 + lVar23;
    lVar28 = lVar41 + 8;
    lVar44 = lVar16 * lVar47 + lVar21;
    lVar43 = lVar40 + lVar38 + lVar21;
    lVar52 = lVar43 + 3;
    lVar17 = lVar16 * lVar50 + lVar21;
    lVar58 = lVar40 + lVar17 + 2;
    lVar25 = 0;
    lVar24 = 0;
    while (*(char *)(lVar43 + 2 + lVar24) != '\0') {
      cVar10 = *(char *)(lVar40 + lVar17 + 3 + lVar24);
      iVar35 = (int)lVar37;
      if (*(char *)(lVar40 + lVar44 + 1 + lVar24) == '\0') {
        if (cVar10 != '\0') {
          *(undefined4 *)(lVar28 + lVar24 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4);
          goto LAB_002fe168;
        }
        if (*(char *)(lVar52 + lVar24) != '\0') {
          lVar41 = lVar46 + 0x400000000 >> 0x20;
          cVar10 = *(char *)(lVar24 + 2 + lVar17 + lVar40);
          if (pcVar22[lVar41] == '\0') goto LAB_002ff4eb;
          if (cVar10 == '\0') goto LAB_002ff25c;
          lVar43 = lVar30 * lVar53 + lVar21 * 4;
          cVar10 = *(char *)(lVar24 + 3 + lVar16 * lVar53 + lVar21 + lVar40);
          goto LAB_002ff23e;
        }
        if (*(char *)(lVar58 + lVar24) != '\0') {
          *(undefined4 *)(lVar28 + lVar24 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4);
          goto LAB_002fe251;
        }
        uVar26 = (ulong)TTA::length_;
        puVar20[uVar26] = TTA::length_;
        puVar7[uVar26] = 0xffffffff;
        puVar8[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_;
        TTA::length_ = TTA::length_ + 1;
      }
      else {
        if (cVar10 != '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                              *(uint *)(lVar41 + lVar24 * 4));
          *(uint *)(lVar28 + lVar24 * 4) = uVar34;
LAB_002fe168:
          local_148 = (ulong)(uint)(iVar35 + (int)lVar24);
          goto LAB_002f5d6c;
        }
        if (*(char *)(lVar52 + lVar24) != '\0') {
          local_148 = lVar37 + lVar24;
          lVar37 = lVar46 + 0x400000000 >> 0x20;
          if (pcVar22[lVar37] == '\0') {
            if (*(char *)(lVar24 + 2 + lVar17 + lVar40) != '\0') {
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                                  *(uint *)(lVar41 + lVar24 * 4));
              *(uint *)(lVar28 + lVar24 * 4) = uVar34;
              goto LAB_002fa96c;
            }
            *(undefined4 *)(lVar23 + lVar54 + 8 + lVar24 * 4) =
                 *(undefined4 *)(lVar23 + lVar54 + lVar24 * 4);
            goto LAB_002f8d2f;
          }
          if (*(char *)(lVar24 + 3 + lVar16 * lVar53 + lVar21 + lVar40) == '\0') {
            if (*(char *)(lVar24 + 2 + lVar17 + lVar40) == '\0') {
              uVar34 = TTA::Merge(puVar55[lVar37],*(uint *)(lVar23 + lVar54 + lVar24 * 4));
              *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = uVar34;
            }
            else {
              uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                                  puVar55[lVar37]);
              uVar34 = TTA::Merge(uVar34,*(uint *)(lVar41 + lVar24 * 4));
              *(uint *)(lVar28 + lVar24 * 4) = uVar34;
            }
          }
          else {
            uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                                *(uint *)(lVar41 + lVar24 * 4));
            *(uint *)(lVar28 + lVar24 * 4) = uVar34;
          }
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f94cb;
        }
        if (*(char *)(lVar58 + lVar24) != '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                              *(uint *)(lVar41 + lVar24 * 4));
          *(uint *)(lVar28 + lVar24 * 4) = uVar34;
LAB_002fe251:
          local_148 = (ulong)(uint)(iVar35 + (int)lVar24);
          goto LAB_002fe276;
        }
        uVar34 = *(uint *)(lVar41 + lVar24 * 4);
      }
      *(uint *)(lVar28 + lVar24 * 4) = uVar34;
      lVar46 = lVar46 + 0x200000000;
      lVar25 = lVar25 + 8;
      lVar48 = lVar37 + lVar24;
      lVar24 = lVar24 + 2;
      if ((long)uVar32 <= lVar48 + 2) {
        iVar39 = iVar39 + (int)lVar24;
        uVar34 = iVar35 + (int)lVar24;
        goto LAB_002fdcd2;
      }
    }
    local_148 = lVar37 + lVar24;
    lVar52 = lVar46 + 0x300000000 >> 0x20;
    if (*(char *)(lVar24 + 2 + lVar44 + lVar40) != '\0') {
      lVar41 = lVar46 >> 0x20;
      if (*(char *)(lVar31 + lVar52) == '\0') {
        if (pcVar1[lVar41 + 1] == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          local_148 = local_148 & 0xffffffff;
        }
        else {
          *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = puVar19[lVar41];
          local_148 = local_148 & 0xffffffff;
        }
        goto LAB_002fb93e;
      }
      if (pcVar1[lVar41 + 1] == '\0') {
        if (pcVar22[lVar52] == '\0') {
          lVar41 = lVar46 + 0x400000000 >> 0x20;
          cVar3 = pcVar22[lVar41];
          cVar10 = *(char *)(lVar24 + 2 + lVar17 + lVar40);
          goto joined_r0x002ff20e;
        }
        *(undefined4 *)(lVar28 + lVar24 * 4) =
             *(undefined4 *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4);
LAB_002fed65:
        local_148 = local_148 & 0xffffffff;
        goto LAB_002faf4f;
      }
      if (pcVar22[lVar52] != '\0') {
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                            puVar19[lVar41]);
        *(uint *)(lVar28 + lVar24 * 4) = uVar34;
LAB_002fe8dd:
        local_148 = local_148 & 0xffffffff;
        goto LAB_002faf4f;
      }
      lVar37 = lVar46 + 0x400000000 >> 0x20;
      if (pcVar22[lVar37] != '\0') {
        if (pcVar22[lVar52 - lVar16] == '\0') {
          if (*(char *)(lVar24 + 2 + lVar17 + lVar40) == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar37],puVar19[lVar41]);
            *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = uVar34;
          }
          else {
            uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                                puVar55[lVar37]);
            uVar34 = TTA::Merge(uVar34,puVar19[lVar41]);
            *(uint *)(lVar28 + lVar24 * 4) = uVar34;
          }
          local_148 = local_148 & 0xffffffff;
        }
        else {
          uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                              puVar19[lVar41]);
          *(uint *)(lVar28 + lVar24 * 4) = uVar34;
          local_148 = local_148 & 0xffffffff;
        }
        goto LAB_002f94cb;
      }
      if (*(char *)(lVar24 + 2 + lVar17 + lVar40) != '\0') {
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4),
                            puVar19[lVar41]);
        *(uint *)(lVar28 + lVar24 * 4) = uVar34;
        goto LAB_002fa96c;
      }
      *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = puVar19[lVar41];
      goto LAB_002f8d2f;
    }
    if (*(char *)(lVar31 + lVar52) != '\0') {
      if (pcVar22[lVar52] != '\0') {
        *(undefined4 *)(lVar28 + lVar24 * 4) =
             *(undefined4 *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4);
        goto LAB_002fed65;
      }
      lVar41 = lVar46 + 0x400000000 >> 0x20;
      cVar3 = pcVar22[lVar41];
      cVar10 = *(char *)(lVar24 + 2 + lVar17 + lVar40);
joined_r0x002ff20e:
      if (cVar3 == '\0') {
LAB_002ff4eb:
        local_148 = lVar37 + lVar24;
        if (cVar10 == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          goto LAB_002f8d2f;
        }
        *(undefined4 *)(lVar28 + lVar24 * 4) =
             *(undefined4 *)(lVar30 * lVar53 + lVar21 * 4 + lVar54 + 8 + lVar24 * 4);
        goto LAB_002fa96c;
      }
      if (cVar10 == '\0') {
LAB_002ff25c:
        uVar34 = puVar55[lVar41];
LAB_002ff39e:
        *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = uVar34;
      }
      else {
        lVar43 = lVar30 * lVar53 + lVar21 * 4;
        cVar10 = pcVar22[lVar52 - lVar16];
LAB_002ff23e:
        uVar34 = *(uint *)(lVar43 + lVar54 + 8 + lVar24 * 4);
        if (cVar10 == '\0') {
          uVar34 = TTA::Merge(uVar34,puVar55[lVar41]);
          goto LAB_002ff39e;
        }
        *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = uVar34;
      }
      local_148 = lVar37 + lVar24;
      local_148 = local_148 & 0xffffffff;
      goto LAB_002f94cb;
    }
    if (pcVar1[lVar52] != '\0') {
      uVar26 = (ulong)TTA::length_;
      TTA::rtable_[uVar26] = TTA::length_;
      TTA::next_[uVar26] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      *(uint *)(lVar23 + lVar54 + 8 + lVar24 * 4) = TTA::length_;
      TTA::length_ = uVar34;
      goto LAB_002f76f0;
    }
    puVar20 = (uint *)(lVar25 + lVar23 + lVar54 + 8);
    local_148 = local_148 & 0xffffffff;
LAB_002fb63f:
    iVar39 = (int)local_148;
LAB_002f738e:
    *puVar20 = 0;
    uVar34 = iVar39 + 2;
    if (local_168 <= (int)uVar34) {
LAB_002f746d:
      local_148 = (ulong)uVar34;
      if (local_168 < (int)uVar34) {
        if (*(char *)(lVar31 + local_148) == '\0') {
          cVar10 = pcVar1[local_148];
joined_r0x002f80f3:
          if (cVar10 != '\0') goto LAB_002fbd43;
          goto LAB_002fbd85;
        }
        if (pcVar22[local_148] == '\0') {
          if (pcVar22[(long)iVar39 + 1] == '\0') goto LAB_002fcec3;
          uVar34 = puVar55[iVar39];
          goto LAB_002ff3db;
        }
      }
      else {
        if (*(char *)(lVar31 + local_148) != '\0') {
          if (pcVar22[(long)iVar39 + 3] == '\0') {
            if (pcVar22[local_148] == '\0') {
              if (pcVar22[(long)iVar39 + 1] != '\0') {
                uVar34 = puVar55[iVar39];
                goto LAB_002fe04c;
              }
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              puVar19[local_148] = TTA::length_;
              TTA::length_ = uVar34;
              goto LAB_002ff3e2;
            }
          }
          else if ((pcVar22[local_148] == '\0') && (pcVar22[(long)iVar39 + 1] != '\0')) {
            uVar34 = puVar55[iVar39];
            if (pcVar22[local_148 - lVar16] != '\0') {
              puVar19[local_148] = uVar34;
              goto LAB_002ff3e2;
            }
            uVar13 = puVar55[local_148];
            goto LAB_002fe036;
          }
          uVar34 = puVar55[local_148];
          goto LAB_002fe04c;
        }
        uVar26 = (ulong)(iVar39 + 3);
        if (pcVar1[local_148] == '\0') {
          if (*(char *)(lVar31 + uVar26) == '\0') {
            cVar10 = pcVar1[uVar26];
            goto joined_r0x002f80f3;
          }
          if (pcVar22[uVar26] != '\0') {
            uVar34 = puVar55[local_148];
            goto LAB_002fbd3b;
          }
          cVar10 = pcVar22[local_148];
        }
        else {
          if (*(char *)(lVar31 + uVar26) == '\0') goto LAB_002fbd43;
          if (pcVar22[uVar26] != '\0') goto LAB_002f74a5;
          cVar10 = pcVar22[local_148];
        }
        if (cVar10 == '\0') goto LAB_002fcec3;
      }
LAB_002f74a5:
      uVar34 = puVar55[local_148];
      goto LAB_002ff3db;
    }
    lVar41 = (long)iVar39;
    lVar37 = lVar41 + 2;
    lVar43 = lVar41 << 0x20;
    lVar46 = lVar38 + lVar41 + lVar40;
    lVar21 = lVar16 * lVar47 + lVar41 + lVar40;
    lVar23 = lVar36 + lVar41 * 4;
    lVar24 = lVar54 + lVar23 + 8;
    lVar17 = 0;
    while (*(char *)(lVar46 + 2 + lVar17) == '\0') {
      if (*(char *)(lVar21 + 2 + lVar17) != '\0') {
        local_148 = lVar37 + lVar17;
        lVar46 = lVar43 + 0x300000000 >> 0x20;
        if (*(char *)(lVar31 + lVar46) == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002fb93e;
        }
        if (pcVar22[lVar46] != '\0') {
          *(undefined4 *)(lVar24 + lVar17 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4);
          local_148 = local_148 & 0xffffffff;
          goto LAB_002faf4f;
        }
        lVar43 = lVar43 + 0x400000000 >> 0x20;
        cVar10 = *(char *)(lVar17 + 2 + lVar16 * lVar50 + lVar41 + lVar40);
        if (pcVar22[lVar43] == '\0') {
          if (cVar10 != '\0') goto LAB_002f83e3;
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          goto LAB_002f8d2f;
        }
        if (cVar10 == '\0') goto LAB_002f81c2;
        lVar21 = lVar30 * lVar53 + lVar41 * 4;
        cVar10 = pcVar22[lVar46 - lVar16];
LAB_002f8032:
        local_148 = lVar37 + lVar17;
        uVar34 = *(uint *)(lVar21 + lVar54 + 8 + lVar17 * 4);
        if (cVar10 != '\0') {
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
          goto LAB_002fc5a4;
        }
        uVar34 = TTA::Merge(uVar34,puVar55[lVar43]);
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
        goto LAB_002fc140;
      }
      if (*(char *)(lVar46 + 3 + lVar17) != '\0') {
        local_148 = lVar37 + lVar17;
        lVar46 = lVar16 * lVar50 + lVar41 + lVar40;
        if (*(char *)(lVar17 + 3 + lVar46) != '\0') {
          *(undefined4 *)(lVar24 + lVar17 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4);
          local_148 = local_148 & 0xffffffff;
          goto LAB_002faf4f;
        }
        lVar43 = lVar43 + 0x400000000 >> 0x20;
        cVar10 = *(char *)(lVar17 + 2 + lVar46);
        if (pcVar22[lVar43] == '\0') {
          if (cVar10 == '\0') {
            uVar26 = (ulong)TTA::length_;
            TTA::rtable_[uVar26] = TTA::length_;
            TTA::next_[uVar26] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
            TTA::length_ = uVar34;
            goto LAB_002f8d2f;
          }
LAB_002f83e3:
          local_148 = lVar37 + lVar17;
          *(undefined4 *)(lVar24 + lVar17 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4);
          goto LAB_002fa96c;
        }
        if (cVar10 != '\0') {
          lVar21 = lVar30 * lVar53 + lVar41 * 4;
          cVar10 = *(char *)(lVar17 + 3 + lVar16 * lVar53 + lVar41 + lVar40);
          goto LAB_002f8032;
        }
LAB_002f81c2:
        local_148 = lVar37 + lVar17;
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = puVar55[lVar43];
        goto LAB_002fc5a4;
      }
      if (*(char *)(lVar21 + 3 + lVar17) != '\0') {
        local_148 = (ulong)(uint)((int)lVar37 + (int)lVar17);
        uVar26 = (ulong)TTA::length_;
        TTA::rtable_[uVar26] = TTA::length_;
        TTA::next_[uVar26] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
        TTA::length_ = uVar34;
        goto LAB_002f76f0;
      }
      *(undefined4 *)(lVar24 + lVar17 * 4) = 0;
      lVar43 = lVar43 + 0x200000000;
      lVar28 = lVar37 + lVar17;
      lVar17 = lVar17 + 2;
      if ((long)uVar32 <= lVar28 + 2) {
        iVar39 = iVar39 + (int)lVar17;
        uVar34 = (int)lVar37 + (int)lVar17;
        goto LAB_002f746d;
      }
    }
    local_148 = lVar37 + lVar17;
    lVar46 = lVar43 + 0x300000000 >> 0x20;
    lVar37 = lVar43 >> 0x20;
    if (pcVar22[lVar46] != '\0') {
      if ((*(char *)(lVar17 + 2 + lVar16 * lVar50 + lVar41 + lVar40) == '\0') &&
         (pcVar22[lVar37 + 1] != '\0')) {
        if (*(char *)(lVar17 + 2 + lVar16 * lVar53 + lVar41 + lVar40) == '\0') {
          uVar34 = TTA::Merge(puVar55[lVar37],
                              *(uint *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4));
          *(uint *)(lVar24 + lVar17 * 4) = uVar34;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f5d6c;
        }
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = puVar55[lVar37];
      }
      else {
        *(undefined4 *)(lVar24 + lVar17 * 4) =
             *(undefined4 *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4);
      }
      local_148 = local_148 & 0xffffffff;
      goto LAB_002f5d6c;
    }
    if (*(char *)(lVar31 + lVar46) != '\0') {
      lVar43 = lVar43 + 0x400000000 >> 0x20;
      cVar10 = *(char *)(lVar17 + 2 + lVar16 * lVar50 + lVar41 + lVar40);
      if (pcVar22[lVar43] == '\0') {
        if (cVar10 != '\0') {
          *(undefined4 *)(lVar24 + lVar17 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4);
          goto LAB_002fa96c;
        }
        if (pcVar22[lVar37 + 1] == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
          TTA::length_ = uVar34;
        }
        else {
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = puVar55[lVar37];
        }
        goto LAB_002f8d2f;
      }
      if (cVar10 == '\0') {
        if (pcVar22[lVar37 + 1] != '\0') {
          if (pcVar22[lVar46 - lVar16] == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar37],puVar55[lVar43]);
            *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
            goto LAB_002fdafe;
          }
          if (*(char *)(lVar17 + 2 + lVar16 * lVar53 + lVar41 + lVar40) == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar37],
                                *(uint *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4));
            *(uint *)(lVar24 + lVar17 * 4) = uVar34;
          }
          else {
            *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = puVar55[lVar37];
          }
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f94cb;
        }
        uVar34 = puVar55[lVar43];
      }
      else {
        uVar34 = *(uint *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4);
        if (pcVar22[lVar46 - lVar16] != '\0') {
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
          goto LAB_002fb3d4;
        }
        uVar34 = TTA::Merge(uVar34,puVar55[lVar43]);
      }
      *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
      goto LAB_002f8a8b;
    }
    if (*(char *)(lVar17 + 2 + lVar16 * lVar50 + lVar41 + lVar40) == '\0') {
      if (pcVar22[lVar37 + 1] == '\0') {
        uVar26 = (ulong)TTA::length_;
        TTA::rtable_[uVar26] = TTA::length_;
        TTA::next_[uVar26] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
        TTA::length_ = uVar34;
        local_148 = local_148 & 0xffffffff;
      }
      else {
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = puVar55[lVar37];
LAB_002fd9e8:
        local_148 = local_148 & 0xffffffff;
      }
      goto LAB_002fdb0d;
    }
    *(undefined4 *)(lVar24 + lVar17 * 4) =
         *(undefined4 *)(lVar30 * lVar53 + lVar41 * 4 + lVar54 + 8 + lVar17 * 4);
LAB_002fcdb4:
    local_148 = local_148 & 0xffffffff;
LAB_002fe276:
    iVar39 = (int)local_148;
    uVar34 = iVar39 + 2;
    if (local_168 <= (int)uVar34) {
LAB_002fe476:
      local_148 = (ulong)uVar34;
      if (local_168 < (int)uVar34) {
        if (*(char *)(lVar31 + local_148) == '\0') goto LAB_002fe519;
        if (pcVar1[iVar39 + 1] == '\0') {
          if (pcVar22[local_148] == '\0') goto LAB_002feca1;
          goto LAB_002fe6f8;
        }
        if (pcVar22[local_148] != '\0') {
          bVar59 = pcVar22[(ulong)(iVar39 + 1) - lVar16] == '\0';
          goto LAB_002fec0c;
        }
LAB_002fef6f:
        lVar31 = (long)iVar39;
        goto LAB_002fef74;
      }
      if (*(char *)(lVar31 + local_148) == '\0') {
        uVar26 = (ulong)(iVar39 + 3);
        if (pcVar1[local_148] == '\0') {
          if (*(char *)(lVar31 + uVar26) == '\0') {
            cVar10 = pcVar1[uVar26];
            goto joined_r0x002fec9f;
          }
          cVar10 = pcVar22[uVar26];
        }
        else {
          if (*(char *)(lVar31 + uVar26) == '\0') {
            if (pcVar1[(long)iVar39 + 1] != '\0') goto LAB_002fef6f;
            goto LAB_002feca1;
          }
          uVar27 = (ulong)(iVar39 + 1);
          cVar10 = pcVar22[uVar26];
          if (pcVar1[uVar27] != '\0') {
            if (cVar10 == '\0') {
              if (pcVar22[local_148] == '\0') goto LAB_002fef6f;
              bVar59 = pcVar22[uVar27 - lVar16] == '\0';
            }
            else {
              if (pcVar22[uVar27 - lVar16] == '\0') goto LAB_002ff3b5;
              if (pcVar22[local_148] != '\0') goto LAB_002fe510;
              bVar59 = pcVar22[local_148 - lVar16] == '\0';
            }
            goto LAB_002fec0c;
          }
        }
      }
      else {
        uVar26 = (ulong)(iVar39 + 1);
        cVar10 = pcVar22[(long)iVar39 + 3];
        if (pcVar1[uVar26] != '\0') {
          if (cVar10 == '\0') {
            if (pcVar22[local_148] == '\0') goto LAB_002fef6f;
            bVar59 = pcVar22[uVar26 - lVar16] == '\0';
LAB_002fec0c:
            uVar34 = puVar55[iVar39];
            if (!bVar59) {
              puVar19[local_148] = uVar34;
              goto LAB_002ff3e2;
            }
          }
          else {
            if (pcVar22[uVar26 - lVar16] != '\0') {
              if (pcVar22[local_148] == '\0') {
                bVar59 = pcVar22[local_148 - lVar16] == '\0';
                goto LAB_002fec0c;
              }
LAB_002fe510:
              uVar34 = puVar55[iVar39];
              goto LAB_002fef77;
            }
LAB_002ff3b5:
            uVar34 = puVar55[iVar39];
          }
          uVar13 = puVar55[local_148];
LAB_002ff3c0:
          uVar34 = TTA::Merge(uVar34,uVar13);
          goto LAB_002ff3db;
        }
      }
      if (cVar10 != '\0') goto LAB_002fe6f8;
      if (pcVar22[local_148] == '\0') goto LAB_002fec59;
      uVar34 = puVar55[local_148];
      goto LAB_002fec4a;
    }
    lVar43 = (long)iVar39;
    lVar41 = lVar43 + 2;
    lVar37 = lVar30 * lVar53 + lVar43 * 4;
    lVar28 = lVar16 * lVar53 + lVar43;
    lVar44 = lVar16 * lVar47 + lVar43;
    lVar21 = lVar16 * lVar50 + lVar43;
    lVar23 = lVar36 + lVar43 * 4;
    lVar58 = lVar43 << 0x20;
    lVar52 = lVar54 + lVar37 + 8;
    lVar43 = lVar40 + 3 + lVar38 + lVar43;
    lVar46 = lVar40 + 2 + lVar21;
    lVar25 = lVar23 + lVar54 + 8;
    lVar24 = 0;
    lVar17 = 0;
    while (lVar48 = lVar58 >> 0x1e, *(char *)(lVar43 + -1 + lVar17) != '\0') {
      cVar10 = *(char *)(lVar46 + 1 + lVar17);
      iVar35 = (int)lVar17;
      iVar14 = (int)lVar41;
      if (*(char *)(lVar40 + lVar44 + 1 + lVar17) == '\0') {
        if (cVar10 != '\0') {
          uVar34 = iVar14 + iVar35;
          *(undefined4 *)(lVar25 + lVar17 * 4) = *(undefined4 *)(lVar52 + lVar17 * 4);
          goto LAB_002fe8f5;
        }
        if (*(char *)(lVar43 + lVar17) != '\0') {
          local_148 = lVar41 + lVar17;
          lVar43 = lVar58 + 0x400000000 >> 0x20;
          cVar10 = *(char *)(lVar17 + 2 + lVar21 + lVar40);
          if (pcVar22[lVar43] == '\0') {
            if (cVar10 == '\0') {
              uVar26 = (ulong)TTA::length_;
              TTA::rtable_[uVar26] = TTA::length_;
              TTA::next_[uVar26] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
              TTA::length_ = uVar34;
              goto LAB_002ff785;
            }
            *(undefined4 *)(lVar25 + lVar17 * 4) = *(undefined4 *)(lVar52 + lVar17 * 4);
            goto LAB_002ff6a8;
          }
          if (cVar10 == '\0') {
            *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = puVar55[lVar43];
          }
          else {
            uVar34 = *(uint *)(lVar37 + lVar54 + 8 + lVar17 * 4);
            if (*(char *)(lVar17 + 3 + lVar28 + lVar40) == '\0') {
              uVar34 = TTA::Merge(uVar34,puVar55[lVar43]);
              *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
            }
            else {
              *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
            }
          }
          goto LAB_002f94cb;
        }
        if (*(char *)(lVar46 + lVar17) == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          local_148 = (ulong)(uint)(iVar14 + iVar35);
          goto LAB_002fdb0d;
        }
        uVar34 = *(uint *)(lVar52 + lVar17 * 4);
      }
      else {
        if (cVar10 != '\0') {
          if (*(char *)(lVar17 + 1 + lVar28 + lVar40) == '\0') {
            uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar48),*(uint *)(lVar52 + lVar17 * 4));
            *(uint *)(lVar25 + lVar17 * 4) = uVar34;
            local_148 = lVar41 + lVar17 & 0xffffffff;
            goto LAB_002f5d6c;
          }
          if (*(char *)(lVar17 + 2 + lVar21 + lVar40) == '\0') {
            if (*(char *)(lVar17 + 2 + lVar28 + lVar40) == '\0') {
              uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar48),*(uint *)(lVar52 + lVar17 * 4));
              *(uint *)(lVar25 + lVar17 * 4) = uVar34;
            }
            else {
              *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = *(uint *)((long)puVar55 + lVar48);
            }
          }
          else {
            *(undefined4 *)(lVar23 + lVar54 + 8 + lVar17 * 4) =
                 *(undefined4 *)((long)puVar55 + lVar48);
          }
          local_148 = lVar41 + lVar17 & 0xffffffff;
          goto LAB_002f5d6c;
        }
        if (*(char *)(lVar43 + lVar17) != '\0') {
          lVar37 = lVar58 + 0x400000000 >> 0x20;
          if (pcVar22[lVar37] != '\0') {
            lVar28 = lVar28 + lVar40;
            if (*(char *)(lVar17 + 3 + lVar28) == '\0') {
              if (*(char *)(lVar17 + 2 + lVar21 + lVar40) != '\0') {
                cVar10 = *(char *)(lVar17 + 1 + lVar28);
                uVar34 = *(uint *)((long)puVar55 + lVar48);
                goto joined_r0x002fee9b;
              }
              uVar34 = TTA::Merge(puVar55[lVar37],*(uint *)((long)puVar19 + lVar48));
              *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
              goto LAB_002ffa27;
            }
            if (*(char *)(lVar17 + 1 + lVar28) == '\0') {
              uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar48),*(uint *)(lVar52 + lVar17 * 4));
              *(uint *)(lVar25 + lVar17 * 4) = uVar34;
              goto LAB_002ffa27;
            }
            if (*(char *)(lVar17 + 2 + lVar21 + lVar40) == '\0') {
              uVar34 = *(uint *)((long)puVar55 + lVar48);
              if (*(char *)(lVar17 + 2 + lVar28) != '\0') goto LAB_002ff58e;
              uVar34 = TTA::Merge(uVar34,*(uint *)(lVar52 + lVar17 * 4));
              *(uint *)(lVar25 + lVar17 * 4) = uVar34;
            }
            else {
              *(undefined4 *)(lVar23 + lVar54 + 8 + lVar17 * 4) =
                   *(undefined4 *)((long)puVar55 + lVar48);
            }
            goto LAB_002ffa27;
          }
          if (*(char *)(lVar17 + 2 + lVar21 + lVar40) == '\0') {
            *(undefined4 *)(lVar23 + lVar54 + 8 + lVar17 * 4) =
                 *(undefined4 *)((long)puVar19 + lVar48);
LAB_002ff785:
            local_148 = lVar41 + lVar17;
            goto LAB_002f8d2f;
          }
          if (*(char *)(lVar17 + 1 + lVar28 + lVar40) == '\0') {
            uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar48),*(uint *)(lVar52 + lVar17 * 4));
            *(uint *)(lVar25 + lVar17 * 4) = uVar34;
          }
          else {
            *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = *(uint *)((long)puVar55 + lVar48);
          }
LAB_002ff6a8:
          local_148 = lVar41 + lVar17;
          goto LAB_002fa96c;
        }
        if (*(char *)(lVar46 + lVar17) == '\0') {
          *(undefined4 *)(lVar23 + lVar54 + 8 + lVar17 * 4) =
               *(undefined4 *)((long)puVar19 + lVar48);
          local_148 = (ulong)(uint)(iVar14 + iVar35);
          goto LAB_002fdb0d;
        }
        uVar34 = *(uint *)(lVar54 + lVar37 + lVar17 * 4);
        if (*(char *)(lVar40 + lVar28 + 1 + lVar17) == '\0') {
          uVar34 = TTA::Merge(uVar34,*(uint *)(lVar52 + lVar17 * 4));
        }
      }
      *(uint *)(lVar25 + lVar17 * 4) = uVar34;
      lVar58 = lVar58 + 0x200000000;
      lVar24 = lVar24 + 8;
      lVar48 = lVar41 + lVar17;
      lVar17 = lVar17 + 2;
      if ((long)uVar32 <= lVar48 + 2) {
        iVar39 = iVar39 + (int)lVar17;
        uVar34 = iVar14 + (int)lVar17;
        goto LAB_002fe476;
      }
    }
    local_148 = lVar41 + lVar17;
    lVar43 = lVar58 + 0x300000000 >> 0x20;
    if (*(char *)(lVar17 + 2 + lVar44 + lVar40) != '\0') {
      if (*(char *)(lVar31 + lVar43) == '\0') {
        if (pcVar1[(lVar58 >> 0x20) + 1] == '\0') {
          uVar26 = (ulong)TTA::length_;
          TTA::rtable_[uVar26] = TTA::length_;
          TTA::next_[uVar26] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
          TTA::length_ = uVar34;
        }
        else {
          *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = puVar19[lVar58 >> 0x20];
        }
        local_148 = local_148 & 0xffffffff;
        goto LAB_002fb93e;
      }
      lVar46 = lVar58 + 0x100000000 >> 0x20;
      if (pcVar1[lVar46] == '\0') {
        if (pcVar22[lVar43] == '\0') {
          lVar41 = lVar58 + 0x400000000 >> 0x20;
          cVar3 = pcVar22[lVar41];
          cVar10 = *(char *)(lVar17 + 2 + lVar21 + lVar40);
          goto joined_r0x002ff13f;
        }
        *(undefined4 *)(lVar25 + lVar17 * 4) = *(undefined4 *)(lVar52 + lVar17 * 4);
      }
      else {
        if (pcVar22[lVar43] == '\0') {
          lVar37 = lVar58 + 0x400000000 >> 0x20;
          if (pcVar22[lVar37] == '\0') {
            if (*(char *)(lVar17 + 2 + lVar21 + lVar40) == '\0') {
              *(undefined4 *)(lVar23 + lVar54 + 8 + lVar17 * 4) =
                   *(undefined4 *)((long)puVar19 + lVar48);
              goto LAB_002f8d2f;
            }
            if (pcVar22[lVar46 - lVar16] == '\0') {
              uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar48),*(uint *)(lVar52 + lVar17 * 4));
              *(uint *)(lVar25 + lVar17 * 4) = uVar34;
            }
            else {
              *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = *(uint *)((long)puVar55 + lVar48);
            }
            goto LAB_002fa96c;
          }
          if (pcVar22[lVar43 - lVar16] == '\0') {
            if (*(char *)(lVar17 + 2 + lVar21 + lVar40) != '\0') {
              cVar10 = pcVar22[lVar46 - lVar16];
              uVar34 = *(uint *)((long)puVar55 + lVar48);
joined_r0x002fee9b:
              if (cVar10 == '\0') {
                uVar34 = TTA::Merge(uVar34,*(uint *)(lVar52 + lVar17 * 4));
                uVar34 = TTA::Merge(uVar34,puVar55[lVar37]);
                *(uint *)(lVar25 + lVar17 * 4) = uVar34;
              }
              else {
                uVar34 = TTA::Merge(uVar34,puVar55[lVar37]);
                *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
              }
              local_148 = lVar41 + lVar17;
              local_148 = local_148 & 0xffffffff;
              goto LAB_002f94cb;
            }
            uVar34 = TTA::Merge(puVar55[lVar37],*(uint *)((long)puVar19 + lVar48));
            *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
          }
          else {
            if (pcVar22[lVar46 - lVar16] == '\0') {
              uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar48),*(uint *)(lVar52 + lVar17 * 4));
              *(uint *)(lVar25 + lVar17 * 4) = uVar34;
              goto LAB_002ff9eb;
            }
            if (*(char *)(lVar17 + 2 + lVar21 + lVar40) != '\0') {
              uVar34 = *(uint *)((long)puVar55 + lVar48);
              goto LAB_002ff9e0;
            }
            uVar34 = *(uint *)((long)puVar55 + lVar48);
            if (*(char *)(lVar17 + 2 + lVar28 + lVar40) == '\0') {
              uVar34 = TTA::Merge(uVar34,*(uint *)(lVar52 + lVar17 * 4));
              *(uint *)(lVar25 + lVar17 * 4) = uVar34;
            }
            else {
LAB_002ff58e:
              *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
            }
          }
LAB_002ffa27:
          local_148 = lVar41 + lVar17;
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f94cb;
        }
        if (pcVar22[lVar46 - lVar16] == '\0') {
          uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar48),*(uint *)(lVar52 + lVar17 * 4));
          *(uint *)(lVar25 + lVar17 * 4) = uVar34;
        }
        else {
          if (*(char *)(lVar17 + 2 + lVar21 + lVar40) == '\0') {
            if (*(char *)(lVar17 + 2 + lVar28 + lVar40) == '\0') {
              uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar48),*(uint *)(lVar52 + lVar17 * 4));
              *(uint *)(lVar25 + lVar17 * 4) = uVar34;
            }
            else {
              *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = *(uint *)((long)puVar55 + lVar48);
            }
            local_148 = local_148 & 0xffffffff;
            goto LAB_002faf4f;
          }
          *(undefined4 *)(lVar23 + lVar54 + 8 + lVar17 * 4) =
               *(undefined4 *)((long)puVar55 + lVar48);
        }
      }
      local_148 = local_148 & 0xffffffff;
      goto LAB_002faf4f;
    }
    if (*(char *)(lVar31 + lVar43) != '\0') {
      if (pcVar22[lVar43] != '\0') {
        *(undefined4 *)(lVar25 + lVar17 * 4) = *(undefined4 *)(lVar52 + lVar17 * 4);
        goto LAB_002fe8dd;
      }
      lVar41 = lVar58 + 0x400000000 >> 0x20;
      cVar3 = pcVar22[lVar41];
      cVar10 = *(char *)(lVar17 + 2 + lVar21 + lVar40);
joined_r0x002ff13f:
      if (cVar3 == '\0') {
        if (cVar10 != '\0') {
          *(undefined4 *)(lVar25 + lVar17 * 4) = *(undefined4 *)(lVar52 + lVar17 * 4);
          goto LAB_002fa96c;
        }
        uVar26 = (ulong)TTA::length_;
        TTA::rtable_[uVar26] = TTA::length_;
        TTA::next_[uVar26] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
        TTA::length_ = uVar34;
        goto LAB_002f8d2f;
      }
      if (cVar10 == '\0') {
        uVar34 = puVar55[lVar41];
LAB_002ff9e0:
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
      }
      else {
        uVar34 = *(uint *)(lVar37 + lVar54 + 8 + lVar17 * 4);
        if (pcVar22[lVar43 - lVar16] == '\0') {
          uVar34 = TTA::Merge(uVar34,puVar55[lVar41]);
          goto LAB_002ff9e0;
        }
        *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = uVar34;
      }
LAB_002ff9eb:
      local_148 = local_148 & 0xffffffff;
      goto LAB_002f94cb;
    }
    if (pcVar1[lVar43] == '\0') {
      puVar20 = (uint *)(lVar23 + lVar54 + lVar24 + 8);
      local_148 = local_148 & 0xffffffff;
      goto LAB_002fb63f;
    }
    uVar26 = (ulong)TTA::length_;
    TTA::rtable_[uVar26] = TTA::length_;
    TTA::next_[uVar26] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar34 = TTA::length_ + 1;
    *(uint *)(lVar23 + lVar54 + 8 + lVar17 * 4) = TTA::length_;
    TTA::length_ = uVar34;
LAB_002f76f0:
    puVar9 = TTA::tail_;
    puVar8 = TTA::next_;
    puVar7 = TTA::rtable_;
    iVar39 = (int)local_148;
    uVar34 = iVar39 + 2;
    if (local_168 <= (int)uVar34) {
LAB_002f783a:
      local_148 = (ulong)uVar34;
      if ((int)uVar34 <= local_168) {
        if (*(char *)(lVar31 + local_148) != '\0') {
          lVar31 = (long)iVar39;
          if (pcVar22[lVar31 + 3] == '\0') {
            if (pcVar22[lVar31 + 1] != '\0') {
              uVar34 = puVar55[lVar31];
              goto LAB_002fbfcf;
            }
            if (pcVar22[local_148] == '\0') {
              puVar19[local_148] = puVar19[lVar31];
              goto LAB_002ff3e2;
            }
          }
          else if ((pcVar22[local_148] == '\0') && (pcVar22[lVar31 + 1] != '\0')) {
            if (pcVar22[local_148 - lVar16] == '\0') {
              uVar34 = TTA::Merge(puVar55[lVar31],puVar55[local_148]);
              uVar34 = TTA::Merge(uVar34,puVar19[lVar31]);
              puVar19[local_148] = uVar34;
            }
            else {
              uVar34 = TTA::Merge(puVar55[lVar31],puVar19[lVar31]);
              puVar19[local_148] = uVar34;
            }
            goto LAB_002ff3e2;
          }
          uVar34 = puVar55[local_148];
          goto LAB_002fbfcf;
        }
        uVar26 = (ulong)(iVar39 + 3);
        if (pcVar1[local_148] != '\0') {
          if (*(char *)(lVar31 + uVar26) == '\0') {
            lVar31 = (long)iVar39;
            goto LAB_002fb597;
          }
          if ((pcVar22[uVar26] != '\0') || (pcVar22[local_148] != '\0')) {
            uVar34 = puVar55[local_148];
            goto LAB_002f7900;
          }
          lVar31 = (long)iVar39;
          goto LAB_002fb680;
        }
        if (*(char *)(lVar31 + uVar26) == '\0') {
          cVar10 = pcVar1[uVar26];
          uVar34 = TTA::length_;
          goto joined_r0x002fb692;
        }
        if ((pcVar22[uVar26] == '\0') && (pcVar22[local_148] == '\0')) goto LAB_002fb782;
        uVar34 = puVar55[local_148];
        goto LAB_002fb779;
      }
      if (*(char *)(lVar31 + local_148) == '\0') {
        if (pcVar1[local_148] == '\0') goto LAB_002fbd85;
        lVar40 = (long)iVar39;
        goto LAB_002fbd38;
      }
      lVar40 = (long)iVar39;
      if (pcVar22[lVar40 + 1] == '\0') {
        if (pcVar22[local_148] == '\0') goto LAB_002fbd38;
        uVar34 = puVar55[local_148];
      }
      else {
        uVar34 = puVar55[lVar40];
      }
LAB_002f7b67:
      uVar13 = puVar19[lVar40];
      goto LAB_002fe036;
    }
    lVar43 = (long)iVar39;
    lVar37 = lVar43 + 2;
    lVar21 = lVar43 << 0x20;
    lVar23 = lVar40 + lVar38 + lVar43;
    lVar17 = lVar40 + lVar16 * lVar47 + lVar43;
    lVar41 = lVar43 * 4;
    puVar42 = (uint *)(lVar54 + lVar36 + lVar43 * 4 + 8);
    lVar46 = 0;
    puVar20 = puVar42;
    while (lVar24 = lVar21 >> 0x1e, *(char *)(lVar23 + 2 + lVar46) == '\0') {
      if (*(char *)(lVar17 + 2 + lVar46) != '\0') {
        local_148 = lVar37 + lVar46;
        lVar23 = lVar21 + 0x300000000 >> 0x20;
        if (*(char *)(lVar31 + lVar23) == '\0') {
          *(undefined4 *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) =
               *(undefined4 *)((long)puVar19 + lVar24);
          goto LAB_002fb93e;
        }
        if (pcVar22[lVar23] != '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4),
                              *(uint *)((long)puVar19 + lVar24));
          *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
          goto LAB_002faf4f;
        }
        lVar17 = lVar21 + 0x400000000 >> 0x20;
        if (pcVar22[lVar17] == '\0') {
          if (*(char *)(lVar46 + 2 + lVar16 * lVar50 + lVar43 + lVar40) != '\0') {
            uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4),
                                *(uint *)((long)puVar19 + lVar24));
            *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
            goto LAB_002f89dd;
          }
          *(undefined4 *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) =
               *(undefined4 *)((long)puVar19 + lVar24);
          local_148 = local_148 & 0xffffffff;
          goto LAB_002f8d2f;
        }
        if (pcVar22[lVar23 - lVar16] == '\0') {
          if (*(char *)(lVar46 + 2 + lVar16 * lVar50 + lVar43 + lVar40) == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar17],*(uint *)((long)puVar19 + lVar24));
            *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
          }
          else {
            uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4),
                                puVar55[lVar17]);
            uVar34 = TTA::Merge(uVar34,*(uint *)((long)puVar19 + lVar24));
            *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
          }
        }
        else {
          uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4),
                              *(uint *)((long)puVar19 + lVar24));
          *(uint *)(lVar54 + lVar41 + lVar36 + 8 + lVar46 * 4) = uVar34;
        }
        goto LAB_002f94cb;
      }
      if (*(char *)(lVar23 + 3 + lVar46) != '\0') {
        local_148 = lVar37 + lVar46;
        lVar37 = lVar16 * lVar50 + lVar43 + lVar40;
        if (*(char *)(lVar46 + 3 + lVar37) != '\0') {
          *(undefined4 *)(lVar54 + lVar41 + lVar36 + 8 + lVar46 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar43 * 4 + lVar54 + 8 + lVar46 * 4);
          goto LAB_002faf4f;
        }
        lVar23 = lVar21 + 0x400000000 >> 0x20;
        cVar10 = *(char *)(lVar46 + 2 + lVar37);
        if (pcVar22[lVar23] == '\0') {
          if (cVar10 == '\0') {
            uVar26 = (ulong)TTA::length_;
            TTA::rtable_[uVar26] = TTA::length_;
            TTA::next_[uVar26] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = TTA::length_;
            TTA::length_ = uVar34;
            local_148 = local_148 & 0xffffffff;
            goto LAB_002f8d2f;
          }
          *(undefined4 *)(lVar54 + lVar41 + lVar36 + 8 + lVar46 * 4) =
               *(undefined4 *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4);
          local_148 = local_148 & 0xffffffff;
          goto LAB_002fa96c;
        }
        if (cVar10 == '\0') {
          *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = puVar55[lVar23];
        }
        else {
          uVar34 = *(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4);
          if (*(char *)(lVar46 + 3 + lVar16 * lVar53 + lVar43 + lVar40) == '\0') {
            uVar34 = TTA::Merge(uVar34,puVar55[lVar23]);
            *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
          }
          else {
            *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
          }
        }
        goto LAB_002f94cb;
      }
      if (*(char *)(lVar17 + 3 + lVar46) == '\0') {
        iVar39 = (int)lVar37 + (int)lVar46;
        goto LAB_002f738e;
      }
      uVar26 = (ulong)TTA::length_;
      puVar7[uVar26] = TTA::length_;
      puVar8[uVar26] = 0xffffffff;
      puVar9[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      puVar42[lVar46] = TTA::length_;
      TTA::length_ = uVar34;
      lVar21 = lVar21 + 0x200000000;
      puVar20 = puVar20 + 2;
      lVar24 = lVar37 + lVar46;
      lVar46 = lVar46 + 2;
      if ((long)uVar32 <= lVar24 + 2) {
        iVar39 = iVar39 + (int)lVar46;
        uVar34 = (int)lVar37 + (int)lVar46;
        goto LAB_002f783a;
      }
    }
    local_148 = lVar37 + lVar46;
    lVar23 = lVar21 + 0x300000000 >> 0x20;
    lVar17 = lVar21 >> 0x20;
    if (pcVar22[lVar23] != '\0') {
      if (*(char *)(lVar46 + 2 + lVar16 * lVar50 + lVar43 + lVar40) == '\0') {
        if (pcVar22[lVar17 + 1] == '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4),
                              puVar19[lVar17]);
          *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
        }
        else if (*(char *)(lVar46 + 2 + lVar16 * lVar53 + lVar43 + lVar40) == '\0') {
          uVar34 = TTA::Merge(puVar55[lVar17],
                              *(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4));
          uVar34 = TTA::Merge(uVar34,puVar19[lVar17]);
          *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
        }
        else {
          uVar34 = TTA::Merge(puVar55[lVar17],puVar19[lVar17]);
          *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
        }
      }
      else {
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4),
                            *(uint *)((long)puVar19 + lVar24));
        *(uint *)(lVar41 + lVar36 + 8 + lVar54 + lVar46 * 4) = uVar34;
      }
LAB_002f5d6c:
      iVar39 = (int)local_148;
      uVar34 = iVar39 + 2;
      if (local_168 <= (int)uVar34) {
LAB_002f6170:
        local_148 = (ulong)uVar34;
        if (local_168 < (int)uVar34) {
          if (*(char *)(lVar31 + local_148) == '\0') {
            if (pcVar1[local_148] == '\0') {
              puVar19[local_148] = 0;
              goto LAB_002ff3e2;
            }
            if (pcVar1[iVar39 + 1] == '\0') {
              if (*(char *)(lVar31 + (ulong)(iVar39 + 1)) == '\0') goto LAB_002fcec3;
              goto LAB_002fc418;
            }
LAB_002f6798:
            uVar34 = puVar19[iVar39];
          }
          else {
            if (*(char *)(lVar31 + (ulong)(iVar39 + 1)) != '\0') {
              puVar19[local_148] = puVar19[iVar39];
              goto LAB_002ff3e2;
            }
            if (pcVar1[iVar39 + 1] == '\0') {
              if (pcVar22[local_148] != '\0') goto LAB_002fc655;
              lVar40 = (long)iVar39;
              goto LAB_002fbe16;
            }
            uVar34 = puVar55[iVar39];
          }
          puVar19[local_148] = uVar34;
          goto LAB_002ff3e2;
        }
        if (*(char *)(lVar31 + local_148) != '\0') {
          lVar40 = (long)iVar39;
          if (*(char *)(lVar31 + (ulong)(iVar39 + 1)) == '\0') {
            if (pcVar1[iVar39 + 1] == '\0') {
              if (pcVar22[lVar40 + 3] == '\0') {
                if (pcVar22[local_148] != '\0') goto LAB_002fc655;
                goto LAB_002fbe16;
              }
              if (pcVar22[local_148] != '\0') goto LAB_002fc655;
            }
            else {
              if (pcVar22[lVar40 + 3] == '\0') goto LAB_002f6b2c;
              if (pcVar22[local_148] != '\0') goto LAB_002fbe16;
            }
            uVar34 = puVar55[lVar40];
            if (pcVar22[local_148 - lVar16] != '\0') {
              puVar19[local_148] = uVar34;
              goto LAB_002ff3e2;
            }
            uVar13 = puVar55[local_148];
            goto LAB_002ff3c0;
          }
          if (pcVar22[lVar40 + 3] == '\0') goto LAB_002f6798;
          if (pcVar22[local_148] != '\0') goto LAB_002fc655;
          if (pcVar22[local_148 - lVar16] == '\0') {
            uVar34 = puVar55[local_148];
            goto LAB_002f7b67;
          }
LAB_002f6b2c:
          uVar34 = puVar55[iVar39];
          goto LAB_002ff3db;
        }
        uVar26 = (ulong)(iVar39 + 3);
        if (pcVar1[local_148] == '\0') {
          if (*(char *)(lVar31 + uVar26) == '\0') {
            if (pcVar1[uVar26] == '\0') goto LAB_002fbd85;
            goto LAB_002fbd43;
          }
          if (pcVar22[uVar26] == '\0') {
            cVar10 = pcVar22[local_148];
            goto joined_r0x002fcebd;
          }
          uVar34 = puVar55[local_148];
          goto LAB_002fbd3b;
        }
        uVar27 = (ulong)(iVar39 + 1);
        if (*(char *)(lVar31 + uVar26) == '\0') {
          if (pcVar1[uVar27] == '\0') {
            if (*(char *)(lVar31 + uVar27) == '\0') goto LAB_002f939b;
            lVar31 = (long)iVar39;
            goto LAB_002fb680;
          }
        }
        else {
          if (*(char *)(lVar31 + uVar27) == '\0') {
            if (pcVar1[uVar27] == '\0') {
              if (pcVar22[uVar26] != '\0') goto LAB_002f91dc;
              cVar10 = pcVar22[local_148];
              goto joined_r0x002f6ddd;
            }
            if (pcVar22[uVar26] == '\0') {
              if (pcVar22[local_148] != '\0') {
                uVar34 = puVar55[iVar39];
                goto LAB_002ff3db;
              }
              uVar34 = puVar19[iVar39];
              goto LAB_002fb779;
            }
            if (pcVar22[local_148] != '\0') goto LAB_002f6b2c;
            uVar34 = puVar55[iVar39];
            if (pcVar22[local_148 - lVar16] != '\0') {
              puVar19[local_148] = uVar34;
              goto LAB_002ff3e2;
            }
            uVar13 = puVar55[local_148];
            goto LAB_002fe036;
          }
          if (pcVar22[uVar26] != '\0') {
            cVar10 = pcVar22[local_148];
            goto joined_r0x002f65b7;
          }
        }
        lVar31 = (long)iVar39;
        goto LAB_002fb597;
      }
      lVar48 = (long)iVar39;
      lVar37 = lVar48 + 2;
      lVar41 = lVar30 * lVar53 + lVar48 * 4;
      lVar23 = lVar36 + lVar48 * 4;
      lVar43 = lVar38 + lVar48;
      lVar44 = lVar16 * lVar47 + lVar48;
      lVar52 = lVar16 * lVar53 + lVar48;
      lVar56 = lVar16 * lVar50 + lVar48;
      lVar48 = lVar48 << 0x20;
      lVar46 = lVar54 + lVar41;
      lVar51 = lVar46 + 8;
      lVar24 = lVar54 + 8 + lVar23;
      lVar28 = lVar40 + 3 + lVar43;
      lVar25 = lVar40 + 2 + lVar52;
      lVar17 = lVar40 + lVar56;
      lVar58 = lVar17 + 2;
      lVar57 = 0;
      lVar21 = 0;
      while (lVar49 = lVar48 >> 0x1e, *(char *)(lVar28 + -1 + lVar21) != '\0') {
        if (*(char *)(lVar28 + -2 + lVar21) == '\0') {
          cVar10 = *(char *)(lVar17 + 3 + lVar21);
          if (*(char *)(lVar40 + lVar44 + 1 + lVar21) == '\0') {
            if (cVar10 == '\0') {
              local_148 = lVar37 + lVar21;
              if (*(char *)(lVar21 + 3 + lVar43 + lVar40) == '\0') {
                if (*(char *)(lVar21 + 2 + lVar56 + lVar40) != '\0') {
                  *(undefined4 *)(lVar24 + lVar21 * 4) = *(undefined4 *)(lVar51 + lVar21 * 4);
                  local_148 = local_148 & 0xffffffff;
                  goto LAB_002fe276;
                }
                *(undefined4 *)(lVar23 + lVar54 + 8 + lVar21 * 4) =
                     *(undefined4 *)((long)puVar55 + lVar49);
                local_148 = local_148 & 0xffffffff;
                goto LAB_002fdb0d;
              }
              lVar43 = lVar48 + 0x400000000 >> 0x20;
              cVar10 = *(char *)(lVar21 + 2 + lVar56 + lVar40);
              if (pcVar22[lVar43] == '\0') {
                if (cVar10 != '\0') {
                  uVar12 = *(undefined4 *)(lVar51 + lVar21 * 4);
                  goto LAB_002f71e3;
                }
                *(undefined4 *)(lVar23 + lVar54 + 8 + lVar21 * 4) =
                     *(undefined4 *)((long)puVar55 + lVar49);
                goto LAB_002f7325;
              }
              cVar3 = *(char *)(lVar21 + 3 + lVar52 + lVar40);
              if (cVar10 == '\0') {
                if (cVar3 == '\0') {
                  uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar49),puVar55[lVar43]);
                  *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
                }
                else if (*(char *)(lVar21 + 2 + lVar52 + lVar40) == '\0') {
                  uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar49),
                                      *(uint *)(lVar51 + lVar21 * 4));
                  *(uint *)(lVar24 + lVar21 * 4) = uVar34;
                }
                else {
                  *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = *(uint *)((long)puVar55 + lVar49);
                }
              }
              else {
                uVar34 = *(uint *)(lVar41 + lVar54 + 8 + lVar21 * 4);
                if (cVar3 == '\0') {
                  uVar34 = TTA::Merge(uVar34,puVar55[lVar43]);
LAB_002f7219:
                  *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
                }
                else {
                  *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
                }
LAB_002f721d:
                local_148 = lVar37 + lVar21;
              }
              goto LAB_002fdafe;
            }
            if (*(char *)(lVar58 + lVar21) != '\0') goto LAB_002f5e8c;
          }
          else {
            if (cVar10 == '\0') {
              local_148 = lVar37 + lVar21;
              if (*(char *)(lVar21 + 3 + lVar43 + lVar40) == '\0') {
                uVar13 = *(uint *)((long)puVar55 + lVar49);
                uVar26 = local_148 & 0xffffffff;
                goto LAB_002f97f6;
              }
              lVar41 = lVar48 + 0x400000000 >> 0x20;
              if (pcVar22[lVar41] == '\0') {
                uVar34 = *(uint *)((long)puVar55 + lVar49);
                uVar26 = local_148;
                goto LAB_002fc706;
              }
              if (*(char *)(lVar21 + 3 + lVar52 + lVar40) == '\0') {
                uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar49),puVar55[lVar41]);
                goto LAB_002fd5b4;
              }
              if (*(char *)(lVar21 + 2 + lVar56 + lVar40) != '\0') goto LAB_002f68bb;
              cVar10 = *(char *)(lVar21 + 2 + lVar52 + lVar40);
              goto LAB_002f6fec;
            }
            if (*(char *)(lVar58 + lVar21) != '\0') goto LAB_002f5ec5;
          }
          uVar34 = *(uint *)(lVar46 + lVar21 * 4);
          if (*(char *)(lVar25 + lVar21) == '\0') {
            uVar13 = *(uint *)(lVar51 + lVar21 * 4);
LAB_002f5eff:
            uVar34 = TTA::Merge(uVar34,uVar13);
          }
        }
        else {
          if (*(char *)(lVar17 + 3 + lVar21) == '\0') {
            local_148 = lVar37 + lVar21;
            if (*(char *)(lVar21 + 3 + lVar43 + lVar40) == '\0') {
              uVar13 = *(uint *)((long)puVar19 + lVar49);
              uVar26 = local_148 & 0xffffffff;
              goto LAB_002f97f6;
            }
            lVar41 = lVar48 + 0x400000000 >> 0x20;
            if (pcVar22[lVar41] == '\0') {
              uVar34 = *(uint *)((long)puVar19 + lVar49);
              uVar26 = local_148;
              goto LAB_002fc706;
            }
            if (*(char *)(lVar21 + 3 + lVar52 + lVar40) == '\0') {
              uVar34 = TTA::Merge(puVar55[lVar41],*(uint *)((long)puVar19 + lVar49));
              *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
            }
            else {
              if (*(char *)(lVar21 + 2 + lVar56 + lVar40) != '\0') {
                *(undefined4 *)(lVar24 + lVar21 * 4) = *(undefined4 *)(lVar51 + lVar21 * 4);
                goto LAB_002f721d;
              }
              if (*(char *)(lVar21 + 2 + lVar52 + lVar40) != '\0') {
                uVar34 = *(uint *)((long)puVar55 + lVar49);
                goto LAB_002f7219;
              }
              uVar34 = TTA::Merge(*(uint *)(lVar51 + lVar21 * 4),*(uint *)((long)puVar19 + lVar49));
              *(uint *)(lVar24 + lVar21 * 4) = uVar34;
            }
            local_148 = local_148 & 0xffffffff;
            goto LAB_002f94cb;
          }
          if (*(char *)(lVar58 + lVar21) == '\0') {
            if (*(char *)(lVar25 + lVar21) == '\0') {
              uVar34 = *(uint *)(lVar51 + lVar21 * 4);
              uVar13 = *(uint *)(lVar24 + -8 + lVar21 * 4);
              goto LAB_002f5eff;
            }
LAB_002f5ec5:
            uVar34 = *(uint *)(lVar46 + lVar21 * 4);
          }
          else {
LAB_002f5e8c:
            uVar34 = *(uint *)(lVar51 + lVar21 * 4);
          }
        }
        *(uint *)(lVar24 + lVar21 * 4) = uVar34;
        lVar48 = lVar48 + 0x200000000;
        lVar57 = lVar57 + 8;
        lVar49 = lVar37 + lVar21;
        lVar21 = lVar21 + 2;
        if ((long)uVar32 <= lVar49 + 2) {
          iVar39 = iVar39 + (int)lVar21;
          uVar34 = (int)lVar37 + (int)lVar21;
          goto LAB_002f6170;
        }
      }
      local_148 = lVar37 + lVar21;
      lVar43 = lVar48 + 0x300000000 >> 0x20;
      if (*(char *)(lVar21 + 2 + lVar44 + lVar40) != '\0') {
        lVar46 = lVar48 + 0x100000000 >> 0x20;
        if (*(char *)(lVar31 + lVar43) == '\0') {
          if ((pcVar1[lVar46] == '\0') && (*(char *)(lVar31 + lVar46) == '\0')) {
            uVar26 = (ulong)TTA::length_;
            TTA::rtable_[uVar26] = TTA::length_;
            TTA::next_[uVar26] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = TTA::length_;
            TTA::length_ = uVar34;
            local_148 = local_148 & 0xffffffff;
          }
          else {
            *(undefined4 *)(lVar23 + lVar54 + 8 + lVar21 * 4) =
                 *(undefined4 *)((long)puVar19 + lVar49);
            local_148 = local_148 & 0xffffffff;
          }
          goto LAB_002fb93e;
        }
        if (*(char *)(lVar31 + lVar46) == '\0') {
          if (pcVar1[lVar46] != '\0') {
            if (pcVar22[lVar43] != '\0') {
              if (*(char *)(lVar21 + 2 + lVar56 + lVar40) != '\0') goto LAB_002f69a4;
              if (*(char *)(lVar21 + 2 + lVar52 + lVar40) == '\0') {
                uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar49),*(uint *)(lVar51 + lVar21 * 4)
                                   );
                *(uint *)(lVar24 + lVar21 * 4) = uVar34;
              }
              else {
                *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = *(uint *)((long)puVar55 + lVar49);
              }
              goto LAB_002fbf8d;
            }
            lVar41 = lVar48 + 0x400000000 >> 0x20;
            if (pcVar22[lVar41] != '\0') {
              cVar10 = *(char *)(lVar21 + 2 + lVar56 + lVar40);
              if (pcVar22[lVar43 - lVar16] == '\0') {
                if (cVar10 == '\0') {
                  uVar34 = TTA::Merge(puVar55[lVar41],*(uint *)((long)puVar19 + lVar49));
                  *(uint *)(lVar24 + lVar21 * 4) = uVar34;
                  goto LAB_002fd33b;
                }
                uVar34 = TTA::Merge(*(uint *)((long)puVar55 + lVar49),puVar55[lVar41]);
                *(uint *)(lVar24 + lVar21 * 4) = uVar34;
                goto LAB_002fdafe;
              }
              if (cVar10 != '\0') goto LAB_002f68bb;
              cVar10 = *(char *)(lVar21 + 2 + lVar52 + lVar40);
LAB_002f6fec:
              local_148 = lVar37 + lVar21;
              uVar34 = *(uint *)((long)puVar55 + lVar49);
              if (cVar10 != '\0') goto LAB_002fc3f0;
              uVar34 = TTA::Merge(uVar34,*(uint *)(lVar51 + lVar21 * 4));
              *(uint *)(lVar24 + lVar21 * 4) = uVar34;
              goto LAB_002fd5b8;
            }
            if (*(char *)(lVar21 + 2 + lVar56 + lVar40) == '\0') {
              *(undefined4 *)(lVar24 + lVar21 * 4) = *(undefined4 *)((long)puVar19 + lVar49);
              goto LAB_002f7325;
            }
            uVar12 = *(undefined4 *)((long)puVar55 + lVar49);
LAB_002f71e3:
            local_148 = lVar37 + lVar21;
            *(undefined4 *)(lVar24 + lVar21 * 4) = uVar12;
            goto LAB_002fa96c;
          }
          if (pcVar22[lVar43] == '\0') {
            lVar46 = lVar48 + 0x400000000 >> 0x20;
            cVar3 = pcVar22[lVar46];
            cVar10 = *(char *)(lVar21 + 2 + lVar56 + lVar40);
            goto joined_r0x002f6c1d;
          }
        }
        else {
          if (pcVar22[lVar43] == '\0') {
            lVar41 = lVar48 + 0x400000000 >> 0x20;
            if (pcVar22[lVar41] == '\0') {
              uVar34 = *(uint *)((long)puVar19 + lVar49);
              uVar26 = local_148;
              goto LAB_002fc706;
            }
            if (pcVar22[lVar43 - lVar16] == '\0') {
              uVar34 = TTA::Merge(puVar55[lVar41],*(uint *)((long)puVar19 + lVar49));
              *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = uVar34;
              local_148 = local_148 & 0xffffffff;
              goto LAB_002f94cb;
            }
            if (*(char *)(lVar21 + 2 + lVar56 + lVar40) != '\0') {
              *(undefined4 *)(lVar24 + lVar21 * 4) = *(undefined4 *)(lVar51 + lVar21 * 4);
              goto LAB_002fc5a4;
            }
            if (*(char *)(lVar21 + 2 + lVar52 + lVar40) != '\0') {
LAB_002f68bb:
              uVar34 = *(uint *)((long)puVar55 + lVar49);
              goto LAB_002f6f09;
            }
            uVar34 = TTA::Merge(*(uint *)(lVar51 + lVar21 * 4),*(uint *)((long)puVar19 + lVar49));
            *(uint *)(lVar24 + lVar21 * 4) = uVar34;
            local_148 = local_148 & 0xffffffff;
            goto LAB_002f94cb;
          }
          if (*(char *)(lVar21 + 2 + lVar56 + lVar40) == '\0') {
            if (*(char *)(lVar21 + 2 + lVar52 + lVar40) == '\0') {
              uVar34 = TTA::Merge(*(uint *)(lVar51 + lVar21 * 4),*(uint *)((long)puVar19 + lVar49));
              *(uint *)(lVar24 + lVar21 * 4) = uVar34;
              goto LAB_002faf4f;
            }
LAB_002f69a4:
            *(undefined4 *)(lVar23 + lVar54 + 8 + lVar21 * 4) =
                 *(undefined4 *)((long)puVar55 + lVar49);
            goto LAB_002fbf8d;
          }
        }
        *(undefined4 *)(lVar24 + lVar21 * 4) = *(undefined4 *)(lVar51 + lVar21 * 4);
        goto LAB_002fbf8d;
      }
      if (*(char *)(lVar31 + lVar43) == '\0') {
        if (pcVar1[lVar43] == '\0') {
          iVar39 = (int)local_148;
          puVar20 = (uint *)(lVar57 + lVar23 + lVar54 + 8);
          goto LAB_002f738e;
        }
        uVar26 = (ulong)TTA::length_;
        TTA::rtable_[uVar26] = TTA::length_;
        TTA::next_[uVar26] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar34 = TTA::length_ + 1;
        *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = TTA::length_;
        TTA::length_ = uVar34;
        goto LAB_002f76f0;
      }
      if (pcVar22[lVar43] != '\0') {
        *(undefined4 *)(lVar24 + lVar21 * 4) = *(undefined4 *)(lVar51 + lVar21 * 4);
        local_148 = local_148 & 0xffffffff;
        goto LAB_002faf4f;
      }
      lVar46 = lVar48 + 0x400000000 >> 0x20;
      cVar3 = pcVar22[lVar46];
      cVar10 = *(char *)(lVar21 + 2 + lVar56 + lVar40);
joined_r0x002f6c1d:
      if (cVar3 != '\0') {
        if (cVar10 != '\0') {
          uVar34 = *(uint *)(lVar41 + lVar54 + 8 + lVar21 * 4);
          if (pcVar22[lVar43 - lVar16] != '\0') goto LAB_002fc3f0;
          uVar34 = TTA::Merge(uVar34,puVar55[lVar46]);
          goto LAB_002fd5b4;
        }
        uVar34 = puVar55[lVar46];
LAB_002f6f09:
        local_148 = lVar37 + lVar21;
        goto LAB_002fc59b;
      }
      if (cVar10 != '\0') {
        *(undefined4 *)(lVar24 + lVar21 * 4) = *(undefined4 *)(lVar51 + lVar21 * 4);
        goto LAB_002fa96c;
      }
      uVar26 = (ulong)TTA::length_;
      TTA::rtable_[uVar26] = TTA::length_;
      TTA::next_[uVar26] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      *(uint *)(lVar23 + lVar54 + 8 + lVar21 * 4) = TTA::length_;
      TTA::length_ = uVar34;
LAB_002f7325:
      local_148 = lVar37 + lVar21;
      goto LAB_002f8d2f;
    }
    if (*(char *)(lVar31 + lVar23) != '\0') {
      lVar21 = lVar21 + 0x400000000 >> 0x20;
      if (pcVar22[lVar21] == '\0') {
        if (pcVar22[lVar17 + 1] != '\0') {
          uVar34 = TTA::Merge(puVar55[lVar17],puVar19[lVar17]);
          uVar26 = local_148;
          goto LAB_002fc706;
        }
        if (*(char *)(lVar46 + 2 + lVar16 * lVar50 + lVar43 + lVar40) == '\0') {
          *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = puVar19[lVar17];
          goto LAB_002f8d2f;
        }
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4),
                            puVar19[lVar17]);
        *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
LAB_002f89dd:
        local_148 = lVar37 + lVar46;
        goto LAB_002fa96c;
      }
      if (*(char *)(lVar46 + 2 + lVar16 * lVar50 + lVar43 + lVar40) != '\0') {
        uVar34 = *(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4);
        if (pcVar22[lVar23 - lVar16] == '\0') {
          uVar34 = TTA::Merge(uVar34,puVar55[lVar21]);
          uVar34 = TTA::Merge(uVar34,*(uint *)((long)puVar19 + lVar24));
          *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
        }
        else {
          uVar34 = TTA::Merge(uVar34,*(uint *)((long)puVar19 + lVar24));
          *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
        }
        goto LAB_002f94cb;
      }
      if (pcVar22[lVar17 + 1] == '\0') {
        uVar34 = puVar55[lVar21];
        uVar13 = puVar19[lVar17];
      }
      else {
        if (pcVar22[lVar23 - lVar16] != '\0') {
          if (*(char *)(lVar46 + 2 + lVar16 * lVar53 + lVar43 + lVar40) == '\0') {
            uVar34 = TTA::Merge(puVar55[lVar17],
                                *(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4));
            uVar34 = TTA::Merge(uVar34,puVar19[lVar17]);
            *(uint *)(lVar54 + lVar41 + lVar36 + 8 + lVar46 * 4) = uVar34;
          }
          else {
            uVar34 = TTA::Merge(puVar55[lVar17],puVar19[lVar17]);
            *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
          }
          goto LAB_002f94cb;
        }
        uVar34 = TTA::Merge(puVar55[lVar17],puVar55[lVar21]);
        uVar13 = puVar19[lVar17];
      }
      uVar34 = TTA::Merge(uVar34,uVar13);
      *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
      goto LAB_002f94cb;
    }
    if (pcVar22[lVar17 + 1] == '\0') {
      if (*(char *)(lVar46 + 2 + lVar16 * lVar50 + lVar43 + lVar40) != '\0') {
        uVar34 = TTA::Merge(*(uint *)(lVar30 * lVar53 + lVar41 + lVar54 + 8 + lVar46 * 4),
                            puVar19[lVar17]);
        *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = uVar34;
        goto LAB_002fe276;
      }
      *(uint *)(lVar41 + lVar36 + lVar54 + 8 + lVar46 * 4) = puVar19[lVar17];
      goto LAB_002fdb0d;
    }
    uVar13 = TTA::Merge(puVar55[lVar17],puVar19[lVar17]);
LAB_002fc539:
    uVar34 = (uint)local_148;
  }
  uVar26 = local_148 & 0xffffffff;
  if (local_168 < (int)local_148) {
    if (*(char *)(lVar31 + uVar26) == '\0') {
      if (pcVar1[uVar26] == '\0') goto LAB_002fad9e;
      if (pcVar1[lVar37 + 1] == '\0') goto LAB_002fad6e;
      puVar19[uVar26] = puVar19[lVar37];
      goto LAB_002ff3e2;
    }
    uVar27 = (ulong)(uVar34 + 1);
    if (pcVar1[uVar27] == '\0') {
      if (pcVar22[uVar26] == '\0') goto LAB_002fae10;
      uVar34 = puVar55[uVar26];
      goto LAB_002fabf8;
    }
    if (pcVar22[uVar26] == '\0') {
      uVar34 = puVar19[lVar37];
      goto LAB_002fabf8;
    }
LAB_002f98c2:
    if (pcVar22[lVar37] == '\0') {
      uVar34 = puVar55[uVar26];
      uVar13 = puVar19[lVar37];
    }
    else {
      uVar34 = puVar55[lVar37];
      if (pcVar22[uVar27 - lVar16] != '\0') {
        puVar19[uVar26] = uVar34;
        goto LAB_002ff3e2;
      }
      uVar13 = puVar55[uVar26];
    }
LAB_002fa0db:
    uVar34 = TTA::Merge(uVar34,uVar13);
    puVar19[uVar26] = uVar34;
    goto LAB_002ff3e2;
  }
  if (*(char *)(lVar31 + uVar26) != '\0') {
    uVar27 = (ulong)(uVar34 + 1);
    if (pcVar1[uVar27] == '\0') {
      if (pcVar22[lVar37 + 3] == '\0') {
        cVar10 = pcVar22[uVar26];
joined_r0x002fa310:
        if (cVar10 == '\0') {
          uVar27 = (ulong)TTA::length_;
          TTA::rtable_[uVar27] = TTA::length_;
          TTA::next_[uVar27] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          puVar19[uVar26] = TTA::length_;
          TTA::length_ = uVar34;
          goto LAB_002ff3e2;
        }
      }
      uVar34 = puVar55[uVar26];
    }
    else {
      if (pcVar22[lVar37 + 3] != '\0') {
        if (pcVar22[lVar37] == '\0') {
          uVar34 = puVar55[uVar26];
          uVar13 = puVar19[lVar37];
LAB_002fa14f:
          uVar34 = TTA::Merge(uVar34,uVar13);
        }
        else {
          if (pcVar22[uVar27 - lVar16] == '\0') {
            uVar34 = puVar55[lVar37];
            uVar13 = puVar55[uVar26];
            goto LAB_002fa14f;
          }
          if (pcVar22[uVar26] == '\0') {
            uVar34 = puVar55[lVar37];
            if (pcVar22[uVar26 - lVar16] == '\0') goto LAB_002fa76a;
            puVar19[uVar26] = uVar34;
            goto LAB_002ff3e2;
          }
          uVar34 = puVar55[lVar37];
        }
        puVar19[uVar26] = uVar34;
        goto LAB_002ff3e2;
      }
      if (pcVar22[uVar26] != '\0') {
        if (pcVar22[lVar37] == '\0') {
          uVar34 = puVar55[uVar26];
          uVar13 = puVar19[lVar37];
          goto LAB_002fa0db;
        }
        uVar34 = puVar55[lVar37];
        if (pcVar22[uVar27 - lVar16] != '\0') {
          puVar19[uVar26] = uVar34;
          goto LAB_002ff3e2;
        }
        uVar13 = puVar55[uVar26];
        goto LAB_002fa0db;
      }
      uVar34 = puVar19[lVar37];
    }
LAB_002f9fb1:
    puVar19[uVar26] = uVar34;
    goto LAB_002ff3e2;
  }
  uVar15 = (ulong)(uVar34 + 3);
  if (pcVar1[uVar26] == '\0') {
    if (*(char *)(lVar31 + uVar15) != '\0') {
      if (pcVar22[uVar15] == '\0') {
        cVar10 = pcVar22[uVar26];
        goto joined_r0x002fa310;
      }
      uVar34 = puVar55[uVar26];
LAB_002f9f7e:
      puVar19[uVar26] = uVar34;
      goto LAB_002ff3e2;
    }
    if (pcVar1[uVar15] == '\0') {
      puVar19[uVar26] = 0;
      goto LAB_002ff3e2;
    }
  }
  else {
    if (*(char *)(lVar31 + uVar15) != '\0') {
      uVar27 = (ulong)(uVar34 + 1);
      if (pcVar1[uVar27] == '\0') {
        if (pcVar22[uVar15] == '\0') {
          if (pcVar22[uVar26] == '\0') {
            uVar27 = (ulong)TTA::length_;
            TTA::rtable_[uVar27] = TTA::length_;
            TTA::next_[uVar27] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar34 = TTA::length_ + 1;
            puVar19[uVar26] = TTA::length_;
            TTA::length_ = uVar34;
          }
          else {
            puVar19[uVar26] = puVar55[uVar26];
          }
          goto LAB_002ff3e2;
        }
        uVar34 = puVar55[uVar26];
      }
      else {
        if (pcVar22[uVar15] != '\0') {
          if (pcVar22[lVar37] == '\0') {
            uVar34 = puVar55[uVar26];
            uVar13 = puVar19[lVar37];
          }
          else {
            if (pcVar22[uVar27 - lVar16] == '\0') {
              uVar34 = puVar55[lVar37];
            }
            else {
              if (pcVar22[uVar26] != '\0') {
                uVar34 = puVar55[lVar37];
                goto LAB_002f9fb1;
              }
              uVar34 = puVar55[lVar37];
              if (pcVar22[uVar26 - lVar16] != '\0') {
                puVar19[uVar26] = uVar34;
                goto LAB_002ff3e2;
              }
            }
LAB_002fa76a:
            uVar13 = puVar55[uVar26];
          }
          uVar34 = TTA::Merge(uVar34,uVar13);
          goto LAB_002f9fb1;
        }
        if (pcVar22[uVar26] != '\0') goto LAB_002f98c2;
        uVar34 = puVar19[lVar37];
      }
      puVar19[uVar26] = uVar34;
      goto LAB_002ff3e2;
    }
    if (pcVar1[lVar37 + 1] != '\0') {
      uVar34 = puVar19[lVar37];
      goto LAB_002f9f7e;
    }
  }
  uVar27 = (ulong)TTA::length_;
  TTA::rtable_[uVar27] = TTA::length_;
  TTA::next_[uVar27] = 0xffffffff;
  TTA::tail_[TTA::length_] = TTA::length_;
  uVar34 = TTA::length_ + 1;
  puVar19[uVar26] = TTA::length_;
  TTA::length_ = uVar34;
  goto LAB_002ff3e2;
LAB_00300786:
  uVar33 = (ulong)(uint)(iVar39 + iVar35);
  puVar29 = (undefined4 *)((lVar28 >> 0x1e) + lVar53);
  uVar26 = lVar24 + lVar25 + 2;
LAB_00300f42:
  do {
    *(undefined4 *)(lVar53 + uVar26 * 4) = *puVar29;
    iVar39 = (int)uVar33;
    uVar34 = iVar39 + 2;
    if (local_168 <= (int)uVar34) {
LAB_0030193a:
      uVar26 = (ulong)uVar34;
      if (local_168 < (int)uVar34) goto LAB_0030194d;
      lVar50 = (long)(int)uVar34;
      lVar31 = (long)iVar39;
      if (*(char *)(lVar47 + lVar50) == '\0') {
        if (*(char *)(lVar31 + 3 + lVar47) == '\0') {
LAB_00301b82:
          *(undefined4 *)(lVar53 + lVar50 * 4) = 0;
          goto LAB_00301bfe;
        }
        if (*(char *)(lVar30 + 3 + lVar31) == '\0') {
LAB_00301b44:
          uVar32 = (ulong)TTA::length_;
          TTA::rtable_[uVar32] = TTA::length_;
          TTA::next_[uVar32] = 0xffffffff;
LAB_00301b72:
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_ + 1;
          *(uint *)(lVar53 + lVar50 * 4) = TTA::length_;
          TTA::length_ = uVar34;
          goto LAB_00301bfe;
        }
LAB_00301bf1:
        uVar34 = *(uint *)(lVar54 + lVar50 * 4);
      }
      else if (*(char *)(lVar30 + 3 + lVar31) == '\0') {
LAB_00301a9b:
        uVar34 = *(uint *)(lVar53 + lVar31 * 4);
      }
      else {
        if (*(char *)(lVar23 + lVar50) != '\0') {
          if (*(char *)(lVar30 + lVar31) == '\0') {
            uVar34 = *(uint *)(lVar54 + lVar50 * 4);
            uVar13 = *(uint *)(lVar53 + lVar31 * 4);
          }
          else {
            uVar34 = *(uint *)(lVar54 + lVar31 * 4);
            if (*(char *)(lVar23 + 1 + lVar31) != '\0') {
              *(uint *)(lVar53 + lVar50 * 4) = uVar34;
              goto LAB_00301bfe;
            }
            uVar13 = *(uint *)(lVar54 + lVar50 * 4);
          }
          uVar34 = TTA::Merge(uVar34,uVar13);
          *(uint *)(lVar53 + lVar50 * 4) = uVar34;
          goto LAB_00301bfe;
        }
LAB_00301bdb:
        uVar34 = *(uint *)(lVar54 + lVar50 * 4);
        uVar13 = *(uint *)(lVar53 + lVar31 * 4);
LAB_00301ee0:
        uVar34 = TTA::Merge(uVar34,uVar13);
      }
LAB_00301bf5:
      *(uint *)(lVar53 + lVar50 * 4) = uVar34;
      goto LAB_00301bfe;
    }
    lVar21 = (long)iVar39;
    lVar16 = lVar21 + 2;
    lVar17 = lVar21 << 0x20;
    lVar46 = lVar37 + lVar21 * 4;
    lVar24 = 0;
LAB_00300f96:
    if (*(char *)(lVar31 + lVar21 + -1 + lVar24) == '\0') {
      uVar26 = lVar16 + lVar24;
      lVar21 = lVar17 + 0x300000000 >> 0x20;
      if (*(char *)(lVar47 + lVar21) == '\0') goto LAB_00301036;
      if (*(char *)(lVar30 + lVar21) != '\0') {
LAB_0030101a:
        iVar35 = (int)uVar26;
        goto LAB_00300a30;
      }
      lVar17 = lVar17 + 0x400000000 >> 0x20;
      if (*(char *)(lVar30 + lVar17) == '\0') goto LAB_00300300;
      *(undefined4 *)(lVar46 + lVar24 * 4) = *(undefined4 *)(lVar54 + lVar17 * 4);
LAB_00301222:
      uVar33 = lVar16 + lVar24 & 0xffffffff;
      goto LAB_003005e6;
    }
    lVar25 = lVar17 >> 0x20;
    lVar28 = lVar17 >> 0x1e;
    if (*(char *)(lVar50 + lVar21 + -1 + lVar24) == '\0') {
      if (*(char *)(lVar31 + lVar21 + lVar24) == '\0') {
        uVar26 = lVar16 + lVar24;
        uVar34 = *(uint *)(lVar53 + lVar28);
LAB_003010c7:
        iVar39 = (int)uVar26;
        goto LAB_0030149d;
      }
      if (*(char *)(lVar50 + lVar21 + lVar24) == '\0') goto code_r0x00300fbc;
      if (*(char *)(lVar24 + lVar43 + lVar21) == '\0') {
        uVar34 = *(uint *)(lVar40 + lVar21 * 4 + 8 + lVar24 * 4);
      }
      else {
        if (*(char *)(lVar24 + -1 + lVar43 + lVar21) != '\0') {
          if (*(char *)(lVar30 + lVar25) == '\0') {
            uVar34 = TTA::Merge(*(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4),
                                *(uint *)(lVar53 + lVar25 * 4));
            *(uint *)(lVar46 + lVar24 * 4) = uVar34;
            uVar33 = lVar16 + lVar24 & 0xffffffff;
          }
          else {
            uVar34 = *(uint *)(lVar54 + lVar25 * 4);
            if (*(char *)(lVar41 + lVar25) == '\0') {
              uVar34 = TTA::Merge(uVar34,*(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4));
              *(uint *)(lVar46 + lVar24 * 4) = uVar34;
            }
            else {
              *(uint *)(lVar46 + lVar24 * 4) = uVar34;
            }
            uVar33 = lVar16 + lVar24 & 0xffffffff;
          }
          goto LAB_003005e6;
        }
        uVar34 = *(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4);
      }
      uVar34 = TTA::Merge(uVar34,*(uint *)(lVar53 + lVar28));
      *(uint *)(lVar46 + lVar24 * 4) = uVar34;
      goto LAB_00301222;
    }
    uVar26 = lVar16 + lVar24;
    if (*(char *)(lVar24 + -1 + lVar43 + lVar21) == '\0') {
      uVar34 = TTA::Merge(*(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4),*(uint *)(lVar53 + lVar28));
      uVar33 = uVar26 & 0xffffffff;
      goto LAB_00300c3d;
    }
    if (*(char *)(lVar30 + lVar25) == '\0') {
      uVar34 = TTA::Merge(*(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4),*(uint *)(lVar53 + lVar25 * 4)
                         );
    }
    else {
      uVar34 = *(uint *)(lVar54 + lVar25 * 4);
      if (*(char *)(lVar41 + lVar25) == '\0') {
        uVar34 = TTA::Merge(uVar34,*(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4));
      }
    }
LAB_00300961:
    uVar33 = uVar26 & 0xffffffff;
LAB_00300c3d:
    *(uint *)(lVar53 + uVar26 * 4) = uVar34;
    iVar39 = (int)uVar33;
    iVar35 = iVar39 + 2;
    if (local_168 <= iVar35) {
LAB_003017b4:
      lVar50 = (long)iVar35;
      if (local_168 < iVar35) {
        if (*(char *)(lVar47 + lVar50) == '\0') goto LAB_00301b82;
        lVar31 = (long)iVar39;
        if (*(char *)(lVar47 + 1 + lVar31) != '\0') goto LAB_00301a9b;
        cVar10 = *(char *)(lVar30 + lVar50);
joined_r0x00301beb:
        lVar31 = (long)iVar39;
        if (cVar10 != '\0') goto LAB_00301bf1;
      }
      else {
        lVar31 = (long)iVar39;
        if (*(char *)(lVar47 + lVar50) == '\0') {
LAB_003019e3:
          if (*(char *)(lVar31 + 3 + lVar47) == '\0') goto LAB_00301b82;
          if ((*(char *)(lVar30 + 3 + lVar31) != '\0') || (*(char *)(lVar30 + lVar50) != '\0'))
          goto LAB_00301bf1;
          goto LAB_00301b44;
        }
        cVar3 = *(char *)(lVar30 + 3 + lVar31);
        if (*(char *)(lVar47 + 1 + lVar31) == '\0') {
          cVar10 = *(char *)(lVar30 + lVar50);
          if (cVar3 == '\0') goto joined_r0x00301beb;
          if (cVar10 != '\0') goto LAB_00301bf1;
LAB_00301aec:
          uVar34 = *(uint *)(lVar54 + lVar31 * 4);
          if (*(char *)(lVar23 + lVar50) == '\0') {
            uVar13 = *(uint *)(lVar54 + lVar50 * 4);
            goto LAB_00301ee0;
          }
          *(uint *)(lVar53 + lVar50 * 4) = uVar34;
          goto LAB_00301bfe;
        }
joined_r0x003019be:
        if (cVar3 == '\0') goto LAB_00301a9b;
        if (*(char *)(lVar30 + lVar50) != '\0') goto LAB_00301bf1;
        if (*(char *)(lVar23 + lVar50) == '\0') goto LAB_00301bdb;
      }
LAB_00301acf:
      uVar34 = *(uint *)(lVar54 + lVar31 * 4);
      goto LAB_00301bf5;
    }
    lVar44 = (long)iVar39;
    lVar16 = lVar44 + 2;
    lVar46 = (lVar44 << 0x20) + 0x400000000;
    lVar25 = (lVar44 << 0x20) + 0x300000000;
    lVar17 = lVar40 + lVar44 * 4;
    lVar21 = lVar53 + lVar44 * 4;
    lVar24 = lVar31 + lVar44;
    lVar28 = lVar43 + lVar44;
    lVar44 = lVar44 + lVar38;
    lVar58 = 0;
    lVar52 = 0;
LAB_00300cc0:
    lVar48 = lVar46 >> 0x20;
    if (*(char *)(lVar24 + -1 + lVar52) == '\0') break;
    cVar10 = *(char *)(lVar44 + 1 + lVar52);
    if (*(char *)(lVar24 + -2 + lVar52) == '\0') {
      if (cVar10 != '\0') {
        if (*(char *)(lVar44 + lVar52) != '\0') goto LAB_00300d06;
        uVar34 = *(uint *)(lVar17 + -8 + lVar52 * 4);
        if (*(char *)(lVar28 + -1 + lVar52) == '\0') {
          uVar13 = *(uint *)(lVar17 + lVar52 * 4);
          goto LAB_00300d57;
        }
        goto LAB_00300d0a;
      }
      uVar26 = lVar16 + lVar52;
      if (*(char *)(lVar52 + lVar24) == '\0') {
        if (*(char *)(lVar52 + lVar44) == '\0') {
          uVar34 = *(uint *)(lVar17 + -8 + lVar52 * 4);
        }
        else {
          uVar34 = *(uint *)(lVar17 + lVar52 * 4);
        }
LAB_00301495:
        iVar39 = (int)uVar26;
        goto LAB_0030149d;
      }
      if (*(char *)(lVar30 + lVar48) == '\0') {
        if (*(char *)(lVar52 + lVar44) == '\0') {
          uVar34 = *(uint *)(lVar17 + -8 + lVar52 * 4);
LAB_003015bf:
          iVar35 = (int)uVar26;
          uVar13 = TTA::length_;
          goto LAB_00300330;
        }
        goto LAB_0030132d;
      }
      if (*(char *)(lVar52 + lVar44) == '\0') {
        if (*(char *)(lVar52 + lVar28) == '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar17 + -8 + lVar52 * 4),*(uint *)(lVar54 + lVar48 * 4));
          *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
          uVar33 = uVar26 & 0xffffffff;
        }
        else {
          uVar34 = *(uint *)(lVar17 + -8 + lVar52 * 4);
          if (*(char *)(lVar52 + -1 + lVar28) == '\0') {
            uVar34 = TTA::Merge(uVar34,*(uint *)(lVar17 + lVar52 * 4));
            *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
          }
          else {
            *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
          }
LAB_0030168b:
          uVar33 = uVar26 & 0xffffffff;
        }
        goto LAB_003005e6;
      }
      uVar34 = *(uint *)(lVar17 + lVar52 * 4);
      if (*(char *)(lVar52 + lVar28) == '\0') {
        uVar34 = TTA::Merge(uVar34,*(uint *)(lVar54 + lVar48 * 4));
        *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
        uVar33 = uVar26 & 0xffffffff;
        goto LAB_003005e6;
      }
      *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
      goto LAB_00300ed6;
    }
    if (cVar10 != '\0') {
      if (*(char *)(lVar44 + lVar52) == '\0') {
        if (*(char *)(lVar28 + -1 + lVar52) == '\0') {
          uVar34 = *(uint *)(lVar17 + lVar52 * 4);
          uVar13 = *(uint *)(lVar21 + lVar52 * 4);
LAB_00300d57:
          uVar34 = TTA::Merge(uVar34,uVar13);
        }
        else {
          uVar34 = *(uint *)(lVar17 + -8 + lVar52 * 4);
        }
      }
      else {
LAB_00300d06:
        uVar34 = *(uint *)(lVar17 + lVar52 * 4);
      }
LAB_00300d0a:
      *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
      lVar46 = lVar46 + 0x200000000;
      lVar25 = lVar25 + 0x200000000;
      lVar58 = lVar58 + 8;
      lVar48 = lVar16 + lVar52;
      lVar52 = lVar52 + 2;
      if ((long)uVar32 <= lVar48 + 2) {
        iVar35 = iVar39 + (int)lVar52 + 2;
        iVar39 = iVar39 + (int)lVar52;
        goto LAB_003017b4;
      }
      goto LAB_00300cc0;
    }
    uVar26 = lVar16 + lVar52;
    if (*(char *)(lVar52 + lVar24) == '\0') {
      uVar34 = *(uint *)(lVar21 + lVar52 * 4);
      iVar39 = (int)uVar26;
      goto LAB_0030149d;
    }
    if (*(char *)(lVar30 + lVar48) != '\0') {
      if (*(char *)(lVar52 + lVar28) == '\0') {
        uVar34 = TTA::Merge(*(uint *)(lVar54 + lVar48 * 4),*(uint *)(lVar21 + lVar52 * 4));
        *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
        uVar33 = uVar26 & 0xffffffff;
      }
      else if (*(char *)(lVar52 + lVar44) == '\0') {
        if (*(char *)(lVar52 + -1 + lVar28) == '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar17 + lVar52 * 4),*(uint *)(lVar21 + lVar52 * 4));
          *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
          uVar33 = uVar26 & 0xffffffff;
        }
        else {
          *(undefined4 *)(lVar21 + 8 + lVar52 * 4) = *(undefined4 *)(lVar17 + -8 + lVar52 * 4);
          uVar33 = uVar26 & 0xffffffff;
        }
      }
      else {
        *(undefined4 *)(lVar21 + 8 + lVar52 * 4) = *(undefined4 *)(lVar17 + lVar52 * 4);
        uVar33 = uVar26 & 0xffffffff;
      }
      goto LAB_003005e6;
    }
    puVar29 = (undefined4 *)(lVar21 + lVar58);
LAB_00300f3f:
    uVar33 = uVar26 & 0xffffffff;
  } while( true );
  uVar26 = lVar16 + lVar52;
  lVar25 = lVar25 >> 0x20;
  if (*(char *)(lVar47 + lVar25) == '\0') {
LAB_00301036:
    iVar35 = (int)uVar26;
LAB_002fff15:
    *(undefined4 *)(lVar53 + uVar26 * 4) = 0;
    iVar39 = iVar35 + 2;
    if (local_168 <= iVar39) {
LAB_00301757:
      lVar50 = (long)iVar39;
      if (local_168 < iVar39) {
        if (*(char *)(lVar47 + lVar50) == '\0') goto LAB_00301b82;
        cVar10 = *(char *)(lVar30 + lVar50);
      }
      else {
        lVar31 = (long)iVar35;
        if (*(char *)(lVar47 + lVar50) == '\0') goto LAB_003019e3;
        cVar10 = *(char *)(lVar30 + lVar50);
        if (*(char *)(lVar30 + 3 + lVar31) != '\0') {
          if ((cVar10 != '\0') || (*(char *)(lVar30 + 1 + lVar31) == '\0')) goto LAB_00301bf1;
          goto LAB_00301aec;
        }
      }
      if (cVar10 != '\0') goto LAB_00301bf1;
      lVar31 = (long)iVar35;
      if (*(char *)(lVar30 + 1 + lVar31) != '\0') goto LAB_00301acf;
      goto LAB_00301b44;
    }
    lVar21 = (long)iVar35;
    lVar16 = lVar21 + 2;
    lVar17 = lVar21 << 0x20;
    lVar46 = lVar37 + lVar21 * 4;
    lVar24 = 0;
    while (*(char *)(lVar31 + lVar21 + -1 + lVar24) == '\0') {
      if (*(char *)(lVar31 + lVar21 + lVar24) != '\0') {
        uVar26 = lVar16 + lVar24;
        if (*(char *)(lVar24 + 1 + lVar38 + lVar21) != '\0') goto LAB_0030101a;
        lVar16 = lVar17 + 0x400000000 >> 0x20;
        cVar10 = *(char *)(lVar24 + lVar38 + lVar21);
        if (*(char *)(lVar30 + lVar16) == '\0') {
          if (cVar10 == '\0') goto LAB_00300300;
          uVar33 = uVar26 & 0xffffffff;
          goto LAB_00300860;
        }
        if (cVar10 == '\0') {
          *(undefined4 *)(lVar46 + lVar24 * 4) = *(undefined4 *)(lVar54 + lVar16 * 4);
        }
        else {
          uVar34 = *(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4);
          if (*(char *)(lVar24 + lVar43 + lVar21) == '\0') {
            uVar34 = TTA::Merge(uVar34,*(uint *)(lVar54 + lVar16 * 4));
            *(uint *)(lVar46 + lVar24 * 4) = uVar34;
          }
          else {
            *(uint *)(lVar46 + lVar24 * 4) = uVar34;
          }
        }
        goto LAB_00300991;
      }
      *(undefined4 *)(lVar46 + lVar24 * 4) = 0;
      lVar17 = lVar17 + 0x200000000;
      lVar28 = lVar24 + lVar16;
      lVar24 = lVar24 + 2;
      if ((long)uVar32 <= lVar28 + 2) {
        iVar39 = iVar35 + (int)lVar24 + 2;
        iVar35 = iVar35 + (int)lVar24;
        goto LAB_00301757;
      }
    }
    uVar26 = lVar16 + lVar24;
    lVar28 = lVar17 + 0x300000000 >> 0x20;
    lVar16 = lVar17 >> 0x20;
    if (*(char *)(lVar30 + lVar28) != '\0') {
      if (*(char *)(lVar24 + lVar38 + lVar21) == '\0') {
        if (*(char *)(lVar36 + lVar16) == '\0') {
          uVar34 = *(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4);
        }
        else {
          uVar34 = *(uint *)(lVar54 + lVar16 * 4);
          if (*(char *)(lVar24 + -1 + lVar43 + lVar21) == '\0') {
            uVar34 = TTA::Merge(uVar34,*(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4));
          }
        }
      }
      else {
        uVar34 = *(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4);
      }
      uVar33 = uVar26 & 0xffffffff;
      goto LAB_00300c3d;
    }
    if (*(char *)(lVar47 + lVar28) == '\0') {
      if (*(char *)(lVar24 + lVar38 + lVar21) == '\0') {
        if (*(char *)(lVar36 + lVar16) == '\0') {
          uVar33 = (ulong)TTA::length_;
          TTA::rtable_[uVar33] = TTA::length_;
          TTA::next_[uVar33] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar34 = TTA::length_;
          TTA::length_ = TTA::length_ + 1;
        }
        else {
          uVar34 = *(uint *)(lVar54 + lVar16 * 4);
        }
      }
      else {
        uVar34 = *(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4);
      }
      iVar39 = (int)uVar26;
      goto LAB_0030149d;
    }
    lVar17 = lVar17 + 0x400000000 >> 0x20;
    cVar10 = *(char *)(lVar24 + lVar38 + lVar21);
    if (*(char *)(lVar30 + lVar17) == '\0') {
      if (cVar10 != '\0') {
        uVar33 = uVar26 & 0xffffffff;
LAB_00300860:
        *(undefined4 *)(lVar53 + uVar26 * 4) = *(undefined4 *)(lVar54 + uVar26 * 4);
        lVar16 = (long)(int)uVar33;
        uVar26 = lVar16 + 2;
        iVar35 = (int)uVar26;
        if (local_168 <= iVar35) {
          if (local_168 < iVar35) goto LAB_0030194d;
          if (*(char *)(lVar47 + uVar26) == '\0') {
            if (*(char *)(lVar16 + 3 + lVar47) == '\0') {
              *(undefined4 *)(lVar53 + 8 + lVar16 * 4) = 0;
              goto LAB_00301bfe;
            }
            if (*(char *)(lVar30 + 3 + lVar16) == '\0') {
              uVar32 = (ulong)TTA::length_;
              TTA::rtable_[uVar32] = TTA::length_;
              TTA::next_[uVar32] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar34 = TTA::length_ + 1;
              *(uint *)(lVar53 + 8 + lVar16 * 4) = TTA::length_;
              TTA::length_ = uVar34;
              goto LAB_00301bfe;
            }
            uVar34 = *(uint *)(lVar54 + 8 + lVar16 * 4);
          }
          else if (*(char *)(lVar30 + 3 + lVar16) == '\0') {
            uVar34 = *(uint *)(lVar53 + lVar16 * 4);
          }
          else {
            if (*(char *)(lVar23 + uVar26) == '\0') {
              uVar34 = *(uint *)(lVar54 + 8 + lVar16 * 4);
              uVar13 = *(uint *)(lVar53 + lVar16 * 4);
            }
            else {
              uVar34 = *(uint *)(lVar54 + lVar16 * 4);
              if (*(char *)(lVar23 + 1 + lVar16) != '\0') {
                *(uint *)(lVar53 + 8 + lVar16 * 4) = uVar34;
                goto LAB_00301bfe;
              }
              uVar13 = *(uint *)(lVar54 + 8 + lVar16 * 4);
            }
            uVar34 = TTA::Merge(uVar34,uVar13);
          }
          *(uint *)(lVar53 + 8 + lVar16 * 4) = uVar34;
          goto LAB_00301bfe;
        }
        if (*(char *)(lVar47 + 2 + lVar16) == '\0') {
          if (*(char *)(lVar47 + 3 + lVar16) == '\0') goto LAB_00301036;
          if (*(char *)(lVar30 + 3 + lVar16) != '\0') goto LAB_00300a30;
          if (*(char *)(lVar16 + 4 + lVar30) == '\0') {
LAB_00300300:
            uVar33 = (ulong)TTA::length_;
            TTA::rtable_[uVar33] = TTA::length_;
            TTA::next_[uVar33] = 0xffffffff;
LAB_0030031a:
            TTA::tail_[TTA::length_] = TTA::length_;
            iVar35 = (int)uVar26;
            uVar13 = TTA::length_ + 1;
            uVar34 = TTA::length_;
LAB_00300330:
            TTA::length_ = uVar13;
            *(uint *)(lVar53 + uVar26 * 4) = uVar34;
            puVar20 = TTA::tail_;
            puVar55 = TTA::next_;
            puVar19 = TTA::rtable_;
            uVar34 = iVar35 + 2;
            if ((int)uVar34 < local_168) {
              lVar17 = (long)iVar35;
              lVar16 = lVar17 + 2;
              lVar24 = lVar17 << 0x20;
              lVar46 = lVar37 + lVar17 * 4;
              lVar21 = 0;
              while( true ) {
                if (*(char *)(lVar31 + lVar17 + -1 + lVar21) != '\0') {
                  uVar26 = lVar16 + lVar21;
                  lVar28 = lVar24 + 0x300000000 >> 0x20;
                  lVar16 = lVar24 >> 0x1e;
                  if (*(char *)(lVar30 + lVar28) != '\0') {
                    uVar34 = TTA::Merge(*(uint *)(lVar40 + lVar17 * 4 + lVar21 * 4),
                                        *(uint *)(lVar53 + lVar16));
                    uVar33 = uVar26 & 0xffffffff;
                    goto LAB_00300c3d;
                  }
                  if (*(char *)(lVar47 + lVar28) == '\0') {
                    uVar34 = *(uint *)(lVar53 + lVar16);
                    goto LAB_003010c7;
                  }
                  lVar24 = lVar24 + 0x400000000 >> 0x20;
                  if (*(char *)(lVar30 + lVar24) == '\0') goto LAB_003009b7;
                  if (*(char *)(lVar23 + lVar28) != '\0') {
                    uVar34 = TTA::Merge(*(uint *)(lVar40 + lVar17 * 4 + lVar21 * 4),
                                        *(uint *)(lVar53 + lVar16));
                    *(uint *)(lVar46 + lVar21 * 4) = uVar34;
                    goto LAB_0030168b;
                  }
                  uVar34 = TTA::Merge(*(uint *)(lVar54 + lVar24 * 4),*(uint *)(lVar53 + lVar16));
                  *(uint *)(lVar46 + lVar21 * 4) = uVar34;
                  uVar33 = uVar26 & 0xffffffff;
                  goto LAB_003005e6;
                }
                if (*(char *)(lVar31 + lVar17 + lVar21) == '\0') {
                  uVar26 = lVar16 + lVar21;
                  goto LAB_00300b0f;
                }
                if (*(char *)(lVar50 + lVar17 + -1 + lVar21) != '\0') break;
                if (*(char *)(lVar50 + lVar17 + lVar21) != '\0') {
                  *(undefined4 *)(lVar46 + lVar21 * 4) =
                       *(undefined4 *)(lVar40 + lVar17 * 4 + 8 + lVar21 * 4);
                  uVar33 = (ulong)(uint)((int)lVar16 + (int)lVar21);
                  goto LAB_003005e6;
                }
                uVar33 = (ulong)TTA::length_;
                puVar19[uVar33] = TTA::length_;
                puVar55[uVar33] = 0xffffffff;
                puVar20[TTA::length_] = TTA::length_;
                uVar34 = TTA::length_ + 1;
                *(uint *)(lVar46 + lVar21 * 4) = TTA::length_;
                TTA::length_ = uVar34;
                lVar24 = lVar24 + 0x200000000;
                lVar28 = lVar21 + lVar16;
                lVar21 = lVar21 + 2;
                if ((long)uVar32 <= lVar28 + 2) {
                  uVar34 = iVar35 + (int)lVar21 + 2;
                  iVar35 = iVar35 + (int)lVar21;
                  goto LAB_0030190b;
                }
              }
              uVar26 = lVar16 + lVar21;
              iVar35 = (int)uVar26;
LAB_00300a30:
              *(undefined4 *)(lVar53 + uVar26 * 4) = *(undefined4 *)(lVar54 + uVar26 * 4);
              uVar34 = iVar35 + 2;
              if ((int)uVar34 < local_168) {
                lVar24 = (long)iVar35;
                lVar16 = lVar24 + 2;
                lVar25 = lVar24 << 0x20;
                lVar46 = lVar38 + lVar24;
                lVar17 = lVar37 + lVar24 * 4;
                lVar21 = lVar40 + lVar24 * 4;
                lVar28 = 0;
                while( true ) {
                  if (*(char *)(lVar31 + lVar24 + -1 + lVar28) != '\0') {
                    uVar26 = lVar16 + lVar28;
                    lVar52 = lVar25 + 0x300000000 >> 0x20;
                    lVar44 = lVar25 >> 0x1e;
                    if (*(char *)(lVar30 + lVar52) != '\0') {
                      if (*(char *)(lVar28 + lVar46) == '\0') {
                        if (*(char *)(lVar28 + -1 + lVar24 + lVar43) == '\0') {
                          uVar34 = TTA::Merge(*(uint *)(lVar21 + lVar28 * 4),
                                              *(uint *)(lVar53 + lVar44));
                          uVar33 = uVar26 & 0xffffffff;
                        }
                        else {
                          uVar34 = *(uint *)(lVar54 + lVar44);
                          uVar33 = uVar26 & 0xffffffff;
                        }
                      }
                      else {
                        uVar34 = *(uint *)(lVar21 + lVar28 * 4);
                        uVar33 = uVar26 & 0xffffffff;
                      }
                      goto LAB_00300c3d;
                    }
                    if (*(char *)(lVar47 + lVar52) == '\0') {
                      uVar34 = *(uint *)(lVar53 + lVar44);
                      goto LAB_00301495;
                    }
                    lVar25 = lVar25 + 0x400000000 >> 0x20;
                    if (*(char *)(lVar30 + lVar25) == '\0') {
                      puVar29 = (undefined4 *)(lVar44 + lVar53);
                      uVar33 = uVar26 & 0xffffffff;
                      goto LAB_00300f42;
                    }
                    if (*(char *)(lVar23 + lVar52) == '\0') {
                      uVar34 = TTA::Merge(*(uint *)(lVar54 + lVar25 * 4),*(uint *)(lVar53 + lVar44))
                      ;
                      *(uint *)(lVar17 + lVar28 * 4) = uVar34;
                      goto LAB_003014eb;
                    }
                    if (*(char *)(lVar28 + lVar46) != '\0') {
                      *(undefined4 *)(lVar17 + lVar28 * 4) = *(undefined4 *)(lVar21 + lVar28 * 4);
                      goto LAB_00300bd9;
                    }
                    if (*(char *)(lVar28 + -1 + lVar24 + lVar43) == '\0') {
                      uVar34 = TTA::Merge(*(uint *)(lVar21 + lVar28 * 4),*(uint *)(lVar53 + lVar44))
                      ;
                      *(uint *)(lVar17 + lVar28 * 4) = uVar34;
                      uVar33 = uVar26 & 0xffffffff;
                      goto LAB_003005e6;
                    }
                    uVar34 = *(uint *)(lVar54 + lVar44);
                    goto LAB_0030129f;
                  }
                  if (*(char *)(lVar31 + lVar24 + lVar28) == '\0') break;
                  if (*(char *)(lVar46 + 1 + lVar28) == '\0') goto LAB_00300b29;
                  *(undefined4 *)(lVar17 + lVar28 * 4) = *(undefined4 *)(lVar21 + lVar28 * 4);
                  lVar25 = lVar25 + 0x200000000;
                  lVar44 = lVar28 + lVar16;
                  lVar28 = lVar28 + 2;
                  if ((long)uVar32 <= lVar44 + 2) {
                    uVar34 = iVar35 + (int)lVar28 + 2;
                    iVar35 = iVar35 + (int)lVar28;
                    goto LAB_0030184c;
                  }
                }
                uVar26 = lVar16 + lVar28;
LAB_00300b0f:
                iVar35 = (int)uVar26;
                goto LAB_002fff15;
              }
LAB_0030184c:
              uVar26 = (ulong)uVar34;
              if (local_168 < (int)uVar34) goto LAB_0030194d;
              lVar50 = (long)(int)uVar34;
              lVar31 = (long)iVar35;
              if (*(char *)(lVar47 + lVar50) == '\0') goto LAB_003019e3;
              cVar3 = *(char *)(lVar30 + 3 + lVar31);
              goto joined_r0x003019be;
            }
LAB_0030190b:
            uVar26 = (ulong)uVar34;
            if (local_168 < (int)uVar34) goto LAB_0030194d;
            lVar50 = (long)(int)uVar34;
            lVar31 = (long)iVar35;
            if (*(char *)(lVar47 + lVar50) != '\0') {
              if (*(char *)(lVar30 + 3 + lVar31) == '\0') goto LAB_00301a9b;
              uVar34 = *(uint *)(lVar54 + lVar50 * 4);
              uVar13 = *(uint *)(lVar53 + lVar31 * 4);
              goto LAB_00301ee0;
            }
            if (*(char *)(lVar31 + 3 + lVar47) == '\0') goto LAB_00301b82;
            if (*(char *)(lVar30 + 3 + lVar31) != '\0') {
              uVar34 = *(uint *)(lVar54 + lVar50 * 4);
              goto LAB_00301bf5;
            }
            uVar32 = (ulong)TTA::length_;
            TTA::rtable_[uVar32] = TTA::length_;
            TTA::next_[uVar32] = 0xffffffff;
            goto LAB_00301b72;
          }
          *(undefined4 *)(lVar53 + 8 + lVar16 * 4) = *(undefined4 *)(lVar54 + 0x10 + lVar16 * 4);
LAB_00300991:
          uVar33 = uVar26 & 0xffffffff;
          goto LAB_003005e6;
        }
        if (*(char *)(lVar30 + 3 + lVar16) != '\0') {
          if (*(char *)(lVar23 + uVar26) == '\0') {
            uVar34 = *(uint *)(lVar54 + 8 + lVar16 * 4);
            uVar13 = *(uint *)(lVar53 + lVar16 * 4);
          }
          else {
            uVar34 = *(uint *)(lVar54 + lVar16 * 4);
            if (*(char *)(lVar41 + lVar16) != '\0') goto LAB_00300961;
            uVar13 = *(uint *)(lVar54 + 8 + lVar16 * 4);
          }
          uVar34 = TTA::Merge(uVar34,uVar13);
          goto LAB_00300961;
        }
        if (*(char *)(lVar47 + 3 + lVar16) == '\0') {
          uVar34 = *(uint *)(lVar53 + lVar16 * 4);
          goto LAB_003010c7;
        }
        if (*(char *)(lVar16 + 4 + lVar30) == '\0') {
          lVar16 = lVar16 * 4;
LAB_003009b7:
          puVar29 = (undefined4 *)(lVar16 + lVar53);
          goto LAB_00300f3f;
        }
        if (*(char *)(lVar23 + 3 + lVar16) == '\0') {
          uVar34 = TTA::Merge(*(uint *)(lVar54 + 0x10 + lVar16 * 4),*(uint *)(lVar53 + lVar16 * 4));
          *(uint *)(lVar53 + 8 + lVar16 * 4) = uVar34;
LAB_003014eb:
          uVar33 = uVar26 & 0xffffffff;
          goto LAB_003005e6;
        }
        if (*(char *)(lVar23 + uVar26) == '\0') {
          uVar34 = *(uint *)(lVar54 + 8 + lVar16 * 4);
          uVar13 = *(uint *)(lVar53 + lVar16 * 4);
        }
        else {
          uVar34 = *(uint *)(lVar54 + lVar16 * 4);
          if (*(char *)(lVar41 + lVar16) != '\0') {
            *(uint *)(lVar53 + 8 + lVar16 * 4) = uVar34;
            uVar33 = uVar26 & 0xffffffff;
            goto LAB_003005e6;
          }
          uVar13 = *(uint *)(lVar54 + 8 + lVar16 * 4);
        }
        uVar34 = TTA::Merge(uVar34,uVar13);
        *(uint *)(lVar53 + 8 + lVar16 * 4) = uVar34;
        uVar33 = uVar26 & 0xffffffff;
        goto LAB_003005e6;
      }
      if (*(char *)(lVar36 + lVar16) == '\0') goto LAB_00301230;
      uVar34 = *(uint *)(lVar54 + lVar16 * 4);
      goto LAB_003015bf;
    }
    if (cVar10 == '\0') {
      if (*(char *)(lVar36 + lVar16) == '\0') {
        uVar34 = *(uint *)(lVar54 + lVar17 * 4);
        goto LAB_0030026a;
      }
      if (*(char *)(lVar23 + lVar28) == '\0') {
        uVar34 = *(uint *)(lVar54 + lVar16 * 4);
        uVar13 = *(uint *)(lVar54 + lVar17 * 4);
LAB_003002d2:
        uVar34 = TTA::Merge(uVar34,uVar13);
        *(uint *)(lVar46 + lVar24 * 4) = uVar34;
      }
      else {
        uVar34 = *(uint *)(lVar54 + lVar16 * 4);
        if (*(char *)(lVar24 + -1 + lVar43 + lVar21) == '\0') {
          uVar13 = *(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4);
          goto LAB_003002d2;
        }
        *(uint *)(lVar46 + lVar24 * 4) = uVar34;
      }
LAB_00300bd9:
      uVar33 = uVar26 & 0xffffffff;
    }
    else {
      uVar34 = *(uint *)(lVar40 + lVar21 * 4 + lVar24 * 4);
      if (*(char *)(lVar23 + lVar28) == '\0') {
        uVar34 = TTA::Merge(uVar34,*(uint *)(lVar54 + lVar17 * 4));
LAB_0030026a:
        *(uint *)(lVar46 + lVar24 * 4) = uVar34;
      }
      else {
        *(uint *)(lVar46 + lVar24 * 4) = uVar34;
      }
LAB_003012a3:
      uVar33 = uVar26 & 0xffffffff;
    }
  }
  else {
    iVar35 = (int)uVar26;
    if (*(char *)(lVar30 + lVar25) != '\0') goto LAB_00300a30;
    if (*(char *)(lVar30 + lVar48) == '\0') {
      if (*(char *)(lVar52 + lVar44) == '\0') {
        uVar33 = (ulong)TTA::length_;
        TTA::rtable_[uVar33] = TTA::length_;
        TTA::next_[uVar33] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar13 = TTA::length_ + 1;
        uVar34 = TTA::length_;
        goto LAB_00300330;
      }
LAB_0030132d:
      uVar26 = lVar16 + lVar52;
      uVar33 = uVar26 & 0xffffffff;
      goto LAB_00300860;
    }
    if (*(char *)(lVar52 + lVar44) == '\0') {
      *(undefined4 *)(lVar21 + 8 + lVar52 * 4) = *(undefined4 *)(lVar54 + lVar48 * 4);
      uVar33 = uVar26 & 0xffffffff;
    }
    else {
      uVar34 = *(uint *)(lVar17 + lVar52 * 4);
      if (*(char *)(lVar23 + lVar25) == '\0') {
        uVar34 = TTA::Merge(uVar34,*(uint *)(lVar54 + lVar48 * 4));
        *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
        uVar33 = uVar26 & 0xffffffff;
      }
      else {
        *(uint *)(lVar21 + 8 + lVar52 * 4) = uVar34;
LAB_00300ed6:
        uVar33 = lVar16 + lVar52 & 0xffffffff;
      }
    }
  }
  goto LAB_003005e6;
LAB_00300b29:
  uVar26 = lVar16 + lVar28;
  lVar25 = lVar25 + 0x400000000 >> 0x20;
  if (*(char *)(lVar30 + lVar25) != '\0') {
    if (*(char *)(lVar28 + lVar46) == '\0') {
      uVar34 = *(uint *)(lVar54 + lVar25 * 4);
    }
    else {
      uVar34 = *(uint *)(lVar21 + lVar28 * 4);
      if (*(char *)(lVar28 + lVar24 + lVar43) != '\0') {
        *(uint *)(lVar17 + lVar28 * 4) = uVar34;
        uVar33 = uVar26 & 0xffffffff;
        goto LAB_003005e6;
      }
      uVar34 = TTA::Merge(uVar34,*(uint *)(lVar54 + lVar25 * 4));
    }
LAB_0030129f:
    uVar26 = lVar16 + lVar28;
    *(uint *)(lVar17 + lVar28 * 4) = uVar34;
    goto LAB_003012a3;
  }
  if (*(char *)(lVar28 + lVar46) != '\0') goto code_r0x00300beb;
LAB_00301230:
  uVar33 = (ulong)TTA::length_;
  TTA::rtable_[uVar33] = TTA::length_;
  TTA::next_[uVar33] = 0xffffffff;
  goto LAB_0030031a;
code_r0x00300beb:
  uVar33 = uVar26 & 0xffffffff;
  goto LAB_00300860;
code_r0x00300fbc:
  *(undefined4 *)(lVar46 + lVar24 * 4) = *(undefined4 *)(lVar46 + -8 + lVar24 * 4);
  lVar17 = lVar17 + 0x200000000;
  lVar28 = lVar24 + lVar16;
  lVar24 = lVar24 + 2;
  if ((long)uVar32 <= lVar28 + 2) {
    uVar34 = iVar39 + (int)lVar24 + 2;
    iVar39 = iVar39 + (int)lVar24;
    goto LAB_0030193a;
  }
  goto LAB_00300f96;
LAB_002f54b2:
  iVar39 = iVar35 + 2;
  uVar12 = *(undefined4 *)(lVar53 + lVar31 * 4);
LAB_002f54c2:
  *(undefined4 *)(lVar53 + lVar50 * 4) = uVar12;
  iVar35 = iVar39;
LAB_002f54c6:
  iVar39 = iVar35 + 2;
  if ((int)uVar34 <= iVar39) goto code_r0x002f54db;
  goto LAB_002f53c3;
code_r0x002f54db:
  lVar50 = (long)iVar35;
LAB_002f5902:
  lVar31 = (long)iVar39;
  if ((int)uVar34 < iVar39) {
    if (*(char *)(lVar47 + lVar31) == '\0') {
      *(undefined4 *)(lVar53 + lVar31 * 4) = 0;
      goto LAB_00301bfe;
    }
  }
  else if (*(char *)(lVar47 + lVar31) == '\0') {
    if (*(char *)(lVar47 + 3 + lVar50) == '\0') {
      *(undefined4 *)(lVar53 + lVar31 * 4) = 0;
    }
    else {
      uVar32 = (ulong)TTA::length_;
      puVar19[uVar32] = TTA::length_;
      TTA::next_[uVar32] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar34 = TTA::length_ + 1;
      *(uint *)(lVar53 + lVar31 * 4) = TTA::length_;
      TTA::length_ = uVar34;
    }
    goto LAB_00301bfe;
  }
  uVar32 = (ulong)TTA::length_;
  puVar19[uVar32] = TTA::length_;
  TTA::next_[uVar32] = 0xffffffff;
  TTA::tail_[TTA::length_] = TTA::length_;
  uVar34 = TTA::length_ + 1;
  *(uint *)(lVar53 + lVar31 * 4) = TTA::length_;
  TTA::length_ = uVar34;
LAB_00301bfe:
  puVar19 = TTA::rtable_;
  uVar34 = 1;
  if (1 < TTA::length_) {
    uVar34 = 1;
    uVar32 = 1;
    do {
      if (uVar32 == puVar19[uVar32]) {
        uVar34 = uVar34 + 1;
        uVar13 = uVar34;
      }
      else {
        uVar13 = puVar19[puVar19[uVar32]];
      }
      puVar19[uVar32] = uVar13;
      uVar32 = uVar32 + 1;
    } while (uVar32 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar34;
  puVar19 = TTA::rtable_;
  uVar32 = 0;
  iVar39 = (int)(uVar45 & 0xfffffffffffffffe);
  if (0 < (int)uVar11) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar31 = *(long *)&pMVar5->field_0x10;
    lVar40 = **(long **)&pMVar5->field_0x48;
    lVar16 = *(long *)&pMVar6->field_0x10;
    lVar54 = **(long **)&pMVar6->field_0x48;
    lVar50 = lVar16 + lVar54;
    lVar53 = lVar31 + 1 + lVar40;
    lVar47 = lVar31 + 1;
    uVar32 = 0;
    lVar30 = lVar16;
    do {
      puVar55 = TTA::rtable_;
      lVar38 = lVar54 * uVar32 + lVar16;
      lVar36 = lVar38 + lVar54;
      if (iVar39 < 1) {
        uVar33 = 0;
      }
      else {
        uVar33 = 0;
        do {
          lVar37 = (long)*(int *)(lVar30 + uVar33 * 4);
          if (lVar37 < 1) {
            *(undefined8 *)(lVar30 + uVar33 * 4) = 0;
            uVar26 = uVar33 + 1;
            *(undefined4 *)(lVar50 + uVar33 * 4) = 0;
            uVar34 = 0;
          }
          else {
            uVar34 = puVar55[lVar37];
            uVar13 = uVar34;
            if (*(char *)(lVar47 + -1 + uVar33) == '\0') {
              uVar13 = 0;
            }
            *(uint *)(lVar30 + uVar33 * 4) = uVar13;
            uVar26 = uVar33 | 1;
            uVar13 = uVar34;
            if (*(char *)(lVar47 + uVar33) == '\0') {
              uVar13 = 0;
            }
            *(uint *)(lVar30 + 4 + uVar33 * 4) = uVar13;
            uVar13 = uVar34;
            if (*(char *)(lVar53 + -1 + uVar33) == '\0') {
              uVar13 = 0;
            }
            *(uint *)(lVar50 + uVar33 * 4) = uVar13;
            if (*(char *)(lVar53 + uVar33) == '\0') {
              uVar34 = 0;
            }
          }
          *(uint *)(lVar36 + uVar26 * 4) = uVar34;
          uVar33 = uVar33 + 2;
        } while ((long)uVar33 < (long)(uVar45 & 0xfffffffffffffffe));
      }
      if ((uVar4 & 0x80000001) == 1) {
        lVar37 = (long)*(int *)(lVar38 + uVar33 * 4);
        if (lVar37 < 1) {
          *(undefined4 *)(lVar38 + uVar33 * 4) = 0;
          *(undefined4 *)(lVar36 + uVar33 * 4) = 0;
        }
        else {
          lVar23 = lVar40 * uVar32 + lVar31;
          uVar34 = puVar19[lVar37];
          uVar13 = uVar34;
          if (*(char *)(lVar23 + uVar33) == '\0') {
            uVar13 = 0;
          }
          *(uint *)(lVar38 + uVar33 * 4) = uVar13;
          if (*(char *)(lVar23 + lVar40 + uVar33) == '\0') {
            *(undefined4 *)(lVar36 + uVar33 * 4) = 0;
          }
          else {
            *(uint *)(lVar36 + uVar33 * 4) = uVar34;
          }
        }
      }
      uVar32 = uVar32 + 2;
      lVar50 = lVar50 + lVar54 * 2;
      lVar53 = lVar53 + lVar40 * 2;
      lVar47 = lVar47 + lVar40 * 2;
      lVar30 = lVar30 + lVar54 * 2;
    } while (uVar32 < uVar11);
    uVar32 = uVar32 & 0xffffffff;
  }
  puVar19 = TTA::rtable_;
  if ((uVar18 & 0x80000001) == 1) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar47 = *(long *)&pMVar5->field_0x10;
    lVar31 = **(long **)&pMVar5->field_0x48 * uVar32;
    lVar53 = *(long *)&pMVar6->field_0x10;
    lVar50 = uVar32 * **(long **)&pMVar6->field_0x48;
    if (iVar39 < 1) {
      uVar32 = 0;
    }
    else {
      lVar40 = lVar31 + lVar47;
      lVar16 = lVar50 + lVar53;
      uVar32 = 0;
      do {
        lVar54 = (long)*(int *)(lVar16 + uVar32 * 4);
        if (lVar54 < 1) {
          *(undefined8 *)(lVar16 + uVar32 * 4) = 0;
        }
        else {
          uVar18 = puVar19[lVar54];
          uVar11 = uVar18;
          if (*(char *)(lVar40 + uVar32) == '\0') {
            uVar11 = 0;
          }
          *(uint *)(lVar16 + uVar32 * 4) = uVar11;
          if (*(char *)(lVar40 + 1 + uVar32) == '\0') {
            *(undefined4 *)(lVar16 + 4 + uVar32 * 4) = 0;
          }
          else {
            *(uint *)(lVar16 + 4 + uVar32 * 4) = uVar18;
          }
        }
        uVar32 = uVar32 + 2;
      } while (uVar32 < (uVar45 & 0xfffffffe));
    }
    if ((uVar4 & 0x80000001) == 1) {
      lVar53 = lVar53 + lVar50;
      lVar50 = (long)*(int *)(lVar53 + uVar32 * 4);
      uVar18 = 0;
      if ((0 < lVar50) && (uVar18 = 0, *(char *)(lVar47 + lVar31 + uVar32) != '\0')) {
        uVar18 = TTA::rtable_[lVar50];
      }
      *(uint *)(lVar53 + uVar32 * 4) = uVar18;
    }
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        int e_rows = h & 0xfffffffe;
        bool o_rows = h % 2 == 1;
        int e_cols = w & 0xfffffffe;
        bool o_cols = w % 2 == 1;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan

        // Define Conditions and Actions
        {
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

            // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
                               // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
                               //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
                               // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
                               // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
                               // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
                               // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
                               //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
                               // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
                               // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
                               // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
                               // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
                               // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
                               // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
                               //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
                               //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
        }

        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }


        // Undef Conditions and Actions
        {
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

    }